

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O2

void SPARSITY_PREPROC_CSR(int *colVals,int *rowPtrs,int *consP,int NCELLS,int base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  int i;
  double *pdVar180;
  Real *pRVar181;
  ulong uVar182;
  int iVar183;
  Real *pRVar184;
  Real *pRVar185;
  long lVar186;
  ulong uVar187;
  Real *pRVar188;
  int iVar189;
  Real *pRVar190;
  Real *pRVar191;
  double *pdVar192;
  Real *pRVar193;
  int iVar194;
  Real *pRVar195;
  Real *pRVar196;
  Real *pRVar197;
  long lVar198;
  Real *pRVar199;
  undefined4 uVar200;
  undefined4 uVar201;
  undefined4 uVar202;
  undefined4 uVar203;
  undefined4 uVar204;
  undefined4 uVar205;
  undefined4 uVar206;
  undefined4 uVar207;
  undefined4 uVar208;
  undefined4 uVar209;
  undefined4 uVar210;
  undefined4 uVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  Real RVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  Real RVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  Real RVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  Real RVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar284;
  double dVar285;
  Real RVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  double dVar291;
  double dVar292;
  Real RVar293;
  double dVar294;
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  double dVar305;
  Real RVar306;
  double dVar307;
  double dVar308;
  double dVar309;
  Real RVar310;
  double dVar311;
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  double dVar318;
  double dVar319;
  double dVar320;
  double dVar321;
  double dVar322;
  double dVar323;
  double dVar324;
  Real RVar325;
  double dVar326;
  double dVar327;
  Real RVar328;
  undefined4 uVar329;
  undefined4 uVar330;
  undefined4 uVar331;
  undefined4 uVar332;
  undefined4 uVar333;
  undefined4 uVar334;
  undefined4 uVar335;
  undefined4 uVar336;
  double dVar337;
  double dVar338;
  double dVar339;
  double dVar340;
  double dVar341;
  double dVar342;
  double dVar343;
  double dVar344;
  double dVar345;
  double dVar346;
  double dVar347;
  double dVar348;
  double dVar349;
  double dVar350;
  double dVar351;
  double dVar352;
  double dVar353;
  double dVar354;
  double dVar355;
  double dVar356;
  double dVar357;
  double dVar358;
  double dVar359;
  double dVar360;
  double dVar361;
  double dVar362;
  double dVar363;
  double dVar364;
  double dVar365;
  double dVar366;
  double dVar367;
  double dVar368;
  double dVar369;
  double dVar370;
  double dVar371;
  double dVar372;
  double dVar373;
  double dVar374;
  double dVar375;
  double dVar376;
  double dVar377;
  double dVar378;
  double dVar379;
  double dVar380;
  double dVar381;
  double dVar382;
  double dVar383;
  double dVar384;
  double dVar385;
  double dVar386;
  double dVar387;
  double dVar388;
  double dVar389;
  double dVar390;
  double dVar391;
  double dVar392;
  double dVar393;
  double dVar394;
  double dVar395;
  double dVar396;
  double dVar397;
  double dVar398;
  double dVar399;
  double dVar400;
  double dVar401;
  double dVar402;
  double dVar403;
  double dVar404;
  double dVar405;
  double dVar406;
  double dVar407;
  double dVar408;
  double dVar409;
  double dVar410;
  double dVar411;
  double dVar412;
  double dVar413;
  double local_1688;
  double local_1678;
  double local_1668;
  double local_1658;
  double dStack_1650;
  double local_1648;
  double local_1638;
  double dStack_1620;
  double local_1618;
  double local_1608;
  double local_15f8;
  double local_15e8;
  double local_15d8;
  double local_15c8;
  double dStack_15c0;
  double local_15b8;
  GpuArray<double,_21U> conc;
  double local_14f8;
  undefined1 local_14f0 [16];
  double local_14e0;
  double dStack_14d8;
  double local_14d0;
  double local_14c8;
  undefined1 auStack_14c0 [16];
  double local_14b0;
  double dStack_14a8;
  double dStack_14a0;
  double dStack_1498;
  double dStack_1490;
  double dStack_1488;
  double local_1480;
  double dStack_1478;
  double local_1470;
  double dStack_1468;
  double local_1448;
  double local_1438;
  double local_1428;
  double local_1418;
  undefined1 local_1410 [16];
  undefined1 local_1400 [16];
  double dStack_13f0;
  double local_13e8;
  double dStack_13e0;
  double local_13d8;
  double dStack_13d0;
  double local_13c8;
  double dStack_13c0;
  double dStack_13b8;
  double local_13b0;
  double dStack_13a8;
  double dStack_13a0;
  double dStack_1398;
  double dStack_1390;
  double local_1388;
  double local_1380;
  double local_1378;
  Real h_RT [21];
  double dStack_12a0;
  GpuArray<double,_484U> Jac;
  double dStack_340;
  double dStack_2d0;
  Real c_R [21];
  Real dcRdT [21];
  double dStack_e0;
  Real local_d8;
  Real local_d0 [2];
  Real local_c0 [2];
  Real local_b0 [2];
  Real local_a0 [2];
  Real local_90 [2];
  Real local_80 [2];
  Real local_70 [2];
  Real local_60 [2];
  Real aRStack_50 [2];
  Real aRStack_40 [2];
  
  pdVar192 = Jac.arr;
  memset(pdVar192,0,0xf20);
  memset(&conc,0,0xa8);
  pRVar188 = &local_d8;
  pRVar193 = aRStack_50;
  pRVar195 = aRStack_40;
  for (lVar198 = 0; dVar213 = conc.arr[7], dVar246 = conc.arr[1], lVar198 != 0x15;
      lVar198 = lVar198 + 1) {
    conc.arr[lVar198] = 0.047619047619047616;
  }
  iVar183 = *consP;
  for (lVar198 = 0; lVar198 != 0x1e4; lVar198 = lVar198 + 1) {
    Jac.arr[lVar198] = 0.0;
  }
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    *(undefined8 *)(local_14f0 + lVar198 * 8 + -8) = 0;
  }
  dVar371 = 0.0;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar371 = dVar371 + conc.arr[lVar198];
  }
  h_RT[0] = 2.9101473600491667;
  h_RT[1] = 19.482439934646393;
  h_RT[2] = 22.00757879476429;
  h_RT[3] = 3.2555381179699996;
  h_RT[4] = 6.1092103122075;
  h_RT[5] = -15.524086927680834;
  h_RT[6] = 5.3818731557687505;
  h_RT[7] = 35.602608086557915;
  h_RT[8] = 38.543891960460414;
  h_RT[9] = 17.114317783399166;
  h_RT[10] = 0.4349435637083328;
  h_RT[0xb] = -5.748131844745;
  h_RT[0xc] = -26.605086887896665;
  h_RT[0xd] = 7.7442483232375;
  h_RT[0xe] = -3.2271354189666677;
  h_RT[0xf] = 8.078776559375;
  h_RT[0x10] = 12.395261584404166;
  h_RT[0x11] = 18.914627724425003;
  h_RT[0x12] = 3.874817692333335;
  h_RT[0x13] = 3.0794231235708334;
  h_RT[0x14] = 2.0030833333333335;
  local_15c8 = conc.arr[0];
  local_15e8 = dVar371 + conc.arr[0];
  local_1618 = conc.arr[5];
  local_1648 = conc.arr[10];
  local_1638 = conc.arr[0xb];
  local_1608 = conc.arr[0xc];
  local_1658 = conc.arr[0x12];
  local_15d8 = conc.arr[0x12] + conc.arr[0x12] +
               conc.arr[0xb] * 0.5 + conc.arr[5] * 5.0 + local_15e8 + conc.arr[10] + conc.arr[0xc];
  local_1678 = conc.arr[0x14] * -0.30000000000000004 + local_15d8;
  local_1688 = conc.arr[1];
  local_1438 = conc.arr[1] * conc.arr[7];
  dVar247 = local_1678 * 1e-12;
  dVar212 = (dVar247 / 71955998.06277587) * 2.2543283025642333e+17;
  dVar214 = dVar212 + 1.0;
  local_1448 = -0.0005580285508678667 / dVar214;
  dVar264 = log10(dVar212);
  local_1428 = 1.0 / ((dVar264 + -0.09006792635084097) * -0.14 + 1.3374831843797492);
  dVar264 = (dVar264 + -0.09006792635084097) * local_1428;
  dVar294 = 1.0 / (dVar264 * dVar264 + 1.0);
  dVar394 = pow(10.0,dVar294 * -0.46258518455098363);
  dVar248 = conc.arr[9];
  dVar337 = dVar294 * -0.9251703691019673 * dVar294 * dVar264 * local_1428;
  local_1428 = dVar337 * -1.3374831843797492 * local_1428;
  dVar394 = dVar394 * (dVar212 / dVar214);
  dVar212 = (local_1438 * 71955998.06277587 + conc.arr[9] * -0.15021418125880825) * dVar394;
  dVar264 = (local_1438 * -38376.53230014713 + conc.arr[9] * -0.0036222377521367456) * dVar394 +
            ((dVar264 * dVar337 * -1.27 + local_1428 * -0.67 + dVar294) * -0.0001271297967317221 +
             local_1428 * -0.0005580285508678667 + local_1448) * 2.302585092994046 * dVar212;
  dVar294 = (double)local_14f0._0_8_ - dVar212;
  local_14f0._0_8_ = dVar294;
  auStack_14c0._0_8_ = (double)auStack_14c0._0_8_ - dVar212;
  dVar337 = local_14b0 + dVar212;
  local_14b0 = dVar337;
  dVar369 = dVar394 * 71955998.06277587;
  dVar394 = dVar394 * 0.15021418125880825;
  dVar212 = (1.0 / dVar214 + local_1428) * (dVar212 / local_1678);
  if (iVar183 == 0) {
    uVar202 = (undefined4)((ulong)dVar212 >> 0x20);
    local_1418 = dVar212 * 2.0;
    local_1410._8_8_ = dVar212;
    local_1410._0_8_ = dVar213 * dVar369 + dVar212;
    local_1400._8_8_ = dVar212;
    local_1400._0_8_ = dVar212;
    dStack_13f0 = dVar212 * 6.0;
    local_13e8 = dVar212;
    dStack_13e0 = dVar369 * dVar246 + dVar212;
    local_13d8 = dVar212;
    dStack_13d0 = dVar212 - dVar394;
    local_13c8 = local_1418;
    dStack_13c0 = dVar212 * 1.5;
    dStack_13b8 = local_1418;
    auVar124._8_4_ = SUB84(dVar212,0);
    auVar124._0_8_ = dVar212;
    auVar124._12_4_ = uVar202;
    dStack_13a0 = dVar212;
    dStack_1398 = auVar124._8_8_;
    auVar125._8_4_ = SUB84(dVar212,0);
    auVar125._0_8_ = dVar212;
    auVar125._12_4_ = uVar202;
    local_13b0 = dVar212;
    dStack_13a8 = auVar125._8_8_;
    dStack_1390 = dVar212;
    local_1388 = dVar212 * 3.0;
    local_1380 = dVar212;
    local_1378 = dVar212 * 0.7;
    pdVar180 = Jac.arr + 9;
    for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
      dVar246 = *(double *)(local_1410 + lVar198 * 8 + -8);
      pdVar180[-8] = pdVar180[-8] - dVar246;
      pdVar180[-2] = pdVar180[-2] - dVar246;
      *pdVar180 = dVar246 + *pdVar180;
      pdVar180 = pdVar180 + 0x16;
    }
  }
  else {
    Jac.arr[1] = Jac.arr[1] - dVar212;
    Jac.arr[7] = Jac.arr[7] - dVar212;
    Jac.arr[9] = Jac.arr[9] + dVar212;
    dVar213 = dVar213 * dVar369;
    Jac.arr[0x17] = Jac.arr[0x17] - dVar213;
    Jac.arr[0x1d] = Jac.arr[0x1d] - dVar213;
    Jac.arr[0x1f] = dVar213 + Jac.arr[0x1f];
    dVar213 = dVar212 * 5.0;
    Jac.arr[0x6f] = Jac.arr[0x6f] - dVar213;
    Jac.arr[0x75] = Jac.arr[0x75] - dVar213;
    Jac.arr[0x77] = dVar213 + Jac.arr[0x77];
    dVar246 = dVar246 * dVar369;
    Jac.arr[0x9b] = Jac.arr[0x9b] - dVar246;
    Jac.arr[0xa1] = Jac.arr[0xa1] - dVar246;
    Jac.arr[0xa3] = dVar246 + Jac.arr[0xa3];
    Jac.arr[199] = Jac.arr[199] + dVar394;
    Jac.arr[0xcd] = Jac.arr[0xcd] + dVar394;
    Jac.arr[0xcf] = Jac.arr[0xcf] - dVar394;
    Jac.arr[0xdd] = Jac.arr[0xdd] - dVar212;
    Jac.arr[0xe3] = Jac.arr[0xe3] - dVar212;
    Jac.arr[0xe5] = Jac.arr[0xe5] + dVar212;
    dVar246 = dVar212 * 0.5;
    Jac.arr[0xf3] = Jac.arr[0xf3] - dVar246;
    Jac.arr[0xf9] = Jac.arr[0xf9] - dVar246;
    Jac.arr[0xfb] = dVar246 + Jac.arr[0xfb];
    Jac.arr[0x109] = Jac.arr[0x109] - dVar212;
    Jac.arr[0x10f] = Jac.arr[0x10f] - dVar212;
    Jac.arr[0x111] = Jac.arr[0x111] + dVar212;
    dVar246 = dVar212 + dVar212;
    Jac.arr[0x18d] = Jac.arr[0x18d] - dVar246;
    Jac.arr[0x193] = Jac.arr[0x193] - dVar246;
    Jac.arr[0x195] = dVar246 + Jac.arr[0x195];
    dVar212 = dVar212 * -0.30000000000000004;
    Jac.arr[0x1b9] = Jac.arr[0x1b9] - dVar212;
    Jac.arr[0x1bf] = Jac.arr[0x1bf] - dVar212;
    Jac.arr[0x1c1] = dVar212 + Jac.arr[0x1c1];
    local_1688 = conc.arr[1];
    local_15c8 = conc.arr[0];
    local_15e8 = dVar371 + conc.arr[0];
    local_1618 = conc.arr[5];
    local_1648 = conc.arr[10];
    local_1638 = conc.arr[0xb];
    local_1608 = conc.arr[0xc];
    local_1658 = conc.arr[0x12];
    local_15d8 = conc.arr[0x12] + conc.arr[0x12] +
                 conc.arr[0xb] * 0.5 + conc.arr[5] * 5.0 + local_15e8 + conc.arr[10] + conc.arr[0xc]
    ;
    local_1678 = conc.arr[0x14] * -0.30000000000000004 + local_15d8;
    dVar247 = local_1678 * 1e-12;
  }
  Jac.arr[0x1cf] = Jac.arr[0x1cf] - dVar264;
  Jac.arr[0x1d5] = Jac.arr[0x1d5] - dVar264;
  Jac.arr[0x1d7] = dVar264 + Jac.arr[0x1d7];
  local_1428 = (dVar247 / 111446030.23051862) * 8.322101603299873e+17;
  dVar246 = log10(local_1428);
  local_1448 = 1.0 / ((dVar246 + -0.1863137764834265) * -0.14 + 1.1550470206955945);
  local_1438 = (dVar246 + -0.1863137764834265) * local_1448;
  dVar246 = 1.0 / (local_1438 * local_1438 + 1.0);
  dVar213 = pow(10.0,dVar246 * -0.31893466196503506);
  RVar241 = h_RT[1];
  dVar394 = conc.arr[0xd];
  dVar264 = local_1428 + 1.0;
  dVar212 = dVar246 * -0.6378693239300701 * dVar246 * local_1438 * local_1448;
  dVar214 = dVar212 * -1.1550470206955945 * local_1448;
  dVar213 = (local_1428 / dVar264) * dVar213;
  dVar369 = (local_1688 * dVar248 * 111446030.23051862 + local_1648 * -5.675915683847628) * dVar213;
  dVar212 = (local_1688 * dVar248 * -37261.015183856354 +
            (((h_RT[10] - (h_RT[9] + h_RT[1])) + 1.0) * -0.0006666666666666666 +
            -0.0003343413408874632) * -5.675915683847628 * local_1648) * dVar213 +
            ((local_1438 * dVar212 * -1.27 + dVar214 * -0.67 + dVar246) * -0.00011772029828908056 +
             dVar214 * -0.000995959489983554 + -0.000995959489983554 / dVar264) * 2.302585092994046
            * dVar369;
  dVar294 = dVar294 - dVar369;
  local_14f0._0_8_ = dVar294;
  local_14b0 = dVar337 - dVar369;
  dStack_14a8 = dStack_14a8 + dVar369;
  dVar246 = (1.0 / dVar264 + dVar214) * (dVar369 / local_1678);
  dVar264 = dVar213 * 111446030.23051862;
  if (iVar183 == 0) {
    uVar202 = (undefined4)((ulong)dVar246 >> 0x20);
    local_1418 = dVar246 * 2.0;
    local_1410._8_8_ = dVar246;
    local_1410._0_8_ = dVar248 * dVar264 + dVar246;
    local_1400._8_8_ = dVar246;
    local_1400._0_8_ = dVar246;
    dStack_13f0 = dVar246 * 6.0;
    local_13e8 = dVar246;
    dStack_13e0 = dVar246;
    local_13d8 = dVar246;
    dStack_13d0 = dVar264 * local_1688 + dVar246;
    local_13c8 = (dVar246 + dVar246) - dVar213 * 5.675915683847628;
    dStack_13c0 = dVar246 * 1.5;
    dStack_13b8 = dVar246 * 2.0;
    auVar122._8_4_ = SUB84(dVar246,0);
    auVar122._0_8_ = dVar246;
    auVar122._12_4_ = uVar202;
    dStack_13a0 = dVar246;
    dStack_1398 = auVar122._8_8_;
    auVar123._8_4_ = SUB84(dVar246,0);
    auVar123._0_8_ = dVar246;
    auVar123._12_4_ = uVar202;
    local_13b0 = dVar246;
    dStack_13a8 = auVar123._8_8_;
    dStack_1390 = dVar246;
    local_1388 = dVar246 * 3.0;
    local_1380 = dVar246;
    local_1378 = dVar246 * 0.7;
    pdVar180 = Jac.arr + 10;
    for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
      dVar246 = *(double *)(local_1410 + lVar198 * 8 + -8);
      pdVar180[-9] = pdVar180[-9] - dVar246;
      pdVar180[-1] = pdVar180[-1] - dVar246;
      *pdVar180 = dVar246 + *pdVar180;
      pdVar180 = pdVar180 + 0x16;
    }
  }
  else {
    Jac.arr[1] = Jac.arr[1] - dVar246;
    Jac.arr[9] = Jac.arr[9] - dVar246;
    Jac.arr[10] = Jac.arr[10] + dVar246;
    dVar248 = dVar248 * dVar264;
    Jac.arr[0x17] = Jac.arr[0x17] - dVar248;
    Jac.arr[0x1f] = Jac.arr[0x1f] - dVar248;
    Jac.arr[0x20] = dVar248 + Jac.arr[0x20];
    dVar247 = dVar246 * 5.0;
    Jac.arr[0x6f] = Jac.arr[0x6f] - dVar247;
    Jac.arr[0x77] = Jac.arr[0x77] - dVar247;
    Jac.arr[0x78] = dVar247 + Jac.arr[0x78];
    local_1688 = local_1688 * dVar264;
    Jac.arr[199] = Jac.arr[199] - local_1688;
    Jac.arr[0xcf] = Jac.arr[0xcf] - local_1688;
    Jac.arr[0xd0] = local_1688 + Jac.arr[0xd0];
    dVar213 = dVar246 - dVar213 * 5.675915683847628;
    Jac.arr[0xdd] = Jac.arr[0xdd] - dVar213;
    Jac.arr[0xe5] = Jac.arr[0xe5] - dVar213;
    Jac.arr[0xe6] = dVar213 + Jac.arr[0xe6];
    dVar213 = dVar246 * 0.5;
    Jac.arr[0xf3] = Jac.arr[0xf3] - dVar213;
    Jac.arr[0xfb] = Jac.arr[0xfb] - dVar213;
    Jac.arr[0xfc] = dVar213 + Jac.arr[0xfc];
    Jac.arr[0x109] = Jac.arr[0x109] - dVar246;
    Jac.arr[0x111] = Jac.arr[0x111] - dVar246;
    Jac.arr[0x112] = Jac.arr[0x112] + dVar246;
    dVar213 = dVar246 + dVar246;
    Jac.arr[0x18d] = Jac.arr[0x18d] - dVar213;
    Jac.arr[0x195] = Jac.arr[0x195] - dVar213;
    Jac.arr[0x196] = dVar213 + Jac.arr[0x196];
    dVar246 = dVar246 * -0.30000000000000004;
    Jac.arr[0x1b9] = Jac.arr[0x1b9] - dVar246;
    Jac.arr[0x1c1] = Jac.arr[0x1c1] - dVar246;
    Jac.arr[0x1c2] = dVar246 + Jac.arr[0x1c2];
    local_1688 = conc.arr[1];
    local_15c8 = conc.arr[0];
    local_15e8 = dVar371 + conc.arr[0];
    local_1618 = conc.arr[5];
    local_1648 = conc.arr[10];
    local_1638 = conc.arr[0xb];
    local_1608 = conc.arr[0xc];
    local_1658 = conc.arr[0x12];
    local_15d8 = conc.arr[0x12] + conc.arr[0x12] +
                 conc.arr[0xb] * 0.5 + conc.arr[5] * 5.0 + local_15e8 + conc.arr[10] + conc.arr[0xc]
    ;
    local_1678 = conc.arr[0x14] * -0.30000000000000004 + local_15d8;
    dVar247 = local_1678 * 1e-12;
  }
  local_15f8 = h_RT[1];
  Jac.arr[0x1cf] = Jac.arr[0x1cf] - dVar212;
  Jac.arr[0x1d7] = Jac.arr[0x1d7] - dVar212;
  Jac.arr[0x1d8] = dVar212 + Jac.arr[0x1d8];
  dVar246 = (dVar247 / 39795255.79748703) * 5756549223630996.0;
  dVar213 = log10(dVar246);
  local_1448 = 1.0 / ((dVar213 + -0.1786261669350975) * -0.14 + 1.1696190567051137);
  local_1438 = (dVar213 + -0.1786261669350975) * local_1448;
  local_1428 = 1.0 / (local_1438 * local_1438 + 1.0);
  dVar213 = pow(10.0,local_1428 * -0.33040870606701866);
  RVar245 = h_RT[0xe];
  dVar264 = conc.arr[0xe];
  dVar212 = dVar246 + 1.0;
  dVar247 = local_1428 * -0.6608174121340373 * local_1428 * local_1438 * local_1448;
  dVar214 = dVar247 * -1.1696190567051137 * local_1448;
  dVar213 = (dVar246 / dVar212) * dVar213;
  dVar246 = (local_1688 * dVar394 * 39795255.79748703 + conc.arr[0xe] * -367.47982351959547) *
            dVar213;
  dVar247 = (local_1688 * dVar394 * 10420.408369112773 +
            (((h_RT[0xe] - (h_RT[0xd] + RVar241)) + 1.0) * -0.0006666666666666666 +
            0.0002618505186181212) * -367.47982351959547 * conc.arr[0xe]) * dVar213 +
            ((local_1438 * dVar247 * -1.27 + dVar214 * -0.67 + local_1428) * -0.0001220771720522275
             + dVar214 * -0.0007194001075784557 + -0.0007194001075784557 / dVar212) *
            2.302585092994046 * dVar246;
  dVar294 = dVar294 - dVar246;
  local_14f0._0_8_ = dVar294;
  dStack_1490 = dStack_1490 - dVar246;
  dVar337 = dStack_1488 + dVar246;
  dVar246 = (1.0 / dVar212 + dVar214) * (dVar246 / local_1678);
  dStack_1488 = dVar337;
  dVar212 = dVar213 * 39795255.79748703;
  dVar213 = dVar213 * 367.47982351959547;
  if (iVar183 == 0) {
    uVar202 = (undefined4)((ulong)dVar246 >> 0x20);
    local_1418 = dVar246 * 2.0;
    local_1410._8_8_ = dVar246;
    local_1410._0_8_ = dVar394 * dVar212 + dVar246;
    local_1400._8_8_ = dVar246;
    local_1400._0_8_ = dVar246;
    dStack_13f0 = dVar246 * 6.0;
    auVar120._8_4_ = SUB84(dVar246,0);
    auVar120._0_8_ = dVar246;
    auVar120._12_4_ = uVar202;
    local_13d8 = dVar246;
    dStack_13d0 = auVar120._8_8_;
    auVar121._8_4_ = SUB84(dVar246,0);
    auVar121._0_8_ = dVar246;
    auVar121._12_4_ = uVar202;
    local_13e8 = dVar246;
    dStack_13e0 = auVar121._8_8_;
    local_13c8 = local_1418;
    dStack_13c0 = dVar246 * 1.5;
    dStack_13b8 = local_1418;
    local_13b0 = dVar212 * local_1688 + dVar246;
    dStack_13a8 = dVar246 - dVar213;
    dStack_13a0 = dVar246;
    dStack_1398 = dVar246;
    dStack_1390 = dVar246;
    local_1388 = dVar246 * 3.0;
    local_1380 = dVar246;
    local_1378 = dVar246 * 0.7;
    pdVar180 = Jac.arr + 0xe;
    for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
      dVar246 = *(double *)(local_1410 + lVar198 * 8 + -8);
      pdVar180[-0xd] = pdVar180[-0xd] - dVar246;
      pdVar180[-1] = pdVar180[-1] - dVar246;
      *pdVar180 = dVar246 + *pdVar180;
      pdVar180 = pdVar180 + 0x16;
    }
  }
  else {
    Jac.arr[1] = Jac.arr[1] - dVar246;
    Jac.arr[0xd] = Jac.arr[0xd] - dVar246;
    Jac.arr[0xe] = Jac.arr[0xe] + dVar246;
    dVar394 = dVar394 * dVar212;
    Jac.arr[0x17] = Jac.arr[0x17] - dVar394;
    Jac.arr[0x23] = Jac.arr[0x23] - dVar394;
    Jac.arr[0x24] = dVar394 + Jac.arr[0x24];
    dVar394 = dVar246 * 5.0;
    Jac.arr[0x6f] = Jac.arr[0x6f] - dVar394;
    Jac.arr[0x7b] = Jac.arr[0x7b] - dVar394;
    Jac.arr[0x7c] = dVar394 + Jac.arr[0x7c];
    Jac.arr[0xdd] = Jac.arr[0xdd] - dVar246;
    Jac.arr[0xe9] = Jac.arr[0xe9] - dVar246;
    Jac.arr[0xea] = Jac.arr[0xea] + dVar246;
    dVar394 = dVar246 * 0.5;
    Jac.arr[0xf3] = Jac.arr[0xf3] - dVar394;
    Jac.arr[0xff] = Jac.arr[0xff] - dVar394;
    Jac.arr[0x100] = dVar394 + Jac.arr[0x100];
    Jac.arr[0x109] = Jac.arr[0x109] - dVar246;
    Jac.arr[0x115] = Jac.arr[0x115] - dVar246;
    Jac.arr[0x116] = Jac.arr[0x116] + dVar246;
    local_1688 = local_1688 * dVar212;
    Jac.arr[0x11f] = Jac.arr[0x11f] - local_1688;
    Jac.arr[299] = Jac.arr[299] - local_1688;
    Jac.arr[300] = local_1688 + Jac.arr[300];
    Jac.arr[0x135] = Jac.arr[0x135] + dVar213;
    Jac.arr[0x141] = Jac.arr[0x141] + dVar213;
    Jac.arr[0x142] = Jac.arr[0x142] - dVar213;
    dVar213 = dVar246 + dVar246;
    Jac.arr[0x18d] = Jac.arr[0x18d] - dVar213;
    Jac.arr[0x199] = Jac.arr[0x199] - dVar213;
    Jac.arr[0x19a] = dVar213 + Jac.arr[0x19a];
    dVar246 = dVar246 * -0.30000000000000004;
    Jac.arr[0x1b9] = Jac.arr[0x1b9] - dVar246;
    Jac.arr[0x1c5] = Jac.arr[0x1c5] - dVar246;
    Jac.arr[0x1c6] = dVar246 + Jac.arr[0x1c6];
    local_1688 = conc.arr[1];
    local_15f8 = h_RT[1];
    local_15c8 = conc.arr[0];
    local_15e8 = dVar371 + conc.arr[0];
    local_1618 = conc.arr[5];
    local_1648 = conc.arr[10];
    local_1638 = conc.arr[0xb];
    local_1608 = conc.arr[0xc];
    local_1658 = conc.arr[0x12];
    local_15d8 = conc.arr[0x12] + conc.arr[0x12] +
                 conc.arr[0xb] * 0.5 + conc.arr[5] * 5.0 + local_15e8 + conc.arr[10] + conc.arr[0xc]
    ;
  }
  Jac.arr[0x1cf] = Jac.arr[0x1cf] - dVar247;
  Jac.arr[0x1db] = Jac.arr[0x1db] - dVar247;
  Jac.arr[0x1dc] = dVar247 + Jac.arr[0x1dc];
  local_1428 = ((local_15d8 * 1e-12) / 6244953.487472275) * 193693058799875.4;
  dVar246 = log10(local_1428);
  local_1448 = 1.0 / ((dVar246 + -0.09427787237484897) * -0.14 + 1.3295031374387192);
  local_1438 = (dVar246 + -0.09427787237484897) * local_1448;
  dVar246 = 1.0 / (local_1438 * local_1438 + 1.0);
  dVar213 = pow(10.0,dVar246 * -0.4563016830226135);
  dVar247 = dVar246 * -0.912603366045227 * dVar246 * local_1438 * local_1448;
  dVar212 = local_1428 + 1.0;
  local_1448 = dVar247 * -1.3295031374387192 * local_1448;
  dVar213 = (local_1428 / dVar212) * dVar213;
  dVar394 = (local_1688 * dVar264 * 6244953.487472275 + conc.arr[0xf] * -27501071940.071716) *
            dVar213;
  dVar247 = (local_1688 * dVar264 * 5521.547321046288 +
            (((h_RT[0xf] - (RVar245 + local_15f8)) + 1.0) * -0.0006666666666666666 +
            0.0008841614804854543) * -27501071940.071716 * conc.arr[0xf]) * dVar213 +
            ((local_1438 * dVar247 * -1.27 + local_1448 * -0.67 + dVar246) * -8.975305961941277e-05
             + local_1448 * -0.001233681740997213 + -0.001233681740997213 / dVar212) *
            2.302585092994046 * dVar394;
  dVar294 = dVar294 - dVar394;
  local_14f0._0_8_ = dVar294;
  dStack_1488 = dVar337 - dVar394;
  local_1480 = local_1480 + dVar394;
  dVar246 = (1.0 / dVar212 + local_1448) * (dVar394 / local_15d8);
  dVar212 = dVar213 * 6244953.487472275;
  dVar213 = dVar213 * 27501071940.071716;
  if (iVar183 == 0) {
    uVar202 = (undefined4)((ulong)dVar246 >> 0x20);
    local_1418 = dVar246 * 2.0;
    local_1410._8_8_ = dVar246;
    local_1410._0_8_ = dVar264 * dVar212 + dVar246;
    local_1400._8_8_ = dVar246;
    local_1400._0_8_ = dVar246;
    dStack_13f0 = dVar246 * 6.0;
    auVar118._8_4_ = SUB84(dVar246,0);
    auVar118._0_8_ = dVar246;
    auVar118._12_4_ = uVar202;
    local_13d8 = dVar246;
    dStack_13d0 = auVar118._8_8_;
    auVar119._8_4_ = SUB84(dVar246,0);
    auVar119._0_8_ = dVar246;
    auVar119._12_4_ = uVar202;
    local_13e8 = dVar246;
    dStack_13e0 = auVar119._8_8_;
    local_13c8 = local_1418;
    dStack_13c0 = dVar246 * 1.5;
    dStack_13b8 = local_1418;
    local_13b0 = dVar246;
    dStack_13a8 = dVar212 * local_1688 + dVar246;
    dStack_13a0 = dVar246 - dVar213;
    dStack_1398 = dVar246;
    dStack_1390 = dVar246;
    local_1388 = dVar246 * 3.0;
    local_1380 = dVar246;
    local_1378 = dVar246;
    pdVar180 = Jac.arr + 0xf;
    for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
      dVar246 = *(double *)(local_1410 + lVar198 * 8 + -8);
      pdVar180[-0xe] = pdVar180[-0xe] - dVar246;
      pdVar180[-1] = pdVar180[-1] - dVar246;
      *pdVar180 = dVar246 + *pdVar180;
      pdVar180 = pdVar180 + 0x16;
    }
  }
  else {
    Jac.arr[1] = Jac.arr[1] - dVar246;
    Jac.arr[0xe] = Jac.arr[0xe] - dVar246;
    Jac.arr[0xf] = Jac.arr[0xf] + dVar246;
    dVar264 = dVar264 * dVar212;
    Jac.arr[0x17] = Jac.arr[0x17] - dVar264;
    Jac.arr[0x24] = Jac.arr[0x24] - dVar264;
    Jac.arr[0x25] = dVar264 + Jac.arr[0x25];
    dVar264 = dVar246 * 5.0;
    Jac.arr[0x6f] = Jac.arr[0x6f] - dVar264;
    Jac.arr[0x7c] = Jac.arr[0x7c] - dVar264;
    Jac.arr[0x7d] = dVar264 + Jac.arr[0x7d];
    Jac.arr[0xdd] = Jac.arr[0xdd] - dVar246;
    Jac.arr[0xea] = Jac.arr[0xea] - dVar246;
    Jac.arr[0xeb] = Jac.arr[0xeb] + dVar246;
    dVar264 = dVar246 * 0.5;
    Jac.arr[0xf3] = Jac.arr[0xf3] - dVar264;
    Jac.arr[0x100] = Jac.arr[0x100] - dVar264;
    Jac.arr[0x101] = dVar264 + Jac.arr[0x101];
    Jac.arr[0x109] = Jac.arr[0x109] - dVar246;
    Jac.arr[0x116] = Jac.arr[0x116] - dVar246;
    Jac.arr[0x117] = Jac.arr[0x117] + dVar246;
    local_1688 = local_1688 * dVar212;
    Jac.arr[0x135] = Jac.arr[0x135] - local_1688;
    Jac.arr[0x142] = Jac.arr[0x142] - local_1688;
    Jac.arr[0x143] = local_1688 + Jac.arr[0x143];
    Jac.arr[0x14b] = Jac.arr[0x14b] + dVar213;
    Jac.arr[0x158] = Jac.arr[0x158] + dVar213;
    Jac.arr[0x159] = Jac.arr[0x159] - dVar213;
    dVar246 = dVar246 + dVar246;
    Jac.arr[0x18d] = Jac.arr[0x18d] - dVar246;
    Jac.arr[0x19a] = Jac.arr[0x19a] - dVar246;
    Jac.arr[0x19b] = dVar246 + Jac.arr[0x19b];
    local_1688 = conc.arr[1];
    local_15f8 = h_RT[1];
    local_15c8 = conc.arr[0];
    local_15e8 = dVar371 + conc.arr[0];
    local_1618 = conc.arr[5];
    local_1648 = conc.arr[10];
    local_1638 = conc.arr[0xb];
    local_1608 = conc.arr[0xc];
    local_1658 = conc.arr[0x12];
    local_15d8 = conc.arr[0x12] + conc.arr[0x12] +
                 conc.arr[0xb] * 0.5 + conc.arr[5] * 5.0 + local_15e8 + conc.arr[10] + conc.arr[0xc]
    ;
  }
  Jac.arr[0x1cf] = Jac.arr[0x1cf] - dVar247;
  Jac.arr[0x1dc] = Jac.arr[0x1dc] - dVar247;
  Jac.arr[0x1dd] = dVar247 + Jac.arr[0x1dd];
  local_1448 = conc.arr[0x10];
  local_15b8 = conc.arr[0x14];
  local_1678 = conc.arr[0x14] * -0.30000000000000004 + local_15d8;
  dVar246 = local_1678 * 1e-12;
  local_1438 = (dVar246 / 16225653.552515732) * 7.275514395950915e+16;
  dVar213 = log10(local_1438);
  dVar212 = 1.0 / ((dVar213 + -0.015265883794403325) * -0.14 + 1.4792721307180714);
  local_1428 = (dVar213 + -0.015265883794403325) * dVar212;
  dVar213 = 1.0 / (local_1428 * local_1428 + 1.0);
  dVar247 = pow(10.0,dVar213 * -0.5742300241874577);
  dVar394 = local_1438 + 1.0;
  dVar264 = dVar213 * -1.1484600483749154 * dVar213 * local_1428 * dVar212;
  dVar212 = dVar264 * -1.4792721307180714 * dVar212;
  dVar247 = (local_1438 / dVar394) * dVar247;
  dVar214 = (local_1688 * local_1448 * 16225653.552515732 + conc.arr[0x11] * -67434469.58138922) *
            dVar247;
  dVar264 = (local_1688 * local_1448 * 11515.557849353894 +
            (((h_RT[0x11] - (h_RT[0x10] + local_15f8)) + 1.0) * -0.0006666666666666666 +
            0.0007097130363398179) * -67434469.58138922 * conc.arr[0x11]) * dVar247 +
            ((local_1428 * dVar264 * -1.27 + dVar212 * -0.67 + dVar213) * -0.00018029438599527205 +
             dVar212 * -0.0018374389917122033 + -0.0018374389917122033 / dVar394) *
            2.302585092994046 * dVar214;
  dVar294 = dVar294 - dVar214;
  local_14f0._0_8_ = dVar294;
  dStack_1478 = dStack_1478 - dVar214;
  local_1438 = local_1470 + dVar214;
  dVar213 = (1.0 / dVar394 + dVar212) * (dVar214 / local_1678);
  local_1470 = local_1438;
  dVar212 = dVar247 * 16225653.552515732;
  dVar247 = dVar247 * 67434469.58138922;
  if (iVar183 == 0) {
    uVar202 = (undefined4)((ulong)dVar213 >> 0x20);
    local_1418 = dVar213 * 2.0;
    local_1410._8_8_ = dVar213;
    local_1410._0_8_ = local_1448 * dVar212 + dVar213;
    local_1400._8_8_ = dVar213;
    local_1400._0_8_ = dVar213;
    dStack_13f0 = dVar213 * 6.0;
    auVar116._8_4_ = SUB84(dVar213,0);
    auVar116._0_8_ = dVar213;
    auVar116._12_4_ = uVar202;
    local_13d8 = dVar213;
    dStack_13d0 = auVar116._8_8_;
    auVar117._8_4_ = SUB84(dVar213,0);
    auVar117._0_8_ = dVar213;
    auVar117._12_4_ = uVar202;
    local_13e8 = dVar213;
    dStack_13e0 = auVar117._8_8_;
    local_13c8 = local_1418;
    dStack_13c0 = dVar213 * 1.5;
    dStack_13b8 = local_1418;
    local_13b0 = dVar213;
    dStack_13a8 = dVar213;
    dStack_13a0 = dVar213;
    dStack_1398 = dVar212 * local_1688 + dVar213;
    dStack_1390 = dVar213 - dVar247;
    local_1388 = dVar213 * 3.0;
    local_1380 = dVar213;
    local_1378 = dVar213 * 0.7;
    pdVar180 = Jac.arr + 0x11;
    for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
      dVar213 = *(double *)(local_1410 + lVar198 * 8 + -8);
      pdVar180[-0x10] = pdVar180[-0x10] - dVar213;
      pdVar180[-1] = pdVar180[-1] - dVar213;
      *pdVar180 = dVar213 + *pdVar180;
      pdVar180 = pdVar180 + 0x16;
    }
  }
  else {
    Jac.arr[1] = Jac.arr[1] - dVar213;
    Jac.arr[0x10] = Jac.arr[0x10] - dVar213;
    Jac.arr[0x11] = Jac.arr[0x11] + dVar213;
    local_1448 = local_1448 * dVar212;
    Jac.arr[0x17] = Jac.arr[0x17] - local_1448;
    Jac.arr[0x26] = Jac.arr[0x26] - local_1448;
    Jac.arr[0x27] = local_1448 + Jac.arr[0x27];
    dVar246 = dVar213 * 5.0;
    Jac.arr[0x6f] = Jac.arr[0x6f] - dVar246;
    Jac.arr[0x7e] = Jac.arr[0x7e] - dVar246;
    Jac.arr[0x7f] = dVar246 + Jac.arr[0x7f];
    Jac.arr[0xdd] = Jac.arr[0xdd] - dVar213;
    Jac.arr[0xec] = Jac.arr[0xec] - dVar213;
    Jac.arr[0xed] = Jac.arr[0xed] + dVar213;
    dVar246 = dVar213 * 0.5;
    Jac.arr[0xf3] = Jac.arr[0xf3] - dVar246;
    Jac.arr[0x102] = Jac.arr[0x102] - dVar246;
    Jac.arr[0x103] = dVar246 + Jac.arr[0x103];
    Jac.arr[0x109] = Jac.arr[0x109] - dVar213;
    Jac.arr[0x118] = Jac.arr[0x118] - dVar213;
    Jac.arr[0x119] = Jac.arr[0x119] + dVar213;
    local_1688 = local_1688 * dVar212;
    Jac.arr[0x161] = Jac.arr[0x161] - local_1688;
    Jac.arr[0x170] = Jac.arr[0x170] - local_1688;
    Jac.arr[0x171] = local_1688 + Jac.arr[0x171];
    Jac.arr[0x177] = Jac.arr[0x177] + dVar247;
    Jac.arr[0x186] = Jac.arr[0x186] + dVar247;
    Jac.arr[0x187] = Jac.arr[0x187] - dVar247;
    dVar246 = dVar213 + dVar213;
    Jac.arr[0x18d] = Jac.arr[0x18d] - dVar246;
    Jac.arr[0x19c] = Jac.arr[0x19c] - dVar246;
    Jac.arr[0x19d] = dVar246 + Jac.arr[0x19d];
    dVar213 = dVar213 * -0.30000000000000004;
    Jac.arr[0x1b9] = Jac.arr[0x1b9] - dVar213;
    Jac.arr[0x1c8] = Jac.arr[0x1c8] - dVar213;
    Jac.arr[0x1c9] = dVar213 + Jac.arr[0x1c9];
    local_1688 = conc.arr[1];
    local_15c8 = conc.arr[0];
    local_15e8 = dVar371 + conc.arr[0];
    local_1618 = conc.arr[5];
    local_1648 = conc.arr[10];
    local_1638 = conc.arr[0xb];
    local_1608 = conc.arr[0xc];
    local_1658 = conc.arr[0x12];
    local_15b8 = conc.arr[0x14];
    local_1678 = conc.arr[0x14] * -0.30000000000000004 +
                 conc.arr[0x12] + conc.arr[0x12] +
                 conc.arr[0xb] * 0.5 + conc.arr[5] * 5.0 + local_15e8 + conc.arr[10] + conc.arr[0xc]
    ;
    dVar246 = local_1678 * 1e-12;
    local_15f8 = h_RT[1];
  }
  local_1448 = conc.arr[0x11];
  local_15f8 = h_RT[0x11] + local_15f8;
  Jac.arr[0x1cf] = Jac.arr[0x1cf] - dVar264;
  Jac.arr[0x1de] = Jac.arr[0x1de] - dVar264;
  Jac.arr[0x1df] = dVar264 + Jac.arr[0x1df];
  local_1428 = (dVar246 / 219941642.44158944) * 6.888873607161395e+17;
  dVar213 = log10(local_1428);
  dVar264 = 1.0 / ((dVar213 + -0.1601631500988638) * -0.14 + 1.2046161184693178);
  dVar213 = (dVar213 + -0.1601631500988638) * dVar264;
  dVar247 = 1.0 / (dVar213 * dVar213 + 1.0);
  dVar212 = pow(10.0,dVar247 * -0.35796544761363613);
  dVar394 = local_1428 + 1.0;
  dVar214 = dVar247 * -0.7159308952272723 * dVar247 * dVar213 * dVar264;
  dVar264 = dVar214 * -1.2046161184693178 * dVar264;
  dVar212 = (local_1428 / dVar394) * dVar212;
  dVar337 = (local_1688 * local_1448 * 219941642.44158944 + local_1658 * -123.84112181745292) *
            dVar212;
  dVar247 = (local_1688 * local_1448 * -67440.72224696395 +
            (((h_RT[0x12] - local_15f8) + 1.0) * -0.0006666666666666666 + -0.0003066300746793522) *
            -123.84112181745292 * local_1658) * dVar212 +
            ((dVar213 * dVar214 * -1.27 + dVar264 * -0.67 + dVar247) * -0.00016037027791424038 +
             dVar264 * -0.001267383041404717 + -0.001267383041404717 / dVar394) * 2.302585092994046
            * dVar337;
  local_14f0._0_8_ = dVar294 - dVar337;
  local_1470 = local_1438 - dVar337;
  dStack_1468 = dStack_1468 + dVar337;
  dVar213 = (1.0 / dVar394 + dVar264) * (dVar337 / local_1678);
  dVar264 = dVar212 * 219941642.44158944;
  if (iVar183 == 0) {
    uVar202 = SUB84(dVar213,0);
    uVar204 = (undefined4)((ulong)dVar213 >> 0x20);
    local_1418 = dVar213 * 2.0;
    local_1410._8_8_ = dVar213;
    local_1410._0_8_ = local_1448 * dVar264 + dVar213;
    local_1400._8_8_ = dVar213;
    local_1400._0_8_ = dVar213;
    dStack_13f0 = dVar213 * 6.0;
    auVar112._8_4_ = uVar202;
    auVar112._0_8_ = dVar213;
    auVar112._12_4_ = uVar204;
    local_13d8 = dVar213;
    dStack_13d0 = auVar112._8_8_;
    auVar113._8_4_ = uVar202;
    auVar113._0_8_ = dVar213;
    auVar113._12_4_ = uVar204;
    local_13e8 = dVar213;
    dStack_13e0 = auVar113._8_8_;
    local_13c8 = local_1418;
    dStack_13c0 = dVar213 * 1.5;
    dStack_13b8 = local_1418;
    auVar114._8_4_ = uVar202;
    auVar114._0_8_ = dVar213;
    auVar114._12_4_ = uVar204;
    dStack_13a0 = dVar213;
    dStack_1398 = auVar114._8_8_;
    auVar115._8_4_ = uVar202;
    auVar115._0_8_ = dVar213;
    auVar115._12_4_ = uVar204;
    local_13b0 = dVar213;
    dStack_13a8 = auVar115._8_8_;
    dStack_1390 = local_1688 * dVar264 + dVar213;
    local_1388 = dVar213 * 3.0 - dVar212 * 123.84112181745292;
    local_1380 = dVar213;
    local_1378 = dVar213 * 0.7;
    pdVar180 = Jac.arr + 0x12;
    for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
      dVar213 = *(double *)(local_1410 + lVar198 * 8 + -8);
      pdVar180[-0x11] = pdVar180[-0x11] - dVar213;
      pdVar180[-1] = pdVar180[-1] - dVar213;
      *pdVar180 = dVar213 + *pdVar180;
      pdVar180 = pdVar180 + 0x16;
    }
  }
  else {
    Jac.arr[1] = Jac.arr[1] - dVar213;
    Jac.arr[0x11] = Jac.arr[0x11] - dVar213;
    Jac.arr[0x12] = Jac.arr[0x12] + dVar213;
    local_1448 = local_1448 * dVar264;
    Jac.arr[0x17] = Jac.arr[0x17] - local_1448;
    Jac.arr[0x27] = Jac.arr[0x27] - local_1448;
    Jac.arr[0x28] = local_1448 + Jac.arr[0x28];
    dVar246 = dVar213 * 5.0;
    Jac.arr[0x6f] = Jac.arr[0x6f] - dVar246;
    Jac.arr[0x7f] = Jac.arr[0x7f] - dVar246;
    Jac.arr[0x80] = dVar246 + Jac.arr[0x80];
    Jac.arr[0xdd] = Jac.arr[0xdd] - dVar213;
    Jac.arr[0xed] = Jac.arr[0xed] - dVar213;
    Jac.arr[0xee] = Jac.arr[0xee] + dVar213;
    dVar246 = dVar213 * 0.5;
    Jac.arr[0xf3] = Jac.arr[0xf3] - dVar246;
    Jac.arr[0x103] = Jac.arr[0x103] - dVar246;
    Jac.arr[0x104] = dVar246 + Jac.arr[0x104];
    Jac.arr[0x109] = Jac.arr[0x109] - dVar213;
    Jac.arr[0x119] = Jac.arr[0x119] - dVar213;
    Jac.arr[0x11a] = Jac.arr[0x11a] + dVar213;
    local_1688 = local_1688 * dVar264;
    Jac.arr[0x177] = Jac.arr[0x177] - local_1688;
    Jac.arr[0x187] = Jac.arr[0x187] - local_1688;
    Jac.arr[0x188] = local_1688 + Jac.arr[0x188];
    dVar246 = (dVar213 + dVar213) - dVar212 * 123.84112181745292;
    Jac.arr[0x18d] = Jac.arr[0x18d] - dVar246;
    Jac.arr[0x19d] = Jac.arr[0x19d] - dVar246;
    Jac.arr[0x19e] = dVar246 + Jac.arr[0x19e];
    dVar213 = dVar213 * -0.30000000000000004;
    Jac.arr[0x1b9] = Jac.arr[0x1b9] - dVar213;
    Jac.arr[0x1c9] = Jac.arr[0x1c9] - dVar213;
    Jac.arr[0x1ca] = dVar213 + Jac.arr[0x1ca];
    local_15c8 = conc.arr[0];
    local_15e8 = dVar371 + conc.arr[0];
    local_1618 = conc.arr[5];
    local_1648 = conc.arr[10];
    local_1638 = conc.arr[0xb];
    local_1608 = conc.arr[0xc];
    local_1658 = conc.arr[0x12];
    local_15b8 = conc.arr[0x14];
    local_1678 = conc.arr[0x14] * -0.30000000000000004 +
                 conc.arr[0x12] + conc.arr[0x12] +
                 conc.arr[0xb] * 0.5 + conc.arr[5] * 5.0 + local_15e8 + conc.arr[10] + conc.arr[0xc]
    ;
    dVar246 = local_1678 * 1e-12;
  }
  Jac.arr[0x1cf] = Jac.arr[0x1cf] - dVar247;
  Jac.arr[0x1e0] = dVar247 + Jac.arr[0x1e0];
  Jac.arr[0x1df] = Jac.arr[0x1df] - dVar247;
  dVar213 = (dVar246 / 6.312363615626772e-06) * 35752.450724543516;
  dVar247 = log10(dVar213);
  dVar294 = 1.0 / ((dVar247 + -0.09697718965666909) * -0.14 + 1.3243865210985526);
  dVar247 = (dVar247 + -0.09697718965666909) * dVar294;
  dVar212 = 1.0 / (dVar247 * dVar247 + 1.0);
  dVar264 = pow(10.0,dVar212 * -0.45227285125870287);
  dVar214 = conc.arr[9];
  dVar394 = dVar213 + 1.0;
  dVar337 = dVar212 * -0.9045457025174057 * dVar212 * dVar247 * dVar294;
  dVar294 = dVar337 * -1.3243865210985526 * dVar294;
  dVar264 = (dVar213 / dVar394) * dVar264;
  dVar213 = (local_15c8 * local_1638 * 6.312363615626772e-06 + conc.arr[0xe] * -115.13226896846228)
            * dVar264;
  dVar247 = (local_15c8 * local_1638 * 1.1868939967403452e-07 +
            (((h_RT[0xe] - (h_RT[0] + h_RT[0xb])) + 1.0) * -0.0006666666666666666 +
            0.01880268737691365) * -115.13226896846228 * conc.arr[0xe]) * dVar264 +
            ((dVar247 * dVar337 * -1.27 + dVar294 * -0.67 + dVar212) * -0.0002754907583934973 +
             dVar294 * -0.0009631147670810994 + -0.0009631147670810994 / dVar394) *
            2.302585092994046 * dVar213;
  local_14f8 = local_14f8 - dVar213;
  dStack_14a0 = dStack_14a0 - dVar213;
  dStack_1488 = dStack_1488 + dVar213;
  dVar337 = dVar264 * 6.312363615626772e-06;
  dVar264 = dVar264 * 115.13226896846228;
  dVar213 = (1.0 / dVar394 + dVar294) * (dVar213 / local_1678);
  dVar212 = dVar213 + dVar213;
  if (iVar183 == 0) {
    local_1418 = dVar337 * local_1638 + dVar212;
    local_1400._8_8_ = dVar213;
    local_1400._0_8_ = dVar213;
    local_1410._8_8_ = dVar213;
    local_1410._0_8_ = dVar213;
    dStack_13f0 = dVar213 * 6.0;
    local_13d8 = dVar213;
    dStack_13d0 = dVar213;
    local_13e8 = dVar213;
    dStack_13e0 = dVar213;
    local_13c8 = dVar212;
    dStack_13c0 = dVar213 * 1.5 + dVar337 * local_15c8;
    dStack_13b8 = dVar212;
    local_13b0 = dVar213;
    dStack_13a8 = dVar213 - dVar264;
    dStack_13a0 = dVar213;
    dStack_1398 = dVar213;
    dStack_1390 = dVar213;
    local_1388 = dVar213 * 3.0;
    local_1380 = dVar213;
    local_1378 = dVar213 * 0.7;
    pdVar180 = Jac.arr + 0xe;
    for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
      dVar213 = *(double *)(local_1410 + lVar198 * 8 + -8);
      dVar212 = pdVar180[-3];
      ((GpuArray<double,_484U> *)(pdVar180 + -0xe))->arr[0] =
           ((GpuArray<double,_484U> *)(pdVar180 + -0xe))->arr[0] - dVar213;
      pdVar180[-3] = dVar212 - dVar213;
      *pdVar180 = dVar213 + *pdVar180;
      pdVar180 = pdVar180 + 0x16;
    }
  }
  else {
    dVar246 = dVar337 * local_1638 + dVar213;
    Jac.arr[0] = Jac.arr[0] - dVar246;
    Jac.arr[0xb] = Jac.arr[0xb] - dVar246;
    Jac.arr[0xe] = dVar246 + Jac.arr[0xe];
    dVar246 = dVar213 * 5.0;
    Jac.arr[0x6e] = Jac.arr[0x6e] - dVar246;
    Jac.arr[0x79] = Jac.arr[0x79] - dVar246;
    Jac.arr[0x7c] = dVar246 + Jac.arr[0x7c];
    Jac.arr[0xdc] = Jac.arr[0xdc] - dVar213;
    Jac.arr[0xe7] = Jac.arr[0xe7] - dVar213;
    Jac.arr[0xea] = Jac.arr[0xea] + dVar213;
    dVar246 = dVar213 * 0.5 + dVar337 * local_15c8;
    Jac.arr[0xf2] = Jac.arr[0xf2] - dVar246;
    Jac.arr[0xfd] = Jac.arr[0xfd] - dVar246;
    Jac.arr[0x100] = dVar246 + Jac.arr[0x100];
    Jac.arr[0x108] = Jac.arr[0x108] - dVar213;
    Jac.arr[0x113] = Jac.arr[0x113] - dVar213;
    Jac.arr[0x116] = Jac.arr[0x116] + dVar213;
    Jac.arr[0x134] = Jac.arr[0x134] + dVar264;
    Jac.arr[0x13f] = Jac.arr[0x13f] + dVar264;
    Jac.arr[0x142] = Jac.arr[0x142] - dVar264;
    Jac.arr[0x18c] = Jac.arr[0x18c] - dVar212;
    Jac.arr[0x197] = Jac.arr[0x197] - dVar212;
    Jac.arr[0x19a] = dVar212 + Jac.arr[0x19a];
    dVar213 = dVar213 * -0.30000000000000004;
    Jac.arr[0x1b8] = Jac.arr[0x1b8] - dVar213;
    Jac.arr[0x1c3] = Jac.arr[0x1c3] - dVar213;
    Jac.arr[0x1c6] = dVar213 + Jac.arr[0x1c6];
    local_15e8 = conc.arr[0] + dVar371;
    local_1618 = conc.arr[5];
    local_1648 = conc.arr[10];
    local_1638 = conc.arr[0xb];
    local_1608 = conc.arr[0xc];
    local_1658 = conc.arr[0x12];
    local_15b8 = conc.arr[0x14];
    local_1678 = conc.arr[0x14] * -0.30000000000000004 +
                 conc.arr[0x12] + conc.arr[0x12] +
                 conc.arr[0xb] * 0.5 + conc.arr[5] * 5.0 + local_15e8 + conc.arr[10] + conc.arr[0xc]
    ;
    dVar246 = local_1678 * 1e-12;
  }
  Jac.arr[0x1ce] = Jac.arr[0x1ce] - dVar247;
  Jac.arr[0x1d9] = Jac.arr[0x1d9] - dVar247;
  Jac.arr[0x1dc] = dVar247 + Jac.arr[0x1dc];
  dVar246 = (dVar246 / 14295380.788738592) * 4.2554035761159823e+18;
  dVar213 = log10(dVar246);
  dVar264 = 1.0 / ((dVar213 + 0.12973051019251233) * -0.14 + 1.7541160417081951);
  dVar213 = (dVar213 + 0.12973051019251233) * dVar264;
  dVar247 = 1.0 / (dVar213 * dVar213 + 1.0);
  dVar212 = pow(10.0,dVar247 * -0.7906425525261378);
  dVar294 = dVar246 + 1.0;
  dVar394 = dVar247 * -1.5812851050522756 * dVar247 * dVar213 * dVar264;
  dVar264 = dVar394 * -1.7541160417081951 * dVar264;
  dVar212 = (dVar246 / dVar294) * dVar212;
  dVar337 = (dVar214 * dVar214 * 14295380.788738592 + local_1658 * -4338.16492800087) * dVar212;
  dVar246 = (dVar214 * dVar214 * -7262.089447255807 +
            (((h_RT[0x12] - (h_RT[9] + h_RT[9])) + 1.0) * -0.0006666666666666666 +
            -0.0005080025187560327) * -4338.16492800087 * local_1658) * dVar212 +
            ((dVar213 * dVar394 * -1.27 + dVar264 * -0.67 + dVar247) * -0.00010911464158415095 +
             dVar264 * -0.001974975711261012 + -0.001974975711261012 / dVar294) * 2.302585092994046
            * dVar337;
  local_14b0 = local_14b0 - (dVar337 + dVar337);
  dStack_1468 = dStack_1468 + dVar337;
  dVar213 = dVar212 * 14295380.788738592;
  local_13e8 = (1.0 / dVar294 + dVar264) * (dVar337 / local_1678);
  if (iVar183 == 0) {
    uVar202 = SUB84(local_13e8,0);
    uVar204 = (undefined4)((ulong)local_13e8 >> 0x20);
    local_1418 = local_13e8 * 2.0;
    local_1400._8_4_ = uVar202;
    local_1400._0_8_ = local_13e8;
    local_1400._12_4_ = uVar204;
    local_1410._8_4_ = uVar202;
    local_1410._0_8_ = local_13e8;
    local_1410._12_4_ = uVar204;
    dStack_13f0 = local_13e8 * 6.0;
    dStack_13e0 = local_13e8;
    local_13d8 = local_13e8;
    dStack_13d0 = (dVar213 + dVar213) * dVar214 + local_13e8;
    local_13c8 = local_1418;
    dStack_13c0 = local_13e8 * 1.5;
    dStack_13b8 = local_1418;
    auVar110._8_4_ = uVar202;
    auVar110._0_8_ = local_13e8;
    auVar110._12_4_ = uVar204;
    dStack_13a0 = local_13e8;
    dStack_1398 = auVar110._8_8_;
    auVar111._8_4_ = uVar202;
    auVar111._0_8_ = local_13e8;
    auVar111._12_4_ = uVar204;
    local_13b0 = local_13e8;
    dStack_13a8 = auVar111._8_8_;
    dStack_1390 = local_13e8;
    local_1388 = local_13e8 * 3.0 - dVar212 * 4338.16492800087;
    local_1380 = local_13e8;
    local_1378 = local_13e8 * 0.7;
    pdVar180 = Jac.arr + 9;
    for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
      dVar213 = *(double *)(local_1410 + lVar198 * 8 + -8);
      *pdVar180 = *pdVar180 - (dVar213 + dVar213);
      pdVar180[9] = dVar213 + pdVar180[9];
      pdVar180 = pdVar180 + 0x16;
    }
  }
  else {
    dVar247 = local_13e8 * -2.0;
    Jac.arr[9] = Jac.arr[9] + dVar247;
    Jac.arr[0x12] = Jac.arr[0x12] + local_13e8;
    dVar264 = local_13e8 * 5.0;
    Jac.arr[0x77] = Jac.arr[0x77] - (dVar264 + dVar264);
    Jac.arr[0x80] = dVar264 + Jac.arr[0x80];
    dVar214 = (dVar213 + dVar213) * dVar214;
    Jac.arr[0xcf] = Jac.arr[0xcf] - (dVar214 + dVar214);
    Jac.arr[0xd8] = dVar214 + Jac.arr[0xd8];
    Jac.arr[0xe5] = Jac.arr[0xe5] + dVar247;
    Jac.arr[0xee] = Jac.arr[0xee] + local_13e8;
    dVar213 = local_13e8 * 0.5;
    Jac.arr[0xfb] = Jac.arr[0xfb] - (dVar213 + dVar213);
    Jac.arr[0x104] = dVar213 + Jac.arr[0x104];
    Jac.arr[0x111] = dVar247 + Jac.arr[0x111];
    Jac.arr[0x11a] = Jac.arr[0x11a] + local_13e8;
    dVar213 = (local_13e8 + local_13e8) - dVar212 * 4338.16492800087;
    Jac.arr[0x195] = Jac.arr[0x195] - (dVar213 + dVar213);
    Jac.arr[0x19e] = dVar213 + Jac.arr[0x19e];
    local_13e8 = local_13e8 * -0.30000000000000004;
    Jac.arr[0x1c1] = Jac.arr[0x1c1] - (local_13e8 + local_13e8);
    Jac.arr[0x1ca] = local_13e8 + Jac.arr[0x1ca];
  }
  Jac.arr[0x1d7] = Jac.arr[0x1d7] - (dVar246 + dVar246);
  Jac.arr[0x1e0] = dVar246 + Jac.arr[0x1e0];
  local_1400._0_8_ =
       conc.arr[2] * conc.arr[1] * 333.3333333333333 + conc.arr[4] * -7.276980120178465e-07;
  dVar212 = local_1678 * (double)local_1400._0_8_;
  dVar247 = (conc.arr[2] * conc.arr[1] * -0.2222222222222222 +
            (((h_RT[4] - (h_RT[1] + h_RT[2])) + 1.0) * -0.0006666666666666666 +
            -0.0006666666666666666) * -7.276980120178465e-07 * conc.arr[4]) * local_1678;
  dVar246 = (double)local_14f0._0_8_ - dVar212;
  dVar213 = (double)local_14f0._8_8_ - dVar212;
  local_14f0._8_4_ = SUB84(dVar213,0);
  local_14f0._0_8_ = dVar246;
  local_14f0._12_4_ = (int)((ulong)dVar213 >> 0x20);
  dStack_14d8 = dVar212 + dStack_14d8;
  dVar212 = local_1678 * 333.3333333333333;
  local_1678 = local_1678 * 7.276980120178465e-07;
  uVar202 = SUB84(conc.arr[5],0);
  uVar204 = (undefined4)((ulong)conc.arr[5] >> 0x20);
  if (iVar183 == 0) {
    local_1418 = (double)local_1400._0_8_ * 2.0;
    local_1410._8_8_ = dVar212 * conc.arr[1] + (double)local_1400._0_8_;
    local_1410._0_8_ = dVar212 * conc.arr[2] + (double)local_1400._0_8_;
    local_1400._8_8_ = (double)local_1400._0_8_ - local_1678;
    dStack_13f0 = (double)local_1400._0_8_ * 6.0;
    local_13d8 = (double)local_1400._0_8_;
    dStack_13d0 = (double)local_1400._0_8_;
    local_13e8 = (double)local_1400._0_8_;
    dStack_13e0 = (double)local_1400._0_8_;
    auVar153._8_4_ = SUB84((double)local_1400._0_8_ * 1.5,0);
    auVar153._0_8_ = local_1418;
    auVar153._12_4_ = (int)((ulong)((double)local_1400._0_8_ * 1.5) >> 0x20);
    local_13c8 = local_1418;
    dStack_13c0 = auVar153._8_8_;
    dStack_13b8 = local_1418;
    dStack_13a0 = (double)local_1400._0_8_;
    dStack_1398 = (double)local_1400._0_8_;
    local_13b0 = (double)local_1400._0_8_;
    dStack_13a8 = (double)local_1400._0_8_;
    dStack_1390 = (double)local_1400._0_8_;
    local_1388 = (double)local_1400._0_8_ * 3.0;
    local_1380 = (double)local_1400._0_8_;
    local_1378 = (double)local_1400._0_8_ * 0.7;
    pdVar180 = Jac.arr + 1;
    uVar202 = SUB84(local_1618,0);
    uVar204 = (undefined4)((ulong)local_1618 >> 0x20);
    for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
      dVar212 = *(double *)(local_1410 + lVar198 * 8 + -8);
      *pdVar180 = *pdVar180 - dVar212;
      pdVar180[1] = pdVar180[1] - dVar212;
      pdVar180[3] = dVar212 + pdVar180[3];
      pdVar180 = pdVar180 + 0x16;
    }
  }
  else {
    Jac.arr[1] = Jac.arr[1] - (double)local_1400._0_8_;
    Jac.arr[2] = Jac.arr[2] - (double)local_1400._0_8_;
    Jac.arr[4] = Jac.arr[4] + (double)local_1400._0_8_;
    dVar213 = dVar212 * conc.arr[2];
    Jac.arr[0x17] = Jac.arr[0x17] - dVar213;
    Jac.arr[0x18] = Jac.arr[0x18] - dVar213;
    Jac.arr[0x1a] = dVar213 + Jac.arr[0x1a];
    dVar212 = conc.arr[1] * dVar212;
    auVar147._8_4_ = SUB84(Jac.arr[0x2e] - dVar212,0);
    auVar147._0_8_ = Jac.arr[0x2d] - dVar212;
    auVar147._12_4_ = (int)((ulong)(Jac.arr[0x2e] - dVar212) >> 0x20);
    Jac.arr[0x2d] = Jac.arr[0x2d] - dVar212;
    Jac.arr[0x2e] = (double)auVar147._8_8_;
    Jac.arr[0x30] = dVar212 + Jac.arr[0x30];
    Jac.arr[0x5a] = local_1678 + Jac.arr[0x5a];
    Jac.arr[0x59] = local_1678 + Jac.arr[0x59];
    Jac.arr[0x5c] = Jac.arr[0x5c] - local_1678;
    dVar213 = (double)local_1400._0_8_ * 5.0;
    Jac.arr[0x6f] = Jac.arr[0x6f] - dVar213;
    Jac.arr[0x70] = Jac.arr[0x70] - dVar213;
    Jac.arr[0x72] = dVar213 + Jac.arr[0x72];
    auVar95._8_4_ = SUB84(Jac.arr[0xde] - (double)local_1400._0_8_,0);
    auVar95._0_8_ = Jac.arr[0xdd] - (double)local_1400._0_8_;
    auVar95._12_4_ = (int)((ulong)(Jac.arr[0xde] - (double)local_1400._0_8_) >> 0x20);
    Jac.arr[0xdd] = Jac.arr[0xdd] - (double)local_1400._0_8_;
    Jac.arr[0xde] = (double)auVar95._8_8_;
    Jac.arr[0xe0] = Jac.arr[0xe0] + (double)local_1400._0_8_;
    dVar213 = (double)local_1400._0_8_ * 0.5;
    Jac.arr[0xf3] = Jac.arr[0xf3] - dVar213;
    Jac.arr[0xf4] = Jac.arr[0xf4] - dVar213;
    Jac.arr[0xf6] = dVar213 + Jac.arr[0xf6];
    auVar96._8_4_ = SUB84(Jac.arr[0x10a] - (double)local_1400._0_8_,0);
    auVar96._0_8_ = Jac.arr[0x109] - (double)local_1400._0_8_;
    auVar96._12_4_ = (int)((ulong)(Jac.arr[0x10a] - (double)local_1400._0_8_) >> 0x20);
    Jac.arr[0x109] = Jac.arr[0x109] - (double)local_1400._0_8_;
    Jac.arr[0x10a] = (double)auVar96._8_8_;
    Jac.arr[0x10c] = Jac.arr[0x10c] + (double)local_1400._0_8_;
    dVar213 = (double)local_1400._0_8_ + (double)local_1400._0_8_;
    auVar97._8_4_ = SUB84(Jac.arr[0x18e] - dVar213,0);
    auVar97._0_8_ = Jac.arr[0x18d] - dVar213;
    auVar97._12_4_ = (int)((ulong)(Jac.arr[0x18e] - dVar213) >> 0x20);
    Jac.arr[0x18d] = Jac.arr[0x18d] - dVar213;
    Jac.arr[0x18e] = (double)auVar97._8_8_;
    local_1400._0_8_ = (double)local_1400._0_8_ * -0.30000000000000004;
    Jac.arr[400] = dVar213 + Jac.arr[400];
    auVar1._8_4_ = SUB84(Jac.arr[0x1ba] - (double)local_1400._0_8_,0);
    auVar1._0_8_ = Jac.arr[0x1b9] - (double)local_1400._0_8_;
    auVar1._12_4_ = (int)((ulong)(Jac.arr[0x1ba] - (double)local_1400._0_8_) >> 0x20);
    Jac.arr[0x1b9] = Jac.arr[0x1b9] - (double)local_1400._0_8_;
    Jac.arr[0x1ba] = (double)auVar1._8_8_;
    Jac.arr[0x1bc] = (double)local_1400._0_8_ + Jac.arr[0x1bc];
    local_15e8 = conc.arr[0] + dVar371;
    local_1648 = conc.arr[10];
    local_1638 = conc.arr[0xb];
    local_1658 = conc.arr[0x12];
    local_1608 = conc.arr[0xc];
    local_15b8 = conc.arr[0x14];
    dVar213 = (double)local_14f0._8_8_;
  }
  Jac.arr[0x1cf] = Jac.arr[0x1cf] - dVar247;
  Jac.arr[0x1d0] = Jac.arr[0x1d0] - dVar247;
  Jac.arr[0x1d2] = dVar247 + Jac.arr[0x1d2];
  dVar264 = local_15b8 * -0.5 +
            local_1658 + local_1658 +
            local_1608 * 2.5 +
            local_1638 * 0.5 +
            (double)CONCAT44(uVar204,uVar202) * 5.0 + conc.arr[3] * 5.0 + local_15e8 + local_1648;
  local_1618 = (double)CONCAT44(uVar204,uVar202);
  local_1410._0_8_ =
       local_1638 * conc.arr[2] * 220.0432490668822 + local_1608 * -3.54614235835121e-08;
  dVar247 = dVar264 * (double)local_1410._0_8_;
  dVar212 = (local_1638 * conc.arr[2] * 0.14763924017103203 +
            (((h_RT[0xc] - (h_RT[2] + h_RT[0xb])) + 1.0) * -0.0006666666666666666 +
            0.0006709555544062933) * -3.54614235835121e-08 * local_1608) * dVar264;
  local_14f0._8_8_ = dVar213 - dVar247;
  dStack_14a0 = dStack_14a0 - dVar247;
  dStack_1498 = dVar247 + dStack_1498;
  dVar213 = dVar264 * 220.0432490668822;
  local_1418 = (double)local_1410._0_8_ + (double)local_1410._0_8_;
  dVar247 = dVar213 * local_1638;
  if (iVar183 == 0) {
    local_1410._8_8_ = dVar247 + (double)local_1410._0_8_;
    local_1400._8_8_ = local_1410._0_8_;
    local_1400._0_8_ = (double)local_1410._0_8_ * 6.0;
    dStack_13f0 = (double)local_1410._0_8_ * 6.0;
    local_13d8 = (double)local_1410._0_8_;
    dStack_13d0 = (double)local_1410._0_8_;
    local_13e8 = (double)local_1410._0_8_;
    dStack_13e0 = (double)local_1410._0_8_;
    local_13c8 = local_1418;
    dStack_13c0 = (double)local_1410._0_8_ * 1.5 + dVar213 * conc.arr[2];
    dVar213 = (double)local_1410._0_8_ * 3.5 + -(dVar264 * 3.54614235835121e-08);
    auVar24._8_4_ = SUB84(dVar213,0);
    auVar24._0_8_ = dStack_13c0;
    auVar24._12_4_ = (int)((ulong)dVar213 >> 0x20);
    dStack_13b8 = auVar24._8_8_;
    dStack_13a0 = (double)local_1410._0_8_;
    dStack_1398 = (double)local_1410._0_8_;
    local_13b0 = (double)local_1410._0_8_;
    dStack_13a8 = (double)local_1410._0_8_;
    dStack_1390 = (double)local_1410._0_8_;
    local_1388 = (double)local_1410._0_8_ * 3.0;
    local_1380 = (double)local_1410._0_8_;
    local_1378 = (double)local_1410._0_8_ * 0.5;
    pdVar180 = Jac.arr + 0xc;
    for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
      dVar213 = *(double *)(local_1410 + lVar198 * 8 + -8);
      pdVar180[-10] = pdVar180[-10] - dVar213;
      pdVar180[-1] = pdVar180[-1] - dVar213;
      *pdVar180 = dVar213 + *pdVar180;
      pdVar180 = pdVar180 + 0x16;
    }
  }
  else {
    Jac.arr[2] = Jac.arr[2] - (double)local_1410._0_8_;
    Jac.arr[0xb] = Jac.arr[0xb] - (double)local_1410._0_8_;
    Jac.arr[0xc] = Jac.arr[0xc] + (double)local_1410._0_8_;
    Jac.arr[0x2e] = Jac.arr[0x2e] - dVar247;
    Jac.arr[0x37] = Jac.arr[0x37] - dVar247;
    Jac.arr[0x38] = dVar247 + Jac.arr[0x38];
    dVar247 = (double)local_1410._0_8_ * 5.0;
    Jac.arr[0x44] = Jac.arr[0x44] - dVar247;
    Jac.arr[0x4d] = Jac.arr[0x4d] - dVar247;
    Jac.arr[0x4e] = Jac.arr[0x4e] + dVar247;
    Jac.arr[0x70] = Jac.arr[0x70] - dVar247;
    Jac.arr[0x79] = Jac.arr[0x79] - dVar247;
    Jac.arr[0x7a] = dVar247 + Jac.arr[0x7a];
    Jac.arr[0xde] = Jac.arr[0xde] - (double)local_1410._0_8_;
    Jac.arr[0xe7] = Jac.arr[0xe7] - (double)local_1410._0_8_;
    Jac.arr[0xe8] = Jac.arr[0xe8] + (double)local_1410._0_8_;
    dVar213 = (double)local_1410._0_8_ * 0.5 + dVar213 * conc.arr[2];
    Jac.arr[0xf4] = Jac.arr[0xf4] - dVar213;
    Jac.arr[0xfd] = Jac.arr[0xfd] - dVar213;
    Jac.arr[0xfe] = dVar213 + Jac.arr[0xfe];
    dVar213 = (double)local_1410._0_8_ * 2.5 - dVar264 * 3.54614235835121e-08;
    Jac.arr[0x10a] = Jac.arr[0x10a] - dVar213;
    Jac.arr[0x113] = Jac.arr[0x113] - dVar213;
    Jac.arr[0x114] = dVar213 + Jac.arr[0x114];
    Jac.arr[0x18e] = Jac.arr[0x18e] - local_1418;
    Jac.arr[0x197] = Jac.arr[0x197] - local_1418;
    Jac.arr[0x198] = local_1418 + Jac.arr[0x198];
    local_1410._0_8_ = (double)local_1410._0_8_ * -0.5;
    Jac.arr[0x1ba] = Jac.arr[0x1ba] - (double)local_1410._0_8_;
    Jac.arr[0x1c3] = Jac.arr[0x1c3] - (double)local_1410._0_8_;
    Jac.arr[0x1c4] = (double)local_1410._0_8_ + Jac.arr[0x1c4];
    local_1618 = conc.arr[5];
    local_1638 = conc.arr[0xb];
    local_1658 = conc.arr[0x12];
    local_1608 = conc.arr[0xc];
    local_15b8 = conc.arr[0x14];
  }
  Jac.arr[0x1d0] = Jac.arr[0x1d0] - dVar212;
  Jac.arr[0x1d9] = Jac.arr[0x1d9] - dVar212;
  Jac.arr[0x1da] = dVar212 + Jac.arr[0x1da];
  local_15b8 = ((local_1658 * 0.5 +
                local_1608 * 0.5 + local_1638 * -0.25 + ((dVar371 - conc.arr[3]) - local_1618)) -
               conc.arr[0x13]) - local_15b8;
  local_1418 = conc.arr[3] * conc.arr[1] * 5196.603105918946 + conc.arr[6] * -515.2276090538855;
  dVar264 = local_15b8 * local_1418;
  local_14f0._0_8_ = dVar246 - dVar264;
  local_14e0 = local_14e0 - dVar264;
  local_14c8 = dVar264 + local_14c8;
  dVar247 = (conc.arr[3] * conc.arr[1] * -2.979385780726863 +
            (((h_RT[6] - (h_RT[1] + h_RT[3])) + 1.0) * -0.0006666666666666666 +
            -0.0005733333333333334) * -515.2276090538855 * conc.arr[6]) * local_15b8;
  dVar212 = local_15b8 * 5196.603105918946;
  local_15b8 = local_15b8 * 515.2276090538855;
  dVar213 = dVar212 * conc.arr[3];
  if (iVar183 == 0) {
    local_1410._8_8_ = local_1418;
    local_1410._0_8_ = dVar213 + local_1418;
    local_1400._8_8_ = local_1418;
    local_1400._0_8_ = dVar212 * conc.arr[1];
    local_13e8 = local_1418 - local_15b8;
    uVar202 = SUB84(local_1418,0);
    uVar204 = (undefined4)((ulong)local_1418 >> 0x20);
    auVar66._8_4_ = uVar202;
    auVar66._0_8_ = local_1418;
    auVar66._12_4_ = uVar204;
    dStack_13d0 = local_1418;
    local_13c8 = auVar66._8_8_;
    auVar67._8_4_ = uVar202;
    auVar67._0_8_ = local_1418;
    auVar67._12_4_ = uVar204;
    dStack_13e0 = local_1418;
    local_13d8 = auVar67._8_8_;
    dStack_13c0 = local_1418 * 0.75;
    dStack_13b8 = local_1418 * 1.5;
    auVar68._8_4_ = uVar202;
    auVar68._0_8_ = local_1418;
    auVar68._12_4_ = uVar204;
    dStack_13a0 = local_1418;
    dStack_1398 = auVar68._8_8_;
    auVar69._8_4_ = uVar202;
    auVar69._0_8_ = local_1418;
    auVar69._12_4_ = uVar204;
    local_13b0 = local_1418;
    dStack_13a8 = auVar69._8_8_;
    dStack_1390 = local_1418;
    local_1388 = local_1418 * 1.5;
    pdVar180 = Jac.arr + 1;
    lVar198 = 0;
    while( true ) {
      if (lVar198 == 0x15) break;
      dVar213 = *(double *)(local_1410 + lVar198 * 8 + -8);
      *pdVar180 = *pdVar180 - dVar213;
      pdVar180[2] = pdVar180[2] - dVar213;
      pdVar180[5] = dVar213 + pdVar180[5];
      lVar198 = lVar198 + 1;
      pdVar180 = pdVar180 + 0x16;
    }
    local_1678 = Jac.arr[0x85];
    local_1658 = Jac.arr[0x87];
    local_1688 = Jac.arr[0x8a];
  }
  else {
    Jac.arr[0x17] = Jac.arr[0x17] - dVar213;
    Jac.arr[0x19] = Jac.arr[0x19] - dVar213;
    Jac.arr[0x1c] = dVar213 + Jac.arr[0x1c];
    dVar213 = dVar212 * conc.arr[1] - local_1418;
    Jac.arr[0x43] = Jac.arr[0x43] - dVar213;
    Jac.arr[0x45] = Jac.arr[0x45] - dVar213;
    Jac.arr[0x48] = dVar213 + Jac.arr[0x48];
    Jac.arr[0x6f] = Jac.arr[0x6f] + local_1418;
    Jac.arr[0x71] = Jac.arr[0x71] + local_1418;
    Jac.arr[0x74] = Jac.arr[0x74] - local_1418;
    local_1678 = Jac.arr[0x85] + local_15b8;
    local_1658 = Jac.arr[0x87] + local_15b8;
    local_1688 = Jac.arr[0x8a] - local_15b8;
    dVar213 = local_1418 * -0.25;
    Jac.arr[0xf3] = Jac.arr[0xf3] - dVar213;
    Jac.arr[0xf5] = Jac.arr[0xf5] - dVar213;
    Jac.arr[0xf8] = dVar213 + Jac.arr[0xf8];
    dVar213 = local_1418 * 0.5;
    Jac.arr[0x109] = Jac.arr[0x109] - dVar213;
    Jac.arr[0x10b] = Jac.arr[0x10b] - dVar213;
    Jac.arr[0x10e] = Jac.arr[0x10e] + dVar213;
    Jac.arr[0x18d] = Jac.arr[0x18d] - dVar213;
    Jac.arr[399] = Jac.arr[399] - dVar213;
    Jac.arr[0x192] = dVar213 + Jac.arr[0x192];
    Jac.arr[0x1a3] = Jac.arr[0x1a3] + local_1418;
    Jac.arr[0x1a5] = Jac.arr[0x1a5] + local_1418;
    Jac.arr[0x1a8] = Jac.arr[0x1a8] - local_1418;
    Jac.arr[0x1b9] = Jac.arr[0x1b9] + local_1418;
    Jac.arr[0x1bb] = Jac.arr[0x1bb] + local_1418;
    Jac.arr[0x1be] = Jac.arr[0x1be] - local_1418;
    local_1618 = conc.arr[5];
  }
  local_1668 = conc.arr[3] * conc.arr[1];
  dVar213 = conc.arr[1] * conc.arr[3] * conc.arr[3];
  dVar265 = dVar213 * 1033.3424938946343 + conc.arr[3] * conc.arr[6] * -102.45280842339088;
  dVar369 = dVar213 * -1.1848993929991807 +
            ((((h_RT[3] + h_RT[6]) - (h_RT[3] + h_RT[3] + h_RT[1])) + 1.0) * -0.0006666666666666666
            + -0.0011466666666666667) * -102.45280842339088 * conc.arr[3] * conc.arr[6];
  dVar212 = conc.arr[3] * conc.arr[3] * 1033.3424938946343;
  dVar395 = (conc.arr[1] * 1033.3424938946343 + conc.arr[1] * 1033.3424938946343) * conc.arr[3] +
            conc.arr[6] * -102.45280842339088;
  dVar357 = conc.arr[3] * -102.45280842339088;
  dVar214 = local_1668 * local_1618 * 36172.079901627476 +
            conc.arr[6] * local_1618 * -3586.3532123502373;
  dVar370 = local_1668 * local_1618 * -18.327187150157922 +
            ((((h_RT[5] + h_RT[6]) - (h_RT[1] + h_RT[3] + h_RT[5])) + 1.0) * -0.0006666666666666666
            + -0.0005066666666666667) * -3586.3532123502373 * conc.arr[6] * local_1618;
  dVar405 = conc.arr[3] * 36172.079901627476 * conc.arr[5];
  dVar380 = conc.arr[5] * conc.arr[1] * 36172.079901627476;
  dVar213 = conc.arr[1] * 36172.079901627476 * conc.arr[3] + conc.arr[6] * -3586.3532123502373;
  Jac.arr[0x6f] = Jac.arr[0x6f] - dVar213;
  Jac.arr[0x71] = Jac.arr[0x71] - dVar213;
  Jac.arr[0x74] = dVar213 + Jac.arr[0x74];
  dVar394 = conc.arr[5] * -3586.3532123502373;
  dVar213 = conc.arr[3] * conc.arr[1] * conc.arr[0x13];
  dVar266 = dVar213 * 1291.6781173682928 + conc.arr[6] * conc.arr[0x13] * -128.06601052923858;
  dVar338 = dVar213 * -1.4811242412489758 +
            ((((h_RT[0x13] + h_RT[6]) - (h_RT[1] + h_RT[3] + h_RT[0x13])) + 1.0) *
             -0.0006666666666666666 + -0.0011466666666666667) * -128.06601052923858 *
            conc.arr[6] * conc.arr[0x13];
  dVar337 = conc.arr[0x13] * conc.arr[1] * 1291.6781173682928;
  dVar248 = conc.arr[3] * 1291.6781173682928 * conc.arr[0x13];
  dVar213 = conc.arr[0x13] * -128.06601052923858;
  dVar294 = conc.arr[1] * 1291.6781173682928 * conc.arr[3] + conc.arr[6] * -128.06601052923858;
  Jac.arr[0x1a3] = Jac.arr[0x1a3] - dVar294;
  Jac.arr[0x1a5] = Jac.arr[0x1a5] - dVar294;
  Jac.arr[0x1a8] = dVar294 + Jac.arr[0x1a8];
  dVar294 = conc.arr[3] * conc.arr[1] * conc.arr[0x14];
  dVar295 = dVar294 * 2014.7679457577242 + conc.arr[6] * conc.arr[0x14] * -199.75819787137542;
  dVar294 = dVar294 * -1.0745429044041197 +
            ((((h_RT[0x14] + h_RT[6]) - (h_RT[1] + h_RT[3] + h_RT[0x14])) + 1.0) *
             -0.0006666666666666666 + -0.0005333333333333334) * -199.75819787137542 *
            conc.arr[6] * conc.arr[0x14];
  local_14f0._0_8_ = ((((dVar246 - dVar264) - dVar265) - dVar214) - dVar266) - dVar295;
  local_14e0 = (((local_14e0 - dVar265) - dVar214) - dVar266) - dVar295;
  local_14c8 = dVar295 + dVar266 + dVar214 + dVar265 + local_14c8;
  dVar246 = conc.arr[3] * 2014.7679457577242 * conc.arr[0x14];
  Jac.arr[0x17] = (((Jac.arr[0x17] - dVar212) - dVar405) - dVar248) - dVar246;
  Jac.arr[0x19] = (((Jac.arr[0x19] - dVar212) - dVar405) - dVar248) - dVar246;
  Jac.arr[0x1c] = dVar246 + dVar248 + dVar405 + dVar212 + Jac.arr[0x1c];
  dVar246 = conc.arr[0x14] * conc.arr[1] * 2014.7679457577242;
  Jac.arr[0x43] = (((Jac.arr[0x43] - dVar395) - dVar380) - dVar337) - dVar246;
  Jac.arr[0x45] = (((Jac.arr[0x45] - dVar395) - dVar380) - dVar337) - dVar246;
  Jac.arr[0x48] = dVar246 + dVar337 + dVar380 + dVar395 + Jac.arr[0x48];
  dVar246 = conc.arr[0x14] * -199.75819787137542;
  Jac.arr[0x85] = (((local_1678 - dVar357) - dVar394) - dVar213) - dVar246;
  Jac.arr[0x87] = (((local_1658 - dVar357) - dVar394) - dVar213) - dVar246;
  Jac.arr[0x8a] = dVar246 + dVar213 + dVar394 + dVar357 + local_1688;
  dVar246 = conc.arr[1] * 2014.7679457577242 * conc.arr[3] + conc.arr[6] * -199.75819787137542;
  dVar212 = Jac.arr[0x1b9] - dVar246;
  Jac.arr[0x1b9] = dVar212;
  Jac.arr[0x1bb] = Jac.arr[0x1bb] - dVar246;
  Jac.arr[0x1be] = dVar246 + Jac.arr[0x1be];
  Jac.arr[0x1cf] = ((((Jac.arr[0x1cf] - dVar247) - dVar369) - dVar370) - dVar338) - dVar294;
  Jac.arr[0x1d1] = ((((Jac.arr[0x1d1] - dVar247) - dVar369) - dVar370) - dVar338) - dVar294;
  Jac.arr[0x1d4] = dVar294 + dVar338 + dVar370 + dVar369 + dVar247 + Jac.arr[0x1d4];
  dVar294 = conc.arr[0x14] * -0.37 +
            conc.arr[0x12] + conc.arr[0x12] +
            ((((dVar371 - conc.arr[0]) - conc.arr[5]) + conc.arr[10]) - conc.arr[0xc]);
  dVar264 = conc.arr[1] * conc.arr[1];
  dVar246 = h_RT[1] + h_RT[1];
  local_1410._8_8_ = dVar264 * 666.6666666666666 + conc.arr[0] * -1.6792101947629015e-06;
  dVar247 = (double)local_1410._8_8_ * dVar294;
  dVar213 = (dVar264 * -0.4444444444444444 +
            (((h_RT[0] - dVar246) + 1.0) * -0.0006666666666666666 + -0.0006666666666666666) *
            -1.6792101947629015e-06 * conc.arr[0]) * dVar294;
  dVar394 = dVar294 * 666.6666666666666 + dVar294 * 666.6666666666666;
  if (iVar183 == 0) {
    pdVar180 = &local_1418;
    local_1418 = dVar294 * -1.6792101947629015e-06;
    local_1410._0_8_ = dVar394 * conc.arr[1] + (double)local_1410._8_8_;
    local_1400._8_8_ = local_1410._8_8_;
    local_1400._0_8_ = local_1410._8_8_;
    uVar202 = (undefined4)local_1410._8_8_;
    uVar204 = (undefined4)((ulong)local_1410._8_8_ >> 0x20);
    auVar106._8_4_ = uVar202;
    auVar106._0_8_ = local_1410._8_8_;
    auVar106._12_4_ = uVar204;
    local_13d8 = (double)local_1410._8_8_;
    dStack_13d0 = auVar106._8_8_;
    auVar107._8_4_ = uVar202;
    auVar107._0_8_ = local_1410._8_8_;
    auVar107._12_4_ = uVar204;
    local_13e8 = (double)local_1410._8_8_;
    dStack_13e0 = auVar107._8_8_;
    local_13c8 = (double)local_1410._8_8_ + (double)local_1410._8_8_;
    dStack_13c0 = (double)local_1410._8_8_;
    auVar108._8_4_ = uVar202;
    auVar108._0_8_ = local_1410._8_8_;
    auVar108._12_4_ = uVar204;
    dStack_13a0 = (double)local_1410._8_8_;
    dStack_1398 = auVar108._8_8_;
    auVar109._8_4_ = uVar202;
    auVar109._0_8_ = local_1410._8_8_;
    auVar109._12_4_ = uVar204;
    local_13b0 = (double)local_1410._8_8_;
    dStack_13a8 = auVar109._8_8_;
    dStack_1390 = (double)local_1410._8_8_;
    local_1388 = (double)local_1410._8_8_ * 3.0;
    local_1380 = (double)local_1410._8_8_;
    local_1378 = (double)local_1410._8_8_ * 0.63;
    for (lVar198 = 1; lVar198 != 0x1cf; lVar198 = lVar198 + 0x16) {
      dVar212 = *pdVar180;
      Jac.arr[lVar198 + -1] = Jac.arr[lVar198 + -1] + dVar212;
      Jac.arr[lVar198] = Jac.arr[lVar198] - (dVar212 + dVar212);
      pdVar180 = pdVar180 + 1;
    }
    local_1658 = Jac.arr[0];
    local_1638 = Jac.arr[1];
    local_1618 = Jac.arr[0x16];
    local_1668 = Jac.arr[0x6e];
    local_1678 = Jac.arr[0x6f];
  }
  else {
    dVar294 = dVar294 * -1.6792101947629015e-06 - (double)local_1410._8_8_;
    local_1658 = Jac.arr[0] + dVar294;
    local_1638 = Jac.arr[1] - (dVar294 + dVar294);
    dVar394 = dVar394 * conc.arr[1];
    local_1618 = Jac.arr[0x16] + dVar394;
    Jac.arr[0x17] = Jac.arr[0x17] - (dVar394 + dVar394);
    local_1668 = Jac.arr[0x6e] - (double)local_1410._8_8_;
    dVar294 = (double)local_1410._8_8_ + (double)local_1410._8_8_;
    local_1678 = Jac.arr[0x6f] + dVar294;
    Jac.arr[0xdc] = Jac.arr[0xdc] + (double)local_1410._8_8_;
    Jac.arr[0xdd] = Jac.arr[0xdd] - dVar294;
    Jac.arr[0x108] = Jac.arr[0x108] - (double)local_1410._8_8_;
    Jac.arr[0x109] = Jac.arr[0x109] + dVar294;
    Jac.arr[0x18c] = Jac.arr[0x18c] + dVar294;
    Jac.arr[0x18d] = Jac.arr[0x18d] - (dVar294 + dVar294);
    local_1410._8_8_ = (double)local_1410._8_8_ * -0.37;
    Jac.arr[0x1b8] = Jac.arr[0x1b8] + (double)local_1410._8_8_;
    Jac.arr[0x1b9] = dVar212 - ((double)local_1410._8_8_ + (double)local_1410._8_8_);
    Jac.arr[0x1ba] = Jac.arr[0x1ba];
  }
  dVar212 = conc.arr[0] * dVar264 * 1118.3757819574057 +
            conc.arr[0] * conc.arr[0] * -2.8169820219582113e-06;
  dVar337 = conc.arr[0] * dVar264 * -0.4473503127829622 +
            (-0.00039999999999999996 -
            (((h_RT[0] + h_RT[0]) - (dVar246 + h_RT[0])) + 1.0) * 0.0006666666666666666) *
            -2.8169820219582113e-06 * conc.arr[0] * conc.arr[0];
  dVar265 = dVar264 * 1118.3757819574057 + conc.arr[0] * -5.633964043916423e-06;
  dVar294 = (conc.arr[0] * 1118.3757819574057 + conc.arr[0] * 1118.3757819574057) * conc.arr[1];
  dVar394 = dVar264 * conc.arr[5] * 6427.427351557215 +
            conc.arr[0] * conc.arr[5] * -1.618950230224919e-05;
  dVar266 = dVar264 * conc.arr[5] * -5.356189459631012 +
            (-0.0008333333333333333 -
            (((h_RT[5] + h_RT[0]) - (dVar246 + h_RT[5])) + 1.0) * 0.0006666666666666666) *
            -1.618950230224919e-05 * conc.arr[0] * conc.arr[5];
  dVar214 = conc.arr[5] * -1.618950230224919e-05;
  dVar248 = conc.arr[1] * 12854.85470311443 * conc.arr[5];
  dVar369 = dVar264 * 6427.427351557215 + conc.arr[0] * -1.618950230224919e-05;
  Jac.arr[0x6e] = local_1668 + dVar369;
  Jac.arr[0x6f] = local_1678 - (dVar369 + dVar369);
  dVar369 = dVar264 * conc.arr[0xc] * 244.44444444444443 +
            conc.arr[0] * conc.arr[0xc] * -6.157104047463972e-07;
  dVar295 = dVar264 * conc.arr[0xc] * -0.3259259259259259 +
            (-0.0013333333333333333 -
            (((h_RT[0xc] + h_RT[0]) - (dVar246 + h_RT[0xc])) + 1.0) * 0.0006666666666666666) *
            -6.157104047463972e-07 * conc.arr[0] * conc.arr[0xc];
  local_14f8 = local_14f8 + dVar247 + dVar212 + dVar394 + dVar369;
  dVar264 = conc.arr[1] * 488.88888888888886 * conc.arr[0xc];
  dVar246 = conc.arr[0xc] * -6.157104047463972e-07;
  Jac.arr[0] = local_1658 + dVar265 + dVar214 + dVar246;
  Jac.arr[1] = ((local_1638 - (dVar265 + dVar265)) - (dVar214 + dVar214)) - (dVar246 + dVar246);
  Jac.arr[0x16] = local_1618 + dVar294 + dVar248 + dVar264;
  Jac.arr[0x17] =
       ((Jac.arr[0x17] - (dVar294 + dVar294)) - (dVar248 + dVar248)) - (dVar264 + dVar264);
  dVar246 = conc.arr[1] * conc.arr[1] * 244.44444444444443 + conc.arr[0] * -6.157104047463972e-07;
  Jac.arr[0x108] = Jac.arr[0x108] + dVar246;
  Jac.arr[0x109] = Jac.arr[0x109] - (dVar246 + dVar246);
  Jac.arr[0x1ce] = Jac.arr[0x1ce] + dVar213 + dVar337 + dVar266 + dVar295;
  Jac.arr[0x1cf] =
       (((Jac.arr[0x1cf] - (dVar213 + dVar213)) - (dVar337 + dVar337)) - (dVar266 + dVar266)) -
       (dVar295 + dVar295);
  dVar246 = conc.arr[0x14] * -0.62 +
            conc.arr[0x12] + conc.arr[0x12] +
            conc.arr[5] * 2.65 + conc.arr[0] * -0.27 + dVar371 + conc.arr[10];
  local_1410._8_8_ =
       conc.arr[1] * conc.arr[4] * 9777.777777777777 + conc.arr[5] * -7.029234294042697e-07;
  uVar202 = (undefined4)local_1410._8_8_;
  uVar204 = (undefined4)((ulong)local_1410._8_8_ >> 0x20);
  dVar213 = dVar246 * (double)local_1410._8_8_;
  local_14f0._0_8_ =
       (((((double)local_14f0._0_8_ - (dVar247 + dVar247)) - (dVar212 + dVar212)) -
        (dVar394 + dVar394)) - (dVar369 + dVar369)) - dVar213;
  dStack_14d8 = dStack_14d8 - dVar213;
  local_14d0 = dVar213 + local_14d0;
  dVar212 = (conc.arr[1] * conc.arr[4] * -13.037037037037036 +
            (-0.0013333333333333333 -
            ((h_RT[5] - (h_RT[4] + h_RT[1])) + 1.0) * 0.0006666666666666666) *
            -7.029234294042697e-07 * conc.arr[5]) * dVar246;
  dVar247 = dVar246 * 9777.777777777777;
  dVar213 = conc.arr[4] * dVar247;
  if (iVar183 == 0) {
    local_1418 = (double)local_1410._8_8_ * 0.73;
    local_1410._0_8_ = dVar213 + (double)local_1410._8_8_;
    local_1400._8_8_ = (double)local_1410._8_8_ + conc.arr[1] * dVar247;
    local_1400._0_8_ = local_1410._8_8_;
    dStack_13f0 = -(dVar246 * 7.029234294042697e-07) + (double)local_1410._8_8_ * 3.65;
    auVar20._8_4_ = uVar202;
    auVar20._0_8_ = local_1410._8_8_;
    auVar20._12_4_ = uVar204;
    local_13d8 = (double)local_1410._8_8_;
    dStack_13d0 = auVar20._8_8_;
    auVar21._8_4_ = uVar202;
    auVar21._0_8_ = local_1410._8_8_;
    auVar21._12_4_ = uVar204;
    local_13e8 = (double)local_1410._8_8_;
    dStack_13e0 = auVar21._8_8_;
    local_13c8 = (double)local_1410._8_8_ + (double)local_1410._8_8_;
    auVar22._8_4_ = uVar202;
    auVar22._0_8_ = local_1410._8_8_;
    auVar22._12_4_ = uVar204;
    local_13b0 = (double)local_1410._8_8_;
    dStack_13a8 = auVar22._8_8_;
    auVar23._8_4_ = uVar202;
    auVar23._0_8_ = local_1410._8_8_;
    auVar23._12_4_ = uVar204;
    dStack_13c0 = (double)local_1410._8_8_;
    dStack_13b8 = auVar23._8_8_;
    dStack_13a0 = (double)local_1410._8_8_;
    dStack_1398 = (double)local_1410._8_8_;
    dStack_1390 = (double)local_1410._8_8_;
    local_1388 = (double)local_1410._8_8_ * 3.0;
    local_1380 = (double)local_1410._8_8_;
    local_1378 = (double)local_1410._8_8_ * 0.38;
    pdVar180 = Jac.arr + 5;
    for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
      dVar246 = *(double *)(local_1410 + lVar198 * 8 + -8);
      pdVar180[-4] = pdVar180[-4] - dVar246;
      pdVar180[-1] = pdVar180[-1] - dVar246;
      *pdVar180 = dVar246 + *pdVar180;
      pdVar180 = pdVar180 + 0x16;
    }
    local_1678 = Jac.arr[0x6f];
  }
  else {
    dVar264 = (double)local_1410._8_8_ * -0.27;
    Jac.arr[1] = Jac.arr[1] - dVar264;
    Jac.arr[4] = Jac.arr[4] - dVar264;
    Jac.arr[5] = dVar264 + Jac.arr[5];
    Jac.arr[0x17] = Jac.arr[0x17] - dVar213;
    Jac.arr[0x1a] = Jac.arr[0x1a] - dVar213;
    Jac.arr[0x1b] = dVar213 + Jac.arr[0x1b];
    dVar247 = dVar247 * conc.arr[1];
    Jac.arr[0x59] = Jac.arr[0x59] - dVar247;
    Jac.arr[0x5c] = Jac.arr[0x5c] - dVar247;
    Jac.arr[0x5d] = dVar247 + Jac.arr[0x5d];
    dVar246 = (double)local_1410._8_8_ * 2.65 - dVar246 * 7.029234294042697e-07;
    local_1678 = Jac.arr[0x6f] - dVar246;
    Jac.arr[0x72] = Jac.arr[0x72] - dVar246;
    Jac.arr[0x73] = dVar246 + Jac.arr[0x73];
    Jac.arr[0xdd] = Jac.arr[0xdd] - (double)local_1410._8_8_;
    Jac.arr[0xe0] = Jac.arr[0xe0] - (double)local_1410._8_8_;
    Jac.arr[0xe1] = Jac.arr[0xe1] + (double)local_1410._8_8_;
    dVar246 = (double)local_1410._8_8_ + (double)local_1410._8_8_;
    Jac.arr[0x18d] = Jac.arr[0x18d] - dVar246;
    Jac.arr[400] = Jac.arr[400] - dVar246;
    Jac.arr[0x191] = dVar246 + Jac.arr[0x191];
    local_1410._8_8_ = (double)local_1410._8_8_ * -0.62;
    Jac.arr[0x1b9] = Jac.arr[0x1b9] - (double)local_1410._8_8_;
    Jac.arr[0x1bc] = Jac.arr[0x1bc] - (double)local_1410._8_8_;
    Jac.arr[0x1bd] = (double)local_1410._8_8_ + Jac.arr[0x1bd];
  }
  Jac.arr[0x1d2] = Jac.arr[0x1d2] - dVar212;
  Jac.arr[0x1d3] = dVar212 + Jac.arr[0x1d3];
  dVar246 = conc.arr[5] * conc.arr[1] * conc.arr[0xb];
  dVar247 = conc.arr[5] * conc.arr[0xd] * 4989960.261382571 + dVar246 * -1002.9930150071424;
  dVar213 = conc.arr[5] * conc.arr[0xd] * 15645.595296379073 +
            (0.0031354148083023287 -
            (((h_RT[1] + h_RT[5] + h_RT[0xb]) - (h_RT[5] + h_RT[0xd])) + -1.0) *
            0.0006666666666666666) * -1002.9930150071424 * dVar246;
  dVar246 = conc.arr[5] * -1002.9930150071424 * conc.arr[0xb];
  Jac.arr[0x17] = Jac.arr[0x17] + dVar246;
  Jac.arr[0x21] = Jac.arr[0x21] + dVar246;
  Jac.arr[0x23] = Jac.arr[0x23] - dVar246;
  dVar264 = conc.arr[0xd] * 4989960.261382571 + conc.arr[0xb] * conc.arr[1] * -1002.9930150071424;
  Jac.arr[0x6f] = local_1678 + dVar264;
  Jac.arr[0x79] = Jac.arr[0x79] + dVar264;
  Jac.arr[0x7b] = Jac.arr[0x7b] - dVar264;
  dVar246 = conc.arr[1] * -1002.9930150071424 * conc.arr[5];
  Jac.arr[0xf3] = Jac.arr[0xf3] + dVar246;
  dVar294 = Jac.arr[0xfd] + dVar246;
  Jac.arr[0xfd] = dVar294;
  Jac.arr[0xff] = Jac.arr[0xff] - dVar246;
  dVar246 = conc.arr[5] * 4989960.261382571;
  Jac.arr[0x11f] = Jac.arr[0x11f] + dVar246;
  Jac.arr[0x129] = Jac.arr[0x129] + dVar246;
  Jac.arr[299] = Jac.arr[299] - dVar246;
  Jac.arr[0x1cf] = (Jac.arr[0x1cf] - dVar212) + dVar213;
  Jac.arr[0x1d9] = Jac.arr[0x1d9] + dVar213;
  Jac.arr[0x1db] = Jac.arr[0x1db] - dVar213;
  dVar213 = conc.arr[0x12] + conc.arr[0x12] +
            conc.arr[0xb] * 0.5 + ((dVar371 + conc.arr[0]) - conc.arr[5]) + conc.arr[10] +
            conc.arr[0xc];
  local_1410._8_8_ =
       conc.arr[0xd] * 415830.02178188093 + conc.arr[0xb] * conc.arr[1] * -83.5827512505952;
  dVar246 = (double)local_1410._8_8_ * dVar213;
  local_14f0._0_8_ = (double)local_14f0._0_8_ + dVar247 + dVar246;
  dStack_14a0 = dStack_14a0 + dVar247 + dVar246;
  dStack_1490 = (dStack_1490 - dVar247) - dVar246;
  dVar371 = (conc.arr[0xd] * 1303.7996080315893 +
            (0.0031354148083023287 -
            (((h_RT[0xb] + h_RT[1]) - h_RT[0xd]) + -1.0) * 0.0006666666666666666) *
            -83.5827512505952 * conc.arr[0xb] * conc.arr[1]) * dVar213;
  dVar246 = dVar213 * 415830.02178188093;
  dVar213 = dVar213 * 83.5827512505952;
  local_1418 = (double)local_1410._8_8_ + (double)local_1410._8_8_;
  if (iVar183 == 0) {
    local_1410._0_8_ = (double)local_1410._8_8_ - conc.arr[0xb] * dVar213;
    local_1400._8_8_ = local_1410._8_8_;
    local_1400._0_8_ = local_1410._8_8_;
    uVar202 = (undefined4)local_1410._8_8_;
    uVar204 = (undefined4)((ulong)local_1410._8_8_ >> 0x20);
    auVar16._8_4_ = uVar202;
    auVar16._0_8_ = local_1410._8_8_;
    auVar16._12_4_ = uVar204;
    local_13d8 = (double)local_1410._8_8_;
    dStack_13d0 = auVar16._8_8_;
    auVar17._8_4_ = uVar202;
    auVar17._0_8_ = local_1410._8_8_;
    auVar17._12_4_ = uVar204;
    local_13e8 = (double)local_1410._8_8_;
    dStack_13e0 = auVar17._8_8_;
    local_13c8 = local_1418;
    dStack_13c0 = (double)local_1410._8_8_ * 1.5 - dVar213 * conc.arr[1];
    dStack_13b8 = local_1418;
    local_13b0 = dVar246 + (double)local_1410._8_8_;
    auVar18._8_4_ = uVar202;
    auVar18._0_8_ = local_1410._8_8_;
    auVar18._12_4_ = uVar204;
    dStack_1398 = (double)local_1410._8_8_;
    dStack_1390 = auVar18._8_8_;
    auVar19._8_4_ = uVar202;
    auVar19._0_8_ = local_1410._8_8_;
    auVar19._12_4_ = uVar204;
    dStack_13a8 = (double)local_1410._8_8_;
    dStack_13a0 = auVar19._8_8_;
    local_1388 = (double)local_1410._8_8_ * 3.0;
    local_1380 = (double)local_1410._8_8_;
    local_1378 = (double)local_1410._8_8_;
    pdVar180 = Jac.arr + 0xd;
    for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
      dVar246 = *(double *)(local_1410 + lVar198 * 8 + -8);
      pdVar180[-0xc] = pdVar180[-0xc] + dVar246;
      pdVar180[-2] = pdVar180[-2] + dVar246;
      *pdVar180 = *pdVar180 - dVar246;
      pdVar180 = pdVar180 + 0x16;
    }
    local_1668 = Jac.arr[0x17];
  }
  else {
    Jac.arr[1] = Jac.arr[1] + (double)local_1410._8_8_;
    Jac.arr[0xb] = Jac.arr[0xb] + (double)local_1410._8_8_;
    Jac.arr[0xd] = Jac.arr[0xd] - (double)local_1410._8_8_;
    dVar247 = -dVar213 * conc.arr[0xb];
    local_1668 = Jac.arr[0x17] + dVar247;
    Jac.arr[0x21] = Jac.arr[0x21] + dVar247;
    Jac.arr[0x23] = Jac.arr[0x23] - dVar247;
    Jac.arr[0x6f] = (local_1678 + dVar264) - (double)local_1410._8_8_;
    Jac.arr[0x79] = Jac.arr[0x79] - (double)local_1410._8_8_;
    Jac.arr[0x7b] = Jac.arr[0x7b] + (double)local_1410._8_8_;
    Jac.arr[0xdd] = Jac.arr[0xdd] + (double)local_1410._8_8_;
    Jac.arr[0xe7] = Jac.arr[0xe7] + (double)local_1410._8_8_;
    Jac.arr[0xe9] = Jac.arr[0xe9] - (double)local_1410._8_8_;
    dVar213 = (double)local_1410._8_8_ * 0.5 - dVar213 * conc.arr[1];
    Jac.arr[0xf3] = Jac.arr[0xf3] + dVar213;
    Jac.arr[0xfd] = dVar294 + dVar213;
    Jac.arr[0xff] = Jac.arr[0xff] - dVar213;
    Jac.arr[0x109] = Jac.arr[0x109] + (double)local_1410._8_8_;
    Jac.arr[0x113] = Jac.arr[0x113] + (double)local_1410._8_8_;
    Jac.arr[0x115] = Jac.arr[0x115] - (double)local_1410._8_8_;
    Jac.arr[0x11f] = Jac.arr[0x11f] + dVar246;
    Jac.arr[0x129] = Jac.arr[0x129] + dVar246;
    Jac.arr[299] = Jac.arr[299] - dVar246;
    Jac.arr[0x18d] = Jac.arr[0x18d] + local_1418;
    Jac.arr[0x197] = Jac.arr[0x197] + local_1418;
    Jac.arr[0x199] = Jac.arr[0x199] - local_1418;
  }
  dVar246 = conc.arr[2] * 1831069.794862108;
  Jac.arr[2] = Jac.arr[2] - dVar246;
  dVar215 = conc.arr[0] * 1831069.794862108;
  Jac.arr[0x2c] = Jac.arr[0x2c] - dVar215;
  dVar126 = conc.arr[1] * -1587014.959464585;
  dVar216 = conc.arr[4] * -0.44037520695372745;
  dVar362 = conc.arr[2] * 20000000.0;
  Jac.arr[0x86] = Jac.arr[0x86] - dVar362;
  dVar358 = conc.arr[6] * 20000000.0;
  dVar366 = conc.arr[7] * 80000000.0;
  dVar213 = dVar358 + dVar215 + Jac.arr[0x30];
  auVar98._8_4_ = SUB84(dVar213,0);
  auVar98._0_8_ = dVar358 + Jac.arr[0x2f];
  auVar98._12_4_ = (int)((ulong)dVar213 >> 0x20);
  dVar381 = conc.arr[2] * conc.arr[0] * 1831069.794862108 +
            conc.arr[1] * conc.arr[4] * -1587014.959464585;
  dVar411 = conc.arr[4] * -1587014.959464585;
  dVar382 = conc.arr[2] * conc.arr[0] * 5835.198557030137 +
            (0.0031867701457385282 -
            ((h_RT[4] + h_RT[1]) - (h_RT[0] + h_RT[2])) * 0.0006666666666666666) *
            -1587014.959464585 * conc.arr[1] * conc.arr[4];
  dVar392 = conc.arr[6] * conc.arr[2] * 0.0 +
            (0.0 - ((h_RT[3] + h_RT[4]) - (h_RT[2] + h_RT[6])) * 0.0006666666666666666) *
            -0.44037520695372745 * conc.arr[4] * conc.arr[3];
  dVar213 = conc.arr[3] * -0.44037520695372745;
  dVar247 = dVar213 + dVar126 + Jac.arr[0x5c];
  auVar2._8_4_ = SUB84(dVar247,0);
  auVar2._0_8_ = dVar213 + Jac.arr[0x5b];
  auVar2._12_4_ = (int)((ulong)dVar247 >> 0x20);
  dVar406 = Jac.arr[0x1cf] + dVar371 + dVar382;
  dVar247 = (Jac.arr[0x1d0] - dVar382) - dVar392;
  auVar3._8_4_ = SUB84(dVar247,0);
  auVar3._0_8_ = dVar406;
  auVar3._12_4_ = (int)((ulong)dVar247 >> 0x20);
  dVar247 = dVar392 + Jac.arr[0x1d2] + dVar382;
  auVar4._8_4_ = SUB84(dVar247,0);
  auVar4._0_8_ = dVar392 + Jac.arr[0x1d1];
  auVar4._12_4_ = (int)((ulong)dVar247 >> 0x20);
  auVar5._8_4_ = SUB84(Jac.arr[0x33] - dVar366,0);
  auVar5._0_8_ = Jac.arr[0x32] - dVar358;
  auVar5._12_4_ = (int)((ulong)(Jac.arr[0x33] - dVar366) >> 0x20);
  Jac.arr[0x32] = Jac.arr[0x32] - dVar358;
  Jac.arr[0x33] = (double)auVar5._8_8_;
  dVar243 = conc.arr[2] * 80000000.0;
  Jac.arr[0x9c] = Jac.arr[0x9c] - dVar243;
  dVar249 = conc.arr[1] * -2.787694465907913e-05;
  dVar154 = conc.arr[0xd] * -2.787694465907913e-05;
  dVar168 = conc.arr[0xd] * -1.2126178147109573e-07;
  Jac.arr[0x1d0] = auVar3._8_8_;
  dVar372 = conc.arr[8] * 15000000.0;
  Jac.arr[0x34] = Jac.arr[0x34] - dVar372;
  dVar155 = conc.arr[2] * 15000000.0;
  Jac.arr[0xb2] = Jac.arr[0xb2] - dVar155;
  Jac.arr[0xbd] = dVar155 + Jac.arr[0xbd];
  dVar311 = conc.arr[1] * -1.2126178147109573e-07;
  Jac.arr[0x126] = Jac.arr[0x126] - dVar311;
  dVar212 = conc.arr[0xd] * conc.arr[1];
  dVar250 = conc.arr[0xe] * -0.12993945039280527;
  dVar251 = conc.arr[9] * 84300000.0;
  dVar312 = conc.arr[2] * 84300000.0;
  dVar247 = conc.arr[1] * -0.12993945039280527;
  dVar339 = conc.arr[6] * conc.arr[2] * 20000000.0 +
            conc.arr[4] * conc.arr[3] * -0.44037520695372745;
  dVar352 = conc.arr[7] * conc.arr[2] * 80000000.0 + dVar212 * -2.787694465907913e-05;
  dVar156 = conc.arr[7] * conc.arr[2] * 0.0 +
            (0.0 - ((h_RT[0xd] + h_RT[1]) - (h_RT[7] + h_RT[2])) * 0.0006666666666666666) *
            -2.787694465907913e-05 * dVar212;
  dStack_1490 = dStack_1490 + dVar352;
  auVar42._8_4_ = SUB84(dStack_1488,0);
  auVar42._0_8_ = dStack_1490;
  auVar42._12_4_ = (int)((ulong)dStack_1488 >> 0x20);
  auVar43._8_4_ = SUB84(Jac.arr[0x1d5] - dVar156,0);
  auVar43._0_8_ = Jac.arr[0x1d4] - dVar392;
  auVar43._12_4_ = (int)((ulong)(Jac.arr[0x1d5] - dVar156) >> 0x20);
  Jac.arr[0x1d5] = auVar43._8_8_;
  dVar284 = conc.arr[2] * conc.arr[8] * 0.0 +
            (0.0 - ((h_RT[1] + h_RT[0xd]) - (h_RT[2] + h_RT[8])) * 0.0006666666666666666) *
            -1.2126178147109573e-07 * dVar212;
  dVar88 = conc.arr[9] * conc.arr[2] * 0.0 +
           (0.0 - ((h_RT[1] + h_RT[0xe]) - (h_RT[2] + h_RT[9])) * 0.0006666666666666666) *
           -0.12993945039280527 * conc.arr[1] * conc.arr[0xe];
  dVar359 = conc.arr[2] * conc.arr[8] * 15000000.0 + dVar212 * -1.2126178147109573e-07;
  dVar367 = conc.arr[9] * conc.arr[2] * 84300000.0 +
            conc.arr[1] * conc.arr[0xe] * -0.12993945039280527;
  dStack_1650 = auVar42._8_8_;
  dVar357 = dVar284 + (Jac.arr[0x1db] - dVar371) + dVar156;
  auVar44._8_4_ = SUB84(dVar88 + Jac.arr[0x1dc],0);
  auVar44._0_8_ = dVar357;
  auVar44._12_4_ = (int)((ulong)(dVar88 + Jac.arr[0x1dc]) >> 0x20);
  Jac.arr[0x1dc] = auVar44._8_8_;
  dVar383 = conc.arr[2] * conc.arr[10] * 3309407.0851908242 +
            conc.arr[4] * conc.arr[9] * -141857.17388911778;
  dVar267 = conc.arr[2] * conc.arr[10] * 9674.740273245088 +
            (0.002923405922631374 -
            ((h_RT[9] + h_RT[4]) - (h_RT[10] + h_RT[2])) * 0.0006666666666666666) *
            -141857.17388911778 * conc.arr[4] * conc.arr[9];
  dVar172 = conc.arr[9] * -141857.17388911778;
  Jac.arr[0x30] = auVar98._8_8_;
  Jac.arr[0x5c] = auVar2._8_8_;
  dVar157 = conc.arr[4] * -141857.17388911778;
  dVar313 = conc.arr[2] * 3309407.0851908242;
  Jac.arr[0x1d2] = auVar4._8_8_;
  dVar285 = conc.arr[10] * 3309407.0851908242;
  dVar350 = conc.arr[0xd] * 30000000.0;
  auVar45._8_4_ = SUB84(dVar350 + Jac.arr[0x37],0);
  auVar45._0_8_ = Jac.arr[0x36] - dVar285;
  auVar45._12_4_ = (int)((ulong)(dVar350 + Jac.arr[0x37]) >> 0x20);
  dVar212 = conc.arr[4] * -1.316420144391347e-05;
  dVar264 = conc.arr[2] * 30000000.0;
  dVar235 = conc.arr[1] * -9.717850050148037e-07;
  Jac.arr[0x115] = Jac.arr[0x115] - dVar235;
  Jac.arr[0x12a] = dVar264 + Jac.arr[0x12a];
  dVar340 = conc.arr[0xd] * conc.arr[2] * 0.0 +
            (0.0 - ((h_RT[4] + h_RT[0xb]) - (h_RT[0xd] + h_RT[2])) * 0.0006666666666666666) *
            -1.316420144391347e-05 * conc.arr[4] * conc.arr[0xb];
  dVar353 = conc.arr[2] * conc.arr[0xd] * 0.0 +
            (0.0 - ((h_RT[0xc] + h_RT[1]) - (h_RT[2] + h_RT[0xd])) * 0.0006666666666666666) *
            -9.717850050148037e-07 * conc.arr[1] * conc.arr[0xc];
  dVar296 = conc.arr[0xb] * -1.316420144391347e-05;
  dVar396 = conc.arr[0xd] * conc.arr[2] * 30000000.0 +
            conc.arr[4] * conc.arr[0xb] * -1.316420144391347e-05;
  dVar404 = conc.arr[2] * conc.arr[0xd] * 30000000.0 +
            conc.arr[1] * conc.arr[0xc] * -9.717850050148037e-07;
  dVar294 = conc.arr[0xc] * -9.717850050148037e-07;
  dVar70 = Jac.arr[0x1d9] + dVar371 + dVar340;
  auVar46._8_4_ = SUB84(Jac.arr[0x1da] + dVar353,0);
  auVar46._0_8_ = dVar70;
  auVar46._12_4_ = (int)((ulong)(Jac.arr[0x1da] + dVar353) >> 0x20);
  Jac.arr[0x1da] = auVar46._8_8_;
  dVar360 = conc.arr[0xd] * 30000000.0;
  dVar368 = conc.arr[0xe] * 11893241.704910735;
  dVar297 = conc.arr[0xe] * conc.arr[2] * 11893241.704910735 +
            conc.arr[4] * conc.arr[0xd] * -2811.709768791155;
  dVar341 = conc.arr[0xd] * -2811.709768791155;
  dVar71 = conc.arr[4] * -2811.709768791155;
  dVar371 = conc.arr[2] * 11893241.704910735;
  dVar394 = conc.arr[9] * -14.898178128775022;
  Jac.arr[0x120] =
       (((((Jac.arr[0x120] - dVar249) - dVar311) - dVar264) - dVar264) - dVar71) - dVar394;
  Jac.arr[0x12e] = Jac.arr[0x12e] - dVar394;
  dVar214 = conc.arr[2] * 11574309.207109384;
  Jac.arr[0x162] = Jac.arr[0x162] - dVar214;
  Jac.arr[0x16d] = Jac.arr[0x16d] + dVar214;
  dVar298 = conc.arr[0x10] * 11574309.207109384;
  dVar307 = conc.arr[0x11] * 132000000.0;
  Jac.arr[0x3c] = Jac.arr[0x3c] - dVar298;
  Jac.arr[0x39] = (((dVar372 + Jac.arr[0x39] + dVar366) - dVar350) - dVar360) + dVar368 + dVar298;
  Jac.arr[0x3a] = ((dVar251 + Jac.arr[0x3a]) - dVar368) + dVar307;
  dVar337 = conc.arr[0xd] * -14.898178128775022;
  dVar35 = conc.arr[0xe] * -0.00037751521951089154;
  dVar248 = dVar312 + Jac.arr[0xd4] + dVar35;
  auVar47._8_4_ = SUB84(dVar248,0);
  auVar47._0_8_ = Jac.arr[0xd3] + dVar337;
  auVar47._12_4_ = (int)((ulong)dVar248 >> 0x20);
  auVar48._8_4_ = SUB84(Jac.arr[0xd7] - dVar35,0);
  auVar48._0_8_ = Jac.arr[0xd6] - dVar337;
  auVar48._12_4_ = (int)((ulong)(Jac.arr[0xd7] - dVar35) >> 0x20);
  dVar248 = conc.arr[9] * -0.00037751521951089154;
  Jac.arr[0x136] = ((Jac.arr[0x136] - dVar247) - dVar371) - dVar248;
  Jac.arr[0x145] = Jac.arr[0x145] - dVar248;
  dVar369 = conc.arr[2] * 132000000.0;
  Jac.arr[0x184] = Jac.arr[0x184] + dVar369;
  dVar314 = conc.arr[0xe] * conc.arr[2] * 9416.207166531589 +
            (0.0007917275541994261 -
            ((h_RT[4] + h_RT[0xd]) - (h_RT[2] + h_RT[0xe])) * 0.0006666666666666666) *
            -2811.709768791155 * conc.arr[4] * conc.arr[0xd];
  dVar72 = conc.arr[2] * conc.arr[0x10] * 14690.152683074684 +
           (0.0012692034073231281 -
           ((h_RT[9] + h_RT[0xd]) - (h_RT[2] + h_RT[0x10])) * 0.0006666666666666666) *
           -14.898178128775022 * conc.arr[9] * conc.arr[0xd];
  dVar89 = conc.arr[2] * conc.arr[0x11] * 0.0 +
           (0.0 - ((h_RT[9] + h_RT[0xe]) - (h_RT[2] + h_RT[0x11])) * 0.0006666666666666666) *
           -0.00037751521951089154 * conc.arr[9] * conc.arr[0xe];
  dVar268 = conc.arr[2] * conc.arr[0x10] * 11574309.207109384 +
            conc.arr[9] * conc.arr[0xd] * -14.898178128775022;
  dVar287 = conc.arr[2] * conc.arr[0x11] * 132000000.0 +
            conc.arr[9] * conc.arr[0xe] * -0.00037751521951089154;
  dVar384 = conc.arr[2] * conc.arr[0x12] * 16686316.432824839 +
            conc.arr[0x11] * conc.arr[4] * -64695.71318864056;
  dVar217 = conc.arr[2] * conc.arr[0x12] * 42593.141495423035 +
            (0.00255257903485727 -
            ((h_RT[0x11] + h_RT[4]) - (h_RT[0x12] + h_RT[2])) * 0.0006666666666666666) *
            -64695.71318864056 * conc.arr[0x11] * conc.arr[4];
  dVar281 = conc.arr[0x11] * -64695.71318864056;
  dVar342 = conc.arr[4] * -64695.71318864056;
  Jac.arr[0x178] = (Jac.arr[0x178] - dVar369) - dVar342;
  dVar265 = conc.arr[2] * 16686316.432824839;
  dVar73 = conc.arr[0xb] * 0.2714339464219018;
  Jac.arr[0x37] = auVar45._8_8_;
  Jac.arr[0x4e] = dVar73 + Jac.arr[0x4e];
  dVar266 = conc.arr[3] * 0.2714339464219018;
  Jac.arr[0xf4] = (Jac.arr[0xf4] - dVar212) + dVar266;
  dVar321 = conc.arr[2] * -0.32764529688590877;
  Jac.arr[0x10b] = Jac.arr[0x10b] - dVar321;
  dVar218 = conc.arr[0xe] * 148.64629960980085;
  dVar219 = conc.arr[6] * -1595994.8383312945;
  dVar295 = conc.arr[3] * 148.64629960980085;
  dVar252 = conc.arr[0xb] * conc.arr[3] * 0.002901780483165377 +
            (0.01069055850020694 -
            ((h_RT[2] + h_RT[0xc]) - (h_RT[3] + h_RT[0xb])) * 0.0006666666666666666) *
            -0.32764529688590877 * conc.arr[2] * conc.arr[0xc];
  dVar260 = conc.arr[0xe] * conc.arr[3] * 1.3298008048685055 +
            (0.008946074058750577 -
            ((h_RT[0xd] + h_RT[6]) - (h_RT[3] + h_RT[0xe])) * 0.0006666666666666666) *
            -1595994.8383312945 * conc.arr[6] * conc.arr[0xd];
  dVar338 = conc.arr[0xc] * -0.32764529688590877;
  dVar36 = conc.arr[0x12] * 16686316.432824839;
  Jac.arr[0x3d] = (Jac.arr[0x3d] - dVar307) + dVar36;
  Jac.arr[0x3e] = Jac.arr[0x3e] - dVar36;
  dVar173 = (dVar358 + Jac.arr[0x2f]) - dVar338;
  dVar370 = Jac.arr[0x30] + dVar285 + dVar350 + dVar368 + dVar36;
  auVar49._8_4_ = SUB84(dVar370,0);
  auVar49._0_8_ = dVar173;
  auVar49._12_4_ = (int)((ulong)dVar370 >> 0x20);
  Jac.arr[0x37] = Jac.arr[0x37] - dVar338;
  Jac.arr[0x36] = Jac.arr[0x36] - dVar285;
  Jac.arr[0x38] = dVar338 + Jac.arr[0x38] + dVar360;
  dVar343 = conc.arr[0xb] * conc.arr[3] * 0.2714339464219018 +
            conc.arr[2] * conc.arr[0xc] * -0.32764529688590877;
  dVar354 = conc.arr[0xe] * conc.arr[3] * 148.64629960980085 +
            conc.arr[6] * conc.arr[0xd] * -1595994.8383312945;
  dVar127 = conc.arr[0xd] * -1595994.8383312945;
  dVar357 = ((dVar357 - dVar340) - dVar353) + dVar314 + dVar72 + dVar260;
  auVar50._8_4_ = SUB84(dVar357,0);
  auVar50._0_8_ = Jac.arr[0x1da] + dVar252;
  auVar50._12_4_ = (int)((ulong)dVar357 >> 0x20);
  Jac.arr[0x1db] = auVar50._8_8_;
  dVar299 = conc.arr[4] * -10782603.17894348;
  Jac.arr[0x30] = auVar49._8_8_;
  dVar173 = dVar173 - dVar299;
  auVar148._8_4_ = SUB84(Jac.arr[0x30] + dVar299,0);
  auVar148._0_8_ = dVar173;
  auVar148._12_4_ = (int)((ulong)(Jac.arr[0x30] + dVar299) >> 0x20);
  dVar357 = conc.arr[2] * -10782603.17894348;
  dVar300 = (dVar213 + Jac.arr[0x5b]) - dVar357;
  dVar174 = (Jac.arr[0x59] + dVar126) - dVar357;
  dVar370 = Jac.arr[0x5c] + dVar172 + dVar296 + dVar341 + dVar281 + dVar357;
  dVar357 = dVar357 + ((((((Jac.arr[0x5a] - dVar126) - dVar213) - dVar172) - dVar296) - dVar341) -
                      dVar281);
  auVar99._8_4_ = SUB84(dVar370,0);
  auVar99._0_8_ = dVar300;
  auVar99._12_4_ = (int)((ulong)dVar370 >> 0x20);
  auVar51._8_4_ = SUB84(dVar357,0);
  auVar51._0_8_ = dVar174;
  auVar51._12_4_ = (int)((ulong)dVar357 >> 0x20);
  dVar407 = conc.arr[0] * -0.4971315070618765;
  dVar412 = conc.arr[1] * 659416.0587695736;
  dVar233 = conc.arr[3] * -0.4971315070618765;
  Jac.arr[3] = Jac.arr[3] + dVar233;
  Jac.arr[6] = Jac.arr[6] - dVar233;
  dVar357 = conc.arr[6] * 19568365.243600544;
  dVar240 = conc.arr[3] * 659416.0587695736;
  Jac.arr[0x18] =
       (((((Jac.arr[0x18] - dVar411) - dVar154) - dVar168) - dVar250) - dVar294) + dVar240;
  dVar74 = (Jac.arr[0x19] - dVar240) + dVar357;
  dVar370 = dVar411 + Jac.arr[0x1a] + dVar240;
  auVar52._8_4_ = SUB84(dVar370,0);
  auVar52._0_8_ = dVar74;
  auVar52._12_4_ = (int)((ulong)dVar370 >> 0x20);
  dVar370 = conc.arr[3] * conc.arr[1] * 659416.0587695736 +
            conc.arr[2] * conc.arr[4] * -10782603.17894348;
  dVar361 = conc.arr[3] * conc.arr[1] * 2125.623798113147 +
            (0.0032234941352193023 -
            ((h_RT[2] + h_RT[4]) - (h_RT[1] + h_RT[3])) * 0.0006666666666666666) *
            -10782603.17894348 * conc.arr[2] * conc.arr[4];
  dVar380 = conc.arr[1] * conc.arr[6] * 19568365.243600544 +
            conc.arr[0] * conc.arr[3] * -0.4971315070618765;
  dVar158 = conc.arr[1] * conc.arr[6] * 4674.103192900765 +
            conc.arr[0] * conc.arr[3] *
            (0.00023886017736864045 -
            ((h_RT[3] + h_RT[0]) - (h_RT[1] + h_RT[6])) * 0.0006666666666666666) *
            -0.4971315070618765;
  Jac.arr[0x42] = Jac.arr[0x42] + dVar407;
  dVar395 = dVar412 + (Jac.arr[0x44] - dVar216) + dVar73;
  dVar405 = dVar407 + ((((dVar216 + Jac.arr[0x45]) - dVar73) - dVar218) - dVar412);
  auVar6._8_4_ = SUB84(dVar405,0);
  auVar6._0_8_ = dVar395;
  auVar6._12_4_ = (int)((ulong)dVar405 >> 0x20);
  Jac.arr[0x45] = auVar6._8_8_;
  dVar220 = conc.arr[1] * 19568365.243600544;
  Jac.arr[0x84] = Jac.arr[0x84] + dVar220;
  dVar159 = conc.arr[6] * conc.arr[1] * 108289848.15442011 +
            conc.arr[4] * conc.arr[4] * -38.98923487337139;
  dVar175 = conc.arr[6] * conc.arr[1] * 15379.207897229715 +
            (0.00014201892568266544 -
            ((h_RT[4] + h_RT[4]) - (h_RT[6] + h_RT[1])) * 0.0006666666666666666) *
            -38.98923487337139 * conc.arr[4] * conc.arr[4];
  dVar315 = conc.arr[6] * 108289848.15442011;
  Jac.arr[0x1a] = auVar52._8_8_;
  dVar405 = conc.arr[4] * -77.97846974674277;
  Jac.arr[0x1c] = (Jac.arr[0x1c] - dVar357) - dVar315;
  Jac.arr[0x5a] = auVar51._8_8_;
  Jac.arr[0x5c] = auVar99._8_8_;
  dVar253 = conc.arr[1] * 108289848.15442011;
  Jac.arr[0x85] = (Jac.arr[0x85] - dVar220) - dVar253;
  dVar25 = conc.arr[0] * -120140.80184495587;
  dVar26 = conc.arr[1] * 2429212.6664140443;
  Jac.arr[0xdc] = Jac.arr[0xdc] + dVar26;
  Jac.arr[0xde] = Jac.arr[0xde] - dVar313;
  Jac.arr[0xdd] = Jac.arr[0xdd] - dVar26;
  dVar301 = conc.arr[1] * conc.arr[10] * 8512.899029058015 +
            (0.003504386069921407 -
            ((h_RT[9] + h_RT[0]) - (h_RT[1] + h_RT[10])) * 0.0006666666666666666) *
            -120140.80184495587 * conc.arr[0] * conc.arr[9];
  dVar308 = conc.arr[0xd] * conc.arr[1] * 0.0 +
            (0.0 - ((h_RT[0xb] + h_RT[0]) - (h_RT[0xd] + h_RT[1])) * 0.0006666666666666666) *
            -3.716149717925534e-05 * conc.arr[0xb] * conc.arr[0];
  dVar373 = conc.arr[9] * -120140.80184495587;
  dVar379 = conc.arr[0xb] * -3.716149717925534e-05;
  Jac.arr[10] = Jac.arr[10] - dVar373;
  Jac.arr[0xb] = dVar379 + Jac.arr[0xb];
  dVar254 = conc.arr[10] * 2429212.6664140443;
  dVar261 = conc.arr[0xd] * 73400000.0;
  Jac.arr[0x20] = Jac.arr[0x20] - dVar254;
  dVar128 = conc.arr[0] * -3.716149717925534e-05;
  Jac.arr[0xf2] = Jac.arr[0xf2] + dVar128;
  dVar397 = conc.arr[1] * 73400000.0;
  dVar292 = conc.arr[1] * conc.arr[10] * 2429212.6664140443 +
            conc.arr[0] * conc.arr[9] * -120140.80184495587;
  dVar90 = conc.arr[0xd] * conc.arr[1] * 73400000.0 +
           conc.arr[0xb] * conc.arr[0] * -3.716149717925534e-05;
  dVar316 = (dStack_14a8 - dVar383) - dVar292;
  dVar91 = dVar90 + ((dVar396 + dStack_14a0) - dVar343);
  auVar53._8_4_ = SUB84(dVar91,0);
  auVar53._0_8_ = dVar316;
  auVar53._12_4_ = (int)((ulong)dVar91 >> 0x20);
  dStack_14a0 = auVar53._8_8_;
  dVar176 = conc.arr[1] * conc.arr[0xe] * 16575581.576889673 +
            conc.arr[0xd] * conc.arr[0] * -4521.295558798051;
  dVar75 = conc.arr[1] * conc.arr[0xe] * 23743.85449528333 +
           (0.0014324598135602037 -
           ((h_RT[0xd] + h_RT[0]) - (h_RT[1] + h_RT[0xe])) * 0.0006666666666666666) *
           -4521.295558798051 * conc.arr[0xd] * conc.arr[0];
  dVar269 = conc.arr[0xd] * -4521.295558798051;
  Jac.arr[0xd] = (Jac.arr[0xd] - dVar379) + dVar269;
  Jac.arr[0xe] = Jac.arr[0xe] - dVar269;
  dVar344 = conc.arr[0xe] * 16575581.576889673;
  Jac.arr[0x23] = (((dVar168 + Jac.arr[0x23] + dVar154) - dVar294) - dVar261) + dVar344;
  dVar385 = conc.arr[0] * -4521.295558798051;
  Jac.arr[0x11e] = Jac.arr[0x11e] + dVar397 + dVar385;
  Jac.arr[0x11f] = ((Jac.arr[0x11f] + dVar249 + dVar311 + dVar264) - dVar397) - dVar385;
  dVar91 = conc.arr[1] * 16575581.576889673;
  Jac.arr[0x134] = Jac.arr[0x134] + dVar91;
  dVar160 = conc.arr[1] * conc.arr[0xf] * 32000000.0 +
            conc.arr[4] * conc.arr[9] * -10291.734087429853;
  dVar255 = conc.arr[1] * conc.arr[0xf] * 0.0 +
            (0.0 - ((h_RT[4] + h_RT[9]) - (h_RT[1] + h_RT[0xf])) * 0.0006666666666666666) *
            -10291.734087429853 * conc.arr[4] * conc.arr[9];
  dVar270 = conc.arr[0xf] * 32000000.0;
  Jac.arr[0x25] = Jac.arr[0x25] - dVar270;
  dVar221 = conc.arr[9] * -10291.734087429853;
  dVar27 = conc.arr[4] * -10291.734087429853;
  dVar129 = conc.arr[1] * 32000000.0;
  Jac.arr[0x14b] = Jac.arr[0x14b] - dVar129;
  dVar161 = conc.arr[1] * conc.arr[0x12] * 9958163.265843963 +
            conc.arr[0] * conc.arr[0x11] * -44546.96801065157;
  dVar28 = conc.arr[1] * conc.arr[0x12] * 29384.200706874846 +
           (0.0029507651082264627 -
           ((h_RT[0] + h_RT[0x11]) - (h_RT[1] + h_RT[0x12])) * 0.0006666666666666666) *
           -44546.96801065157 * conc.arr[0] * conc.arr[0x11];
  dVar271 = conc.arr[0x11] * -44546.96801065157;
  Jac.arr[0x11] = Jac.arr[0x11] + dVar271;
  Jac.arr[0x12] = Jac.arr[0x12] - dVar271;
  dVar222 = conc.arr[0x12] * 9958163.265843963;
  Jac.arr[0x28] = Jac.arr[0x28] - dVar222;
  dVar76 = conc.arr[0] * -44546.96801065157;
  Jac.arr[0x176] = Jac.arr[0x176] + dVar76;
  dVar130 = conc.arr[1] * 9958163.265843963;
  Jac.arr[0x18c] = Jac.arr[0x18c] + dVar130;
  Jac.arr[0x18e] = Jac.arr[0x18e] - dVar265;
  Jac.arr[0x18d] = Jac.arr[0x18d] - dVar130;
  dVar272 = conc.arr[0] * conc.arr[4] * 4271828.084344627 +
            conc.arr[1] * conc.arr[5] * -121922.904977942;
  dVar386 = conc.arr[0] * conc.arr[4] * 7577.3366907946565 +
            (0.0017737925172045287 -
            ((h_RT[1] + h_RT[5]) - (h_RT[0] + h_RT[4])) * 0.0006666666666666666) * -121922.904977942
            * conc.arr[1] * conc.arr[5];
  dVar273 = conc.arr[4] * 34296205.4093863;
  auVar100._8_4_ = SUB84(conc.arr[4],0);
  auVar100._0_8_ = conc.arr[4];
  auVar100._12_4_ = (int)((ulong)conc.arr[4] >> 0x20);
  dVar237 = conc.arr[4] * 4271828.084344627;
  Jac.arr[4] = (dVar246 + Jac.arr[4]) - dVar237;
  Jac.arr[5] = dVar237 + Jac.arr[5];
  dVar408 = conc.arr[5] * -121922.904977942;
  Jac.arr[0x1b] = dVar408 + Jac.arr[0x1b];
  dVar302 = conc.arr[0] * 4271828.084344627;
  Jac.arr[0x58] = (Jac.arr[0x58] - dVar126) - dVar302;
  dVar77 = conc.arr[1] * -121922.904977942;
  Jac.arr[0x6e] = Jac.arr[0x6e] - dVar77;
  Jac.arr[0x6f] = Jac.arr[0x6f] + dVar77;
  dVar223 = conc.arr[5] * -100069.45216403608;
  Jac.arr[0x30] = auVar148._8_8_;
  Jac.arr[0x31] = dVar223 + Jac.arr[0x31];
  dVar224 = conc.arr[5] * -0.024867627282709664;
  dVar126 = (dVar412 + dVar216 + Jac.arr[0x46]) - dVar224;
  auVar149._8_4_ = SUB84(dVar126,0);
  auVar149._0_8_ = dVar224 + Jac.arr[0x45];
  auVar149._12_4_ = (int)((ulong)dVar126 >> 0x20);
  Jac.arr[0x46] = auVar149._8_8_;
  dVar162 = conc.arr[2] * -100069.45216403608;
  dVar232 = conc.arr[3] * -0.024867627282709664;
  auVar169._8_4_ = SUB84(Jac.arr[0x71] + dVar232,0);
  auVar169._0_8_ = Jac.arr[0x70] + dVar162;
  auVar169._12_4_ = (int)((ulong)(Jac.arr[0x71] + dVar232) >> 0x20);
  Jac.arr[0x74] = Jac.arr[0x74] - dVar232;
  dVar126 = ((((Jac.arr[0x8a] - dVar362) + dVar127) - dVar220) - dVar253) - dVar273;
  dVar274 = dVar273 + ((dVar362 + Jac.arr[0x87]) - dVar127) + dVar220;
  dVar362 = (dVar253 + dVar253 + dVar362 + Jac.arr[0x88]) - dVar273;
  auVar54._8_4_ = SUB84(dVar126,0);
  auVar54._0_8_ = Jac.arr[0x89] + dVar273;
  auVar54._12_4_ = (int)((ulong)dVar126 >> 0x20);
  auVar150._8_4_ = SUB84(dVar362,0);
  auVar150._0_8_ = dVar274;
  auVar150._12_4_ = (int)((ulong)dVar362 >> 0x20);
  dVar275 = conc.arr[6] * 34296205.4093863;
  dVar288 = conc.arr[7] * 20000000.0;
  dVar387 = conc.arr[8] * 30000000.0;
  dVar393 = conc.arr[4] * 6077655.854054699;
  dVar282 = ((Jac.arr[0x5e] - dVar213) - dVar405) - dVar275;
  dVar362 = conc.arr[0xe] * conc.arr[1];
  dVar213 = conc.arr[4] * conc.arr[6] * 34296205.4093863 +
            conc.arr[3] * conc.arr[5] * -0.024867627282709664;
  dVar37 = conc.arr[4] * conc.arr[7] * 20000000.0 + dVar362 * -0.029479148639814108;
  auVar55._8_4_ = SUB84(Jac.arr[0x5f] - dVar288,0);
  auVar55._0_8_ = dVar282;
  auVar55._12_4_ = (int)((ulong)(Jac.arr[0x5f] - dVar288) >> 0x20);
  dVar398 = conc.arr[4] * 20000000.0;
  dStack_15c0 = auVar100._8_8_;
  dVar177 = conc.arr[4] * conc.arr[8] * 30000000.0 + dVar362 * -0.001025849604117461;
  dVar179 = dStack_15c0 * conc.arr[4] * 3038827.9270273494 +
            conc.arr[5] * conc.arr[2] * -100069.45216403608;
  dVar78 = ((((local_14c8 - dVar339) + dVar354) - dVar380) - dVar159) - dVar213;
  dVar126 = ((double)auStack_14c0._0_8_ - dVar352) - dVar37;
  auVar56._8_4_ = SUB84(dVar126,0);
  auVar56._0_8_ = dVar78;
  auVar56._12_4_ = (int)((ulong)dVar126 >> 0x20);
  dVar126 = conc.arr[0xe] * -0.029479148639814108;
  dVar244 = conc.arr[0xe] * -0.001025849604117461;
  Jac.arr[0x24] = dVar244 + ((dVar250 + Jac.arr[0x24]) - dVar344) + dVar126;
  dVar163 = ((dVar174 - dVar405) - dVar221) + dVar302 + dVar288 + dVar387;
  auVar151._8_4_ = SUB84(Jac.arr[0x5a] + dVar393,0);
  auVar151._0_8_ = dVar163;
  auVar151._12_4_ = (int)((ulong)(Jac.arr[0x5a] + dVar393) >> 0x20);
  dVar164 = conc.arr[4] * 30000000.0;
  dVar345 = conc.arr[1] * -0.029479148639814108;
  dVar355 = conc.arr[1] * -0.001025849604117461;
  Jac.arr[0x135] = ((Jac.arr[0x135] + dVar247) - dVar91) + dVar345 + dVar355;
  auVar7._8_4_ = SUB84(Jac.arr[0x13c] - dVar355,0);
  auVar7._0_8_ = Jac.arr[0x13b] - dVar345;
  auVar7._12_4_ = (int)((ulong)(Jac.arr[0x13c] - dVar355) >> 0x20);
  Jac.arr[0x13c] = auVar7._8_8_;
  dVar225 = conc.arr[4] * conc.arr[6] * -3835.2049190811504 +
            (-0.00011182592573438223 -
            ((h_RT[5] + h_RT[3]) - (h_RT[4] + h_RT[6])) * 0.0006666666666666666) *
            -0.024867627282709664 * conc.arr[3] * conc.arr[5];
  dVar242 = conc.arr[4] * conc.arr[7] * 0.0 +
            (0.0 - ((h_RT[0xe] + h_RT[1]) - (h_RT[4] + h_RT[7])) * 0.0006666666666666666) *
            -0.029479148639814108 * dVar362;
  dVar303 = conc.arr[4] * conc.arr[8] * 0.0 +
            (0.0 - ((h_RT[0xe] + h_RT[1]) - (h_RT[8] + h_RT[4])) * 0.0006666666666666666) *
            -0.001025849604117461 * dVar362;
  dVar309 = dStack_15c0 * conc.arr[4] * 3428.0853547552383 +
            (0.0011280945934009068 -
            ((h_RT[5] + h_RT[2]) - (h_RT[4] + h_RT[4])) * 0.0006666666666666666) *
            -100069.45216403608 * conc.arr[5] * conc.arr[2];
  dStack_15c0 = auVar56._8_8_;
  dVar79 = ((((Jac.arr[0x1d4] - dVar392) + dVar260) - dVar158) - dVar175) - dVar225;
  auVar57._8_4_ = SUB84(Jac.arr[0x1d5] - dVar242,0);
  auVar57._0_8_ = dVar79;
  auVar57._12_4_ = (int)((ulong)(Jac.arr[0x1d5] - dVar242) >> 0x20);
  Jac.arr[0x1d5] = auVar57._8_8_;
  dVar362 = conc.arr[5] * -37781.99143773652;
  Jac.arr[0x9f] = Jac.arr[0x9f] + dVar362;
  dVar305 = conc.arr[9] * 1097137.153737377;
  dVar351 = conc.arr[9] * 25010000.0;
  Jac.arr[0x5f] = auVar55._8_8_;
  dVar80 = conc.arr[7] * -37781.99143773652;
  dVar92 = conc.arr[8] * -37124457.44676649;
  dVar322 = conc.arr[5] * -37124457.44676649;
  dVar81 = conc.arr[4] * 1097137.153737377;
  dVar93 = conc.arr[4] * 25010000.0;
  dVar413 = conc.arr[9] * conc.arr[4] * 1097137.153737377 +
            conc.arr[5] * conc.arr[7] * -37781.99143773652;
  dVar141 = conc.arr[4] * conc.arr[9] * 25010000.0 + conc.arr[5] * conc.arr[8] * -37124457.44676649;
  dVar131 = dVar413 + dStack_15c0;
  dVar174 = dVar141 + (((double)auStack_14c0._8_8_ - dVar359) - dVar177);
  auVar101._8_4_ = SUB84(dVar174,0);
  auVar101._0_8_ = dVar131;
  auVar101._12_4_ = (int)((ulong)dVar174 >> 0x20);
  dVar174 = conc.arr[9] * conc.arr[4] * 2500.221646810261 +
            (0.00227885970162737 -
            ((h_RT[5] + h_RT[7]) - (h_RT[9] + h_RT[4])) * 0.0006666666666666666) *
            -37781.99143773652 * conc.arr[5] * conc.arr[7];
  dVar38 = conc.arr[4] * conc.arr[9] * 0.0 +
           (0.0 - ((h_RT[5] + h_RT[8]) - (h_RT[4] + h_RT[9])) * 0.0006666666666666666) *
           -37124457.44676649 * conc.arr[5] * conc.arr[8];
  dVar220 = dVar38 + ((Jac.arr[0x1d6] - dVar284) - dVar303);
  auVar8._8_4_ = SUB84(dVar220,0);
  auVar8._0_8_ = dVar174 + Jac.arr[0x1d5];
  auVar8._12_4_ = (int)((ulong)dVar220 >> 0x20);
  Jac.arr[0x1d6] = auVar8._8_8_;
  dVar323 = conc.arr[4] * conc.arr[10] * 4238127.66170656 +
            conc.arr[5] * conc.arr[9] * -5982.3326554224905;
  dVar226 = conc.arr[4] * conc.arr[10] * 7478.008612521503 +
            (0.0017644604432492119 -
            ((h_RT[9] + h_RT[5]) - (h_RT[10] + h_RT[4])) * 0.0006666666666666666) *
            -5982.3326554224905 * conc.arr[5] * conc.arr[9];
  dVar220 = conc.arr[10] * 4238127.66170656;
  Jac.arr[0x62] = (Jac.arr[0x62] - dVar172) - dVar220;
  dVar363 = conc.arr[9] * -5982.3326554224905;
  Jac.arr[0x77] = ((Jac.arr[0x77] - dVar80) - dVar92) + dVar363;
  Jac.arr[0x78] = Jac.arr[0x78] - dVar363;
  dVar165 = conc.arr[5] * -5982.3326554224905;
  Jac.arr[0xcb] = Jac.arr[0xcb] + dVar81 + dVar93 + dVar165;
  dVar132 = conc.arr[4] * 4238127.66170656;
  Jac.arr[0xe0] = (Jac.arr[0xe0] + dVar313) - dVar132;
  Jac.arr[0xe1] = Jac.arr[0xe1] + dVar132;
  dVar378 = conc.arr[1] * -27278.71839873273;
  Jac.arr[0x10a] = (Jac.arr[0x10a] - dVar235) + dVar321;
  Jac.arr[0x109] = Jac.arr[0x109] + dVar235 + dVar378;
  dVar276 = conc.arr[0xb] * -7.225013822780462e-07;
  dVar277 = conc.arr[4] * 369528.79729527823;
  dVar289 = conc.arr[5] * -7.225013822780462e-07;
  dVar253 = conc.arr[4] * 50000000.0;
  dVar324 = conc.arr[0xc] * -27278.71839873273;
  Jac.arr[0x22] = dVar324 + Jac.arr[0x22] + dVar294;
  dVar29 = conc.arr[0xd] * 50000000.0;
  dVar258 = conc.arr[0xb] * 369528.79729527823;
  Jac.arr[0x5a] = auVar151._8_8_;
  dVar166 = ((Jac.arr[99] + dVar296) - dVar258) + dVar29;
  auVar152._8_4_ = SUB84(Jac.arr[100] + dVar258,0);
  auVar152._0_8_ = dVar166;
  auVar152._12_4_ = (int)((ulong)(Jac.arr[100] + dVar258) >> 0x20);
  dVar399 = conc.arr[0xe] * 22295026.02480445;
  dVar234 = conc.arr[0xd] * -173.56959160214726;
  Jac.arr[0x7b] = (Jac.arr[0x7b] - dVar276) + dVar234;
  Jac.arr[0x7c] = Jac.arr[0x7c] - dVar234;
  dVar30 = conc.arr[5] * -173.56959160214726;
  Jac.arr[0x123] = Jac.arr[0x123] + dVar253 + dVar30;
  dVar227 = conc.arr[4] * 22295026.02480445;
  Jac.arr[0x139] = Jac.arr[0x139] + dVar227;
  dVar317 = conc.arr[4] * conc.arr[0xd] * 50000000.0 +
            conc.arr[5] * conc.arr[0xb] * -7.225013822780462e-07;
  dVar326 = conc.arr[4] * conc.arr[0xb] * 369528.79729527823 +
            conc.arr[1] * conc.arr[0xc] * -27278.71839873273;
  dVar133 = conc.arr[4] * conc.arr[0xe] * 22295026.02480445 +
            conc.arr[5] * conc.arr[0xd] * -173.56959160214726;
  dVar82 = conc.arr[4] * conc.arr[0xd] * 0.0 +
           (0.0 - ((h_RT[5] + h_RT[0xb]) - (h_RT[0xd] + h_RT[4])) * 0.0006666666666666666) *
           -7.225013822780462e-07 * conc.arr[5] * conc.arr[0xb];
  dVar94 = conc.arr[4] * conc.arr[0xb] * 308.3061146970958 +
           (0.0008343222962694802 -
           ((h_RT[1] + h_RT[0xc]) - (h_RT[0xb] + h_RT[4])) * 0.0006666666666666666) *
           -27278.71839873273 * conc.arr[1] * conc.arr[0xc];
  dVar388 = conc.arr[4] * conc.arr[0xe] * 15309.867045680163 +
            (0.0006866942890601289 -
            ((h_RT[5] + h_RT[0xd]) - (h_RT[4] + h_RT[0xe])) * 0.0006666666666666666) *
            -173.56959160214726 * conc.arr[5] * conc.arr[0xd];
  dVar238 = conc.arr[0x12] * 14307411.985466668;
  Jac.arr[0x5d] =
       dVar393 + dVar302 + Jac.arr[0x5d] + dVar275 + dVar305 + dVar351 + dVar220 + dVar29 + dVar399
       + dVar238;
  Jac.arr[0x69] = Jac.arr[0x69] + dVar281 + dVar238;
  Jac.arr[0x6a] = (Jac.arr[0x6a] - dVar281) - dVar238;
  dVar281 = conc.arr[0x11] * -1826.7180743084757;
  Jac.arr[0x72] =
       ((((((((Jac.arr[0x72] - dVar77) - (dVar162 + dVar162)) - dVar232) - dVar80) - dVar92) -
         dVar363) - dVar276) - dVar234) - dVar281;
  Jac.arr[0x7f] = Jac.arr[0x7f] + dVar281;
  Jac.arr[0x80] = Jac.arr[0x80] - dVar281;
  dVar167 = conc.arr[5] * -1826.7180743084757;
  Jac.arr[0x17a] = (Jac.arr[0x17a] + dVar342) - dVar167;
  Jac.arr[0x17b] = Jac.arr[0x17b] + dVar167;
  dVar31 = conc.arr[4] * -1.061382456225949e-08;
  Jac.arr[0x8a] = auVar54._8_8_;
  dVar134 = (Jac.arr[0x13a] + dVar295) - dVar31;
  dVar142 = (Jac.arr[0x13b] - dVar345) - dVar31;
  auVar102._8_4_ = SUB84(dVar142,0);
  auVar102._0_8_ = dVar134;
  auVar102._12_4_ = (int)((ulong)dVar142 >> 0x20);
  Jac.arr[0x13b] = auVar102._8_8_;
  dVar142 = conc.arr[10] * -0.5136789314491079;
  Jac.arr[0x4c] = dVar142 + Jac.arr[0x4c];
  dVar135 = conc.arr[0xe] * -1.061382456225949e-08;
  dVar143 = conc.arr[0xf] * -22389.705712050265;
  Jac.arr[0x88] = auVar150._8_8_;
  dVar239 = ((dVar387 + (Jac.arr[0x66] - dVar341) + dVar288) - dVar399) + dVar135;
  dVar39 = (Jac.arr[0x67] - dVar221) + dVar143;
  auVar9._8_4_ = SUB84(dVar39,0);
  auVar9._0_8_ = dVar239;
  auVar9._12_4_ = (int)((ulong)dVar39 >> 0x20);
  dVar39 = conc.arr[6] * 1000000.0;
  dVar40 = conc.arr[6] * 20000000.0;
  dVar144 = ((((Jac.arr[0xca] + dVar157 + dVar27) - dVar81) - dVar93) - dVar165) + dVar40;
  auVar103._8_4_ = SUB84(dVar144,0);
  auVar103._0_8_ = Jac.arr[0xc9] + dVar39;
  auVar103._12_4_ = (int)((ulong)dVar144 >> 0x20);
  Jac.arr[0xcc] = (Jac.arr[0xcc] - dVar39) - dVar40;
  dVar144 = conc.arr[4] * -22389.705712050265;
  Jac.arr[0x14e] = Jac.arr[0x14e] + dVar129 + dVar144;
  dVar136 = conc.arr[0x12] * conc.arr[4] * 23005.037159633022 +
            (0.0016079104441111584 -
            ((h_RT[0x11] + h_RT[5]) - (h_RT[0x12] + h_RT[4])) * 0.0006666666666666666) *
            -1826.7180743084757 * conc.arr[5] * conc.arr[0x11];
  dVar83 = conc.arr[4] * 14307411.985466668;
  Jac.arr[400] = (Jac.arr[400] + dVar265) - dVar83;
  Jac.arr[0x191] = Jac.arr[0x191] + dVar83;
  dVar84 = conc.arr[9] * 20000000.0;
  dVar256 = conc.arr[6] * 20000000.0;
  Jac.arr[0xa0] = Jac.arr[0xa0] - dVar256;
  Jac.arr[0xa8] = dVar256 + dVar398 + Jac.arr[0xa8];
  dVar137 = conc.arr[9] * 1000000.0;
  dVar145 = conc.arr[7] * 20000000.0;
  Jac.arr[0x8b] = Jac.arr[0x8b] - dVar145;
  dVar274 = dVar274 + dVar137;
  auVar170._8_4_ = SUB84(Jac.arr[0x88] + dVar145,0);
  auVar170._0_8_ = dVar274;
  auVar170._12_4_ = (int)((ulong)(Jac.arr[0x88] + dVar145) >> 0x20);
  Jac.arr[0x8e] = Jac.arr[0x8e] + dVar137;
  dVar32 = conc.arr[3] * -0.5136789314491079;
  Jac.arr[0xdf] = Jac.arr[0xdf] + dVar32;
  Jac.arr[0xe2] = Jac.arr[0xe2] - dVar32;
  dVar33 = conc.arr[6] * conc.arr[7] * 20000000.0 +
           conc.arr[0xe] * conc.arr[4] * -1.061382456225949e-08;
  dVar41 = conc.arr[0x12] * conc.arr[4] * 14307411.985466668 +
           conc.arr[5] * conc.arr[0x11] * -1826.7180743084757;
  dVar278 = conc.arr[6] * conc.arr[9] * 20000000.0 +
            conc.arr[0xf] * conc.arr[4] * -22389.705712050265;
  dVar290 = conc.arr[9] * conc.arr[6] * 1000000.0 + conc.arr[10] * conc.arr[3] * -0.5136789314491079
  ;
  auStack_14c0._8_8_ = auVar101._8_8_;
  dVar228 = ((((((local_14b0 - dVar367) + dVar383 + dVar268 + dVar287 + dVar292 + dVar160) - dVar413
               ) - dVar141) + dVar323) - dVar290) - dVar278;
  dVar316 = (dVar316 - dVar323) + dVar290;
  auVar10._8_4_ = SUB84(dVar316,0);
  auVar10._0_8_ = dVar228;
  auVar10._12_4_ = (int)((ulong)dVar316 >> 0x20);
  dStack_14a8 = auVar10._8_8_;
  Jac.arr[0x88] = auVar170._8_8_;
  Jac.arr[0x8d] = (Jac.arr[0x8d] - dVar137) - dVar84;
  dVar138 = dVar145 + (Jac.arr[0x92] - dVar127);
  auVar104._8_4_ = SUB84(dVar84 + Jac.arr[0x93],0);
  auVar104._0_8_ = dVar138;
  auVar104._12_4_ = (int)((ulong)(dVar84 + Jac.arr[0x93]) >> 0x20);
  dVar85 = conc.arr[0xb] * 54659.06262097068;
  Jac.arr[0x90] = dVar85 + Jac.arr[0x90];
  dVar316 = conc.arr[6] * 54659.06262097068;
  dVar236 = conc.arr[4] * -0.001452763170659347;
  Jac.arr[0x10c] = (Jac.arr[0x10c] - dVar378) + dVar236;
  Jac.arr[0x10e] = Jac.arr[0x10e] - dVar236;
  dVar229 = conc.arr[7] * 7980492.798776164;
  Jac.arr[0x49] = Jac.arr[0x49] - dVar229;
  dVar346 = conc.arr[0xc] * -0.001452763170659347;
  dVar356 = conc.arr[0xd] * -4.547251755334367e-05;
  Jac.arr[100] = auVar152._8_8_;
  dVar304 = conc.arr[3] * conc.arr[7] * 2677.2779851191463 +
            (0.00033547777720314666 -
            ((h_RT[0xd] + h_RT[4]) - (h_RT[7] + h_RT[3])) * 0.0006666666666666666) *
            -4.547251755334367e-05 * conc.arr[0xd] * conc.arr[4];
  Jac.arr[0x5e] = ((dVar282 - dVar135) - dVar143) - dVar346;
  dVar282 = ((Jac.arr[0x5f] + dVar305) - dVar135) - dVar356;
  auVar11._8_4_ = SUB84(dVar282,0);
  auVar11._0_8_ = Jac.arr[0x5e];
  auVar11._12_4_ = (int)((ulong)dVar282 >> 0x20);
  Jac.arr[0x5f] = (double)auVar11._8_8_;
  dVar410 = conc.arr[3] * 7980492.798776164;
  dVar178 = conc.arr[4] * -4.547251755334367e-05;
  dVar318 = conc.arr[9] * conc.arr[6] * 0.0 +
            (0.0 - ((h_RT[3] + h_RT[10]) - (h_RT[6] + h_RT[9])) * 0.0006666666666666666) *
            -0.5136789314491079 * conc.arr[10] * conc.arr[3];
  dVar327 = conc.arr[6] * conc.arr[7] * 0.0 +
            (0.0 - ((h_RT[4] + h_RT[0xe]) - (h_RT[6] + h_RT[7])) * 0.0006666666666666666) *
            -1.061382456225949e-08 * conc.arr[0xe] * conc.arr[4];
  dVar283 = conc.arr[0xc] * conc.arr[4];
  auVar58._8_4_ = SUB84(conc.arr[7] * conc.arr[0x14],0);
  auVar58._0_8_ = dVar283;
  auVar58._12_4_ = (int)((ulong)(conc.arr[7] * conc.arr[0x14]) >> 0x20);
  auVar12._8_4_ = SUB84(h_RT[0x14],0);
  auVar12._0_8_ = h_RT[6];
  auVar12._12_4_ = (int)((ulong)h_RT[0x14] >> 0x20);
  Jac.arr[0x65] = (((Jac.arr[0x65] - dVar296) + dVar341) - dVar29) + dVar399 + dVar356;
  Jac.arr[0x9d] = Jac.arr[0x9d] - dVar410;
  Jac.arr[0x9e] = ((Jac.arr[0x9e] - dVar398) - dVar362) + dVar256 + dVar410;
  Jac.arr[0xa7] = dVar410 + dVar243 + Jac.arr[0xa7];
  Jac.arr[0x122] = (((Jac.arr[0x122] + dVar264 + dVar71) - dVar253) - dVar30) + dVar178;
  Jac.arr[0x125] = (Jac.arr[0x125] - dVar249) - dVar178;
  dVar230 = conc.arr[7] * conc.arr[0] * 99487.69671959426 +
            conc.arr[1] * conc.arr[9] * -82454.99861437384;
  dVar364 = conc.arr[7] * conc.arr[0] * 293.5221550217246 +
            (0.0029503362194525 -
            ((h_RT[1] + h_RT[9]) - (h_RT[7] + h_RT[0])) * 0.0006666666666666666) *
            -82454.99861437384 * conc.arr[1] * conc.arr[9];
  dVar282 = conc.arr[0xd] * conc.arr[4] * -4.547251755334367e-05;
  auVar59._8_4_ = SUB84(dVar282,0);
  auVar59._0_8_ = dVar283 * -0.001452763170659347;
  auVar59._12_4_ = (int)((ulong)dVar282 >> 0x20);
  dVar86 = conc.arr[9] * conc.arr[9];
  dVar282 = conc.arr[7] * conc.arr[0x13];
  auVar60._8_4_ = SUB84(dVar282,0);
  auVar60._0_8_ = dVar86;
  auVar60._12_4_ = (int)((ulong)dVar282 >> 0x20);
  dVar279 = conc.arr[6] * conc.arr[9] * 0.0 +
            conc.arr[0xf] * conc.arr[4] *
            (0.0 - ((h_RT[0xf] + h_RT[4]) - (h_RT[9] + h_RT[6])) * 0.0006666666666666666) *
            -22389.705712050265;
  dVar291 = conc.arr[0x13] * conc.arr[8] * 1645.8767818301812 +
            dVar282 * (0.00013419111088125866 -
                      ((h_RT[7] + h_RT[0x13]) - (h_RT[8] + h_RT[0x13])) * 0.0006666666666666666) *
                      -284545.07285187626;
  dStack_340 = auVar12._8_8_;
  dVar409 = conc.arr[0] * 99487.69671959426;
  dVar282 = conc.arr[7] * 99487.69671959426;
  Jac.arr[7] = Jac.arr[7] - dVar282;
  dVar400 = conc.arr[9] * -82454.99861437384;
  dVar296 = 0.005278183694662841 -
            ((h_RT[4] + h_RT[0xc]) - (h_RT[0xb] + h_RT[6])) * 0.0006666666666666666;
  dVar341 = 0.00013419111088125866 -
            ((h_RT[7] + h_RT[0x14]) - (h_RT[8] + dStack_340)) * 0.0006666666666666666;
  auVar13._8_4_ = SUB84(dVar341,0);
  auVar13._0_8_ = dVar296;
  auVar13._12_4_ = (int)((ulong)dVar341 >> 0x20);
  Jac.arr[0x9a] = Jac.arr[0x9a] - dVar409;
  dVar139 = conc.arr[1] * -82454.99861437384;
  dVar341 = conc.arr[7] * conc.arr[9] * 40000000.0 +
            conc.arr[1] * conc.arr[0x10] * -10.82871927173647;
  dVar374 = conc.arr[7] * conc.arr[9] * 0.0 +
            (0.0 - ((h_RT[1] + h_RT[0x10]) - (h_RT[9] + h_RT[7])) * 0.0006666666666666666) *
            -10.82871927173647 * conc.arr[1] * conc.arr[0x10];
  dVar347 = conc.arr[0x10] * -10.82871927173647;
  Jac.arr[0x1d] = (((Jac.arr[0x1d] - dVar154) - dVar126) - dVar400) - dVar347;
  dVar280 = conc.arr[9] * 40000000.0;
  Jac.arr[0x9b] = Jac.arr[0x9b] + dVar243 + dVar398 + dVar409 + dVar280;
  Jac.arr[0xaa] = dVar280 + Jac.arr[0xaa];
  dVar319 = conc.arr[1] * -10.82871927173647;
  Jac.arr[0x167] = Jac.arr[0x167] - dVar319;
  dVar231 = conc.arr[10] * 345311.0578145205;
  Jac.arr[0xa3] = dVar231 + dVar231 + ((dVar409 + (Jac.arr[0xa3] - dVar362)) - dVar280);
  Jac.arr[0xa4] = Jac.arr[0xa4] - dVar231;
  dVar348 = conc.arr[6] * conc.arr[0xb] * 54659.06262097068 + dVar283 * -0.001452763170659347;
  dStack_2d0 = auVar59._8_8_;
  dStack_2d0 = conc.arr[3] * conc.arr[7] * 7980492.798776164 + dStack_2d0;
  dVar87 = conc.arr[9] * -28308.253956378114;
  dVar401 = conc.arr[7] * 40000000.0;
  dVar375 = conc.arr[7] * 345311.0578145205;
  dVar389 = conc.arr[8] * 12265169.958139507 + conc.arr[7] * -284545.07285187626;
  dStack_e0 = auVar13._8_8_;
  dStack_15c0 = auVar58._8_8_;
  dVar34 = conc.arr[1] * conc.arr[4] * conc.arr[0xb];
  dVar257 = conc.arr[8] * conc.arr[0x14] * 7359101.974883704 + dStack_15c0 * -170727.04371112576;
  dVar262 = conc.arr[3] * conc.arr[8] * 28000000.0 + dVar34 * -7.439703734094493e-10;
  dVar320 = conc.arr[8] * 7359101.974883704 + conc.arr[7] * -170727.04371112576;
  dVar140 = conc.arr[6] * conc.arr[0xb] * 288.5005730915626 +
            dVar296 * -0.001452763170659347 * dVar283;
  dVar146 = conc.arr[8] * conc.arr[0x14] * 987.5260690981088 +
            dStack_e0 * -170727.04371112576 * dStack_15c0;
  Jac.arr[0xd7] = auVar48._8_8_;
  dStack_12a0 = auVar60._8_8_;
  dVar349 = conc.arr[10] * conc.arr[7] * 1099.1023565570054 +
            (0.003182934144980015 -
            ((h_RT[9] + h_RT[9]) - (h_RT[7] + h_RT[10])) * 0.0006666666666666666) *
            -14154.126978189057 * dVar86;
  dVar296 = conc.arr[10] * conc.arr[7] * 345311.0578145205 + dVar86 * -14154.126978189057;
  dVar283 = conc.arr[0x13] * conc.arr[8] * 12265169.958139507 + dStack_12a0 * -284545.07285187626;
  Jac.arr[0xcd] = (((Jac.arr[0xcd] + dVar81) - dVar139) - dVar401) - dVar87;
  Jac.arr[0xe3] = Jac.arr[0xe3] - dVar375;
  Jac.arr[0x1a9] = Jac.arr[0x1a9] + dVar389;
  Jac.arr[0x1aa] = Jac.arr[0x1aa] - dVar389;
  Jac.arr[0x1bf] = Jac.arr[0x1bf] + dVar320;
  Jac.arr[0x1c0] = Jac.arr[0x1c0] - dVar320;
  dVar320 = conc.arr[3] * conc.arr[8] * 0.0 +
            (0.0 - (((h_RT[1] + h_RT[4] + h_RT[0xb]) - (h_RT[8] + h_RT[3])) + -1.0) *
                   0.0006666666666666666) * -7.439703734094493e-10 * dVar34;
  dVar402 = conc.arr[4] * -7.439703734094493e-10 * conc.arr[0xb];
  Jac.arr[0x1a] =
       (((((dVar315 + dVar315 + Jac.arr[0x1a] + dVar270) - dVar408) - dVar126) - dVar244) - dVar324)
       + dVar402;
  Jac.arr[0x19] = dVar74 - dVar402;
  Jac.arr[0x21] = dVar402 + ((dVar261 + Jac.arr[0x21]) - dVar324);
  dVar389 = conc.arr[8] * 28000000.0;
  Jac.arr[0x43] = ((Jac.arr[0x43] - dVar412) - dVar407) + dVar389;
  dVar376 = conc.arr[1] * -7.439703734094493e-10 * conc.arr[0xb];
  Jac.arr[0x59] = dVar163 + dVar258 + dVar376;
  Jac.arr[0x60] = ((Jac.arr[0x60] - dVar387) + dVar351) - dVar376;
  Jac.arr[100] = Jac.arr[100] + dVar346;
  Jac.arr[99] = dVar376 + (dVar166 - dVar346);
  dVar390 = conc.arr[3] * 28000000.0;
  Jac.arr[0xb4] = ((Jac.arr[0xb4] - dVar164) - dVar322) + dVar390;
  dVar412 = conc.arr[1] * -7.439703734094493e-10 * conc.arr[4];
  Jac.arr[0xf3] = (Jac.arr[0xf3] - dVar128) + dVar277 + dVar412;
  Jac.arr[0xf6] = (((Jac.arr[0xf6] + dVar212) - dVar277) - dVar289) + dVar316 + dVar412;
  dVar403 = conc.arr[8] * conc.arr[3] * 12000000.0 +
            conc.arr[5] * conc.arr[0xb] * -2.2921694105207742e-20;
  dVar34 = conc.arr[8] * conc.arr[3] * 0.0 +
           (0.0 - ((h_RT[5] + h_RT[0xb]) - (h_RT[3] + h_RT[8])) * 0.0006666666666666666) *
           -2.2921694105207742e-20 * conc.arr[5] * conc.arr[0xb];
  local_14d0 = dVar133 + dVar179 + dVar272 + local_14d0 + dVar213 + dVar413 + dVar141 + dVar323 +
                         dVar317 + dVar41 + dVar403;
  dVar74 = conc.arr[8] * 12000000.0;
  Jac.arr[0x47] = Jac.arr[0x47] + dVar224 + dVar74;
  Jac.arr[0x4a] = (Jac.arr[0x4a] - dVar389) - dVar74;
  dVar391 = conc.arr[0xb] * -2.2921694105207742e-20;
  Jac.arr[0x71] = auVar169._8_8_;
  Jac.arr[0x71] = Jac.arr[0x71] - dVar391;
  Jac.arr[0x70] = Jac.arr[0x70] + dVar162;
  Jac.arr[0x73] =
       dVar77 + Jac.arr[0x73] + dVar162 + dVar232 + dVar80 + dVar92 + dVar363 + dVar276 + dVar234 +
       dVar281 + dVar391;
  Jac.arr[0x79] = dVar391 + Jac.arr[0x79] + dVar276;
  dVar377 = conc.arr[3] * 12000000.0;
  Jac.arr[0xb3] = (Jac.arr[0xb3] - dVar390) - dVar377;
  Jac.arr[0xb5] = Jac.arr[0xb5] + dVar322 + dVar377;
  dVar365 = conc.arr[5] * -2.2921694105207742e-20;
  Jac.arr[0xf7] = Jac.arr[0xf7] + dVar289 + dVar365;
  Jac.arr[0x1d3] =
       dVar309 + dVar386 + Jac.arr[0x1d3] + dVar225 + dVar174 + dVar38 + dVar226 + dVar82 + dVar388
       + dVar136 + dVar34;
  dVar86 = conc.arr[0] * conc.arr[8] * 70000000.0 + conc.arr[1] * conc.arr[9] * -1345932.1015318723;
  local_14f8 = ((((local_14f8 - dVar381) + dVar380 + dVar292 + dVar90 + dVar176 + dVar161) - dVar272
                ) - dVar230) - dVar86;
  dVar281 = conc.arr[8] * 70000000.0;
  Jac.arr[0] = ((((Jac.arr[0] - dVar246) + dVar233 + dVar373 + dVar379 + dVar269 + dVar271) -
                dVar237) - dVar282) - dVar281;
  Jac.arr[1] = ((((((Jac.arr[1] + dVar246) - dVar233) - dVar373) - dVar379) - dVar269) - dVar271) +
               dVar237 + dVar282 + dVar281;
  Jac.arr[8] = Jac.arr[8] - dVar281;
  Jac.arr[9] = dVar281 + dVar282 + Jac.arr[9] + dVar373;
  dVar163 = conc.arr[9] * -1345932.1015318723;
  Jac.arr[0x16] =
       ((((Jac.arr[0x16] - dVar411) + dVar357 + dVar254 + dVar261 + dVar344 + dVar222) - dVar408) -
       dVar400) - dVar163;
  dVar269 = conc.arr[0] * 70000000.0;
  Jac.arr[0xb0] = Jac.arr[0xb0] - dVar269;
  dVar246 = conc.arr[0] * conc.arr[8] * 0.0 +
            (0.0 - ((h_RT[1] + h_RT[9]) - (h_RT[8] + h_RT[0])) * 0.0006666666666666666) *
            -1345932.1015318723 * conc.arr[1] * conc.arr[9];
  dVar232 = conc.arr[1] * -1345932.1015318723;
  Jac.arr[0xc6] = ((Jac.arr[0xc6] + dVar25) - dVar139) - dVar232;
  Jac.arr[0x1ce] =
       ((((Jac.arr[0x1ce] - dVar382) + dVar158 + dVar301 + dVar308 + dVar75 + dVar28) - dVar386) -
       dVar364) - dVar246;
  dVar166 = conc.arr[5] * conc.arr[8] * 30000000.0 + conc.arr[5] * conc.arr[7] * -695983.1958864406;
  dVar237 = conc.arr[5] * conc.arr[8] * 0.0 +
            (0.0 - ((h_RT[5] + h_RT[7]) - (h_RT[5] + h_RT[8])) * 0.0006666666666666666) *
            -695983.1958864406 * conc.arr[5] * conc.arr[7];
  dVar281 = conc.arr[8] * 30000000.0 + conc.arr[7] * -695983.1958864406;
  Jac.arr[0x75] = Jac.arr[0x75] + dVar80 + dVar281;
  Jac.arr[0x76] = ((Jac.arr[0x76] + dVar92) - dVar391) - dVar281;
  dVar373 = conc.arr[8] * conc.arr[9] * 14528743.285075013 +
            conc.arr[1] * conc.arr[0x10] * -0.09124785266815053;
  dVar77 = conc.arr[8] * conc.arr[9] * -1852.146791076201 +
           (-0.00012748155533719572 -
           ((h_RT[1] + h_RT[0x10]) - (h_RT[8] + h_RT[9])) * 0.0006666666666666666) *
           -0.09124785266815053 * conc.arr[1] * conc.arr[0x10];
  dVar233 = conc.arr[0x10] * -0.09124785266815053;
  Jac.arr[0x1e] = ((((Jac.arr[0x1e] - dVar168) - dVar244) - dVar402) - dVar163) - dVar233;
  Jac.arr[0x26] = dVar233 + dVar347 + Jac.arr[0x26];
  dVar234 = conc.arr[9] * 14528743.285075013;
  Jac.arr[0xb1] = Jac.arr[0xb1] + dVar155 + dVar164 + dVar390 + dVar269 + dVar234;
  Jac.arr[0xc0] = dVar234 + Jac.arr[0xc0];
  dVar271 = conc.arr[8] * 14528743.285075013;
  dVar162 = conc.arr[1] * -0.09124785266815053;
  Jac.arr[0x161] = Jac.arr[0x161] + dVar319 + dVar162;
  Jac.arr[0x168] = Jac.arr[0x168] - dVar162;
  Jac.arr[0x169] = ((Jac.arr[0x169] + dVar214) - dVar319) - dVar162;
  dVar276 = conc.arr[8] * conc.arr[10] * 19371657.71343335 +
            conc.arr[9] * conc.arr[9] * -18421.156298117476;
  dVar281 = conc.arr[8] * conc.arr[10] * -2469.529054768268 +
            (-0.00012748155533719572 -
            ((h_RT[9] + h_RT[9]) - (h_RT[10] + h_RT[8])) * 0.0006666666666666666) *
            -18421.156298117476 * conc.arr[9] * conc.arr[9];
  dVar92 = conc.arr[9] * -36842.31259623495;
  Jac.arr[0xce] = (((Jac.arr[0xce] + dVar93) - dVar232) - dVar271) - dVar92;
  dVar80 = conc.arr[8] * 19371657.71343335;
  Jac.arr[0xe4] = Jac.arr[0xe4] - dVar80;
  dVar282 = conc.arr[8] * 9000000.0 + conc.arr[7] * -208794.958765932;
  Jac.arr[0xf9] = Jac.arr[0xf9] + dVar282;
  dVar363 = conc.arr[8] * 7000000.0 + conc.arr[7] * -162396.0790401699;
  Jac.arr[0x10f] = Jac.arr[0x10f] + dVar363;
  dVar379 = conc.arr[0xe] * -0.006485071999156734;
  Jac.arr[0xfa] = (((Jac.arr[0xfa] - dVar412) - dVar365) - dVar282) - dVar379;
  Jac.arr[0xfe] = (dVar316 + dVar277 + dVar266 + Jac.arr[0xfe]) - dVar379;
  Jac.arr[0x100] = dVar379 + Jac.arr[0x100];
  dVar282 = conc.arr[8] * 14000000.0;
  Jac.arr[0x110] = (Jac.arr[0x110] - dVar363) - dVar282;
  Jac.arr[0x113] = (((Jac.arr[0x113] - dVar321) - dVar378) - dVar236) + dVar282;
  Jac.arr[0x114] = (dVar236 + dVar378 + dVar321 + Jac.arr[0x114] + dVar235) - dVar282;
  Jac.arr[0x116] = dVar282 + Jac.arr[0x116];
  dVar321 = conc.arr[0xb] * -0.006485071999156734;
  Jac.arr[0x13c] = Jac.arr[0x13c] - dVar321;
  Jac.arr[0x13f] = Jac.arr[0x13f] + dVar321;
  Jac.arr[0x140] = Jac.arr[0x140] - dVar321;
  dVar282 = conc.arr[8] * conc.arr[0xb] * 9000000.0 +
            conc.arr[0xb] * conc.arr[7] * -208794.958765932;
  dVar378 = conc.arr[8] * conc.arr[0xb] * 0.0 +
            (0.0 - ((h_RT[0xb] + h_RT[7]) - (h_RT[8] + h_RT[0xb])) * 0.0006666666666666666) *
            -208794.958765932 * conc.arr[0xb] * conc.arr[7];
  Jac.arr[0xa1] =
       ((((((((Jac.arr[0xa1] - dVar243) - dVar398) + dVar362) - dVar256) - dVar410) - dVar409) -
        dVar280) - dVar231) + conc.arr[0x13] * -284545.07285187626 +
       conc.arr[0x14] * -170727.04371112576 + conc.arr[5] * -695983.1958864406 +
       conc.arr[0xb] * -208794.958765932 + conc.arr[0xc] * -162396.0790401699;
  Jac.arr[0xa2] =
       ((((Jac.arr[0xa2] - conc.arr[0x13] * -284545.07285187626) -
         conc.arr[0x14] * -170727.04371112576) - conc.arr[5] * -695983.1958864406) -
       conc.arr[0xb] * -208794.958765932) - conc.arr[0xc] * -162396.0790401699;
  dVar235 = conc.arr[8] * conc.arr[0xc];
  Jac.arr[0xb7] =
       conc.arr[5] * 30000000.0 +
       conc.arr[0x13] * 12265169.958139507 + Jac.arr[0xb7] + conc.arr[0x14] * 7359101.974883704 +
       conc.arr[0xb] * 9000000.0 + conc.arr[0xc] * 7000000.0;
  dVar236 = dVar235 * 0.0 +
            (0.0 - ((h_RT[0xe] + h_RT[0xb]) - (h_RT[0xc] + h_RT[8])) * 0.0006666666666666666) *
            -0.006485071999156734 * conc.arr[0xe] * conc.arr[0xb];
  dVar243 = dVar235 * 0.0 +
            (0.0 - ((h_RT[7] + h_RT[0xc]) - (h_RT[0xc] + h_RT[8])) * 0.0006666666666666666) *
            -162396.0790401699 * conc.arr[7] * conc.arr[0xc];
  dVar362 = dVar235 * 14000000.0 + conc.arr[0xe] * conc.arr[0xb] * -0.006485071999156734;
  dVar235 = dVar235 * 7000000.0 + conc.arr[7] * conc.arr[0xc] * -162396.0790401699;
  dVar410 = (((((((((((double)auStack_14c0._8_8_ - dVar283) - dVar257) - dVar262) - dVar403) -
                 dVar86) - dVar166) - dVar373) - dVar276) - dVar282) - dVar235) - dVar362;
  auStack_14c0._8_4_ = SUB84(dVar410,0);
  auStack_14c0._0_8_ =
       dVar166 + (((((dVar131 - dVar33) - dStack_2d0) - dVar230) - dVar341) - dVar296) + dVar283 +
                 dVar257 + dVar282 + dVar235;
  auStack_14c0._12_4_ = (int)((ulong)dVar410 >> 0x20);
  dStack_1498 = (dVar404 + dStack_1498 + dVar343 + dVar326 + dVar348) - dVar362;
  dVar282 = conc.arr[10] * 19371657.71343335;
  dVar283 = conc.arr[0xc] * 14000000.0;
  Jac.arr[0xb9] = dVar282 + dVar282 + ((dVar269 + (Jac.arr[0xb9] - dVar322)) - dVar234);
  Jac.arr[0xb8] =
       (((((((((((((Jac.arr[0xb8] - dVar155) - dVar164) + dVar322) -
                conc.arr[0x13] * 12265169.958139507) - conc.arr[0x14] * 7359101.974883704) - dVar390
              ) - dVar377) - dVar269) - conc.arr[5] * 30000000.0) - dVar234) - dVar282) -
        conc.arr[0xb] * 9000000.0) - conc.arr[0xc] * 7000000.0) - dVar283;
  dVar235 = dVar283 + dVar377 + dVar390 + Jac.arr[0xbb];
  auVar171._8_4_ = SUB84(dVar235,0);
  auVar171._0_8_ = Jac.arr[0xba] - dVar282;
  auVar171._12_4_ = (int)((ulong)dVar235 >> 0x20);
  Jac.arr[0xba] = Jac.arr[0xba] - dVar282;
  Jac.arr[0xbb] = (double)auVar171._8_8_;
  Jac.arr[0xbc] = Jac.arr[0xbc] - dVar283;
  Jac.arr[0xbe] = dVar283 + dVar164 + Jac.arr[0xbe];
  Jac.arr[0x1d5] =
       dVar237 + ((((((dVar174 + Jac.arr[0x1d5]) - dVar327) - dVar304) - dVar364) - dVar374) -
                 dVar349) + dVar291 + dVar146 + dVar378 + dVar243;
  dVar237 = ((((((((((Jac.arr[0x1d6] - dVar291) - dVar146) - dVar320) - dVar34) - dVar246) - dVar237
                ) - dVar77) - dVar281) - dVar378) - dVar243) - dVar236;
  auVar14._8_4_ = SUB84(dVar237,0);
  auVar14._0_8_ = Jac.arr[0x1d5];
  auVar14._12_4_ = (int)((ulong)dVar237 >> 0x20);
  Jac.arr[0x1d6] = auVar14._8_8_;
  Jac.arr[0x1da] = (dVar140 + Jac.arr[0x1da] + dVar252 + dVar94) - dVar236;
  auVar61._8_4_ = SUB84(conc.arr[0xf],0);
  auVar61._0_8_ = conc.arr[0x11];
  auVar61._12_4_ = (int)((ulong)conc.arr[0xf] >> 0x20);
  dVar237 = conc.arr[0xf] * -86596485.19199125;
  Jac.arr[0x2e] =
       dVar299 + ((((((((((((Jac.arr[0x2e] - dVar215) - dVar358) - dVar366) - dVar372) - dVar251) -
                       dVar285) - dVar350) - dVar360) - dVar368) - dVar298) - dVar307) - dVar36) +
                 dVar338 + dVar223 + dVar237;
  Jac.arr[0x2d] = (Jac.arr[0x2d] + dVar215 + dVar366 + dVar372 + dVar251 + dVar360) - dVar299;
  Jac.arr[0x30] = Jac.arr[0x30] - (dVar223 + dVar223);
  Jac.arr[0x2f] = dVar173 - dVar237;
  Jac.arr[0x35] = ((Jac.arr[0x35] - dVar251) + dVar285 + dVar298 + dVar307) - dVar237;
  Jac.arr[0x3b] = dVar237 + Jac.arr[0x3b];
  dVar243 = conc.arr[3] * conc.arr[9] * 1793.8203338395704 +
            conc.arr[4] * conc.arr[0xe] * -4.52122891906719e-05;
  dVar36 = conc.arr[3] * conc.arr[9] * 3.5866496754579007 +
           (0.001999447552130754 -
           ((h_RT[0xe] + h_RT[4]) - (h_RT[9] + h_RT[3])) * 0.0006666666666666666) *
           -4.52122891906719e-05 * conc.arr[4] * conc.arr[0xe];
  dStack_14d8 = (((((((((((((dVar159 + dVar159 +
                             dVar370 + dVar339 + dVar381 + dStack_14d8 + dVar383 + dVar396 + dVar297
                                       + dVar384 + dVar160) - dVar272) - (dVar179 + dVar179)) -
                         dVar213) - dVar37) - dVar177) - dVar413) - dVar141) - dVar323) - dVar326) -
                  dVar317) - dVar133) - dVar41) + dVar33 + dVar278 + dVar348 + dStack_2d0 + dVar262
                + dVar243;
  dVar338 = conc.arr[9] * 1793.8203338395704;
  dVar237 = conc.arr[9] * 1703.2356556327686;
  Jac.arr[0x44] = dVar395 + dVar237;
  Jac.arr[0x46] = Jac.arr[0x46] + dVar229 + dVar389 + dVar338;
  Jac.arr[0x4b] = ((Jac.arr[0x4b] - dVar142) - dVar237) - dVar338;
  dVar282 = (Jac.arr[0x50] - dVar218) + dVar338;
  auVar62._8_4_ = SUB84(Jac.arr[0x51] + dVar237,0);
  auVar62._0_8_ = dVar282;
  auVar62._12_4_ = (int)((ulong)(Jac.arr[0x51] + dVar237) >> 0x20);
  Jac.arr[0x51] = auVar62._8_8_;
  dVar395 = conc.arr[0xe] * -4.52122891906719e-05;
  Jac.arr[0x5c] =
       dVar356 + (((((((((((((dVar405 + dVar405 + Jac.arr[0x5c] + dVar221) - dVar302) -
                           (dVar393 + dVar393)) - dVar275) - dVar288) - dVar387) - dVar305) -
                      dVar351) - dVar220) - dVar258) - dVar29) - dVar399) - dVar238) + dVar135 +
                 dVar143 + dVar346 + dVar376 + dVar395;
  Jac.arr[0x5b] = (((dVar300 + dVar275) - dVar356) - dVar376) - dVar395;
  Jac.arr[0x61] =
       (((((Jac.arr[0x61] + dVar172 + dVar221) - dVar305) - dVar351) + dVar220) - dVar143) - dVar395
  ;
  Jac.arr[0x67] = auVar9._8_8_;
  Jac.arr[0x66] = dVar395 + dVar239;
  dVar350 = conc.arr[3] * 1793.8203338395704;
  Jac.arr[0xca] = auVar103._8_8_;
  dVar322 = conc.arr[4] * -4.52122891906719e-05;
  Jac.arr[0x138] = ((((Jac.arr[0x138] + dVar371) - dVar345) - dVar355) - dVar227) + dVar31 + dVar322
  ;
  dVar395 = conc.arr[0x11] * -159545083.58041438;
  Jac.arr[0x17] =
       (((((((((local_1668 + dVar411 + dVar154 + dVar168 + dVar250 + dVar294) - dVar240) - dVar357)
            - dVar315) - dVar254) - dVar261) - dVar344) - dVar270) - dVar222) + dVar408 + dVar126 +
       dVar244 + dVar324 + dVar400 + dVar347 + dVar402 + dVar163 + dVar233 + dVar395;
  Jac.arr[0x1f] =
       ((dVar163 + ((dVar400 + (Jac.arr[0x1f] - dVar250) + dVar254 + dVar270) - dVar347)) - dVar233)
       - (dVar395 + dVar395);
  Jac.arr[0x27] = dVar395 + Jac.arr[0x27] + dVar222;
  dVar238 = conc.arr[9] * 592052.8885504483;
  dVar244 = conc.arr[3] * 1703.2356556327686;
  Jac.arr[0xd4] = auVar47._8_8_;
  Jac.arr[0xd5] = dVar244 + (Jac.arr[0xd5] - dVar27) + dVar40;
  Jac.arr[0xca] = Jac.arr[0xca] + dVar350;
  Jac.arr[0xc9] = ((Jac.arr[0xc9] + dVar39) - dVar244) - dVar350;
  Jac.arr[199] = (((Jac.arr[199] + dVar312) - dVar25) - dVar27) + dVar139 + dVar401 + dVar232 +
                 dVar271 + dVar238;
  Jac.arr[200] = ((((Jac.arr[200] - dVar312) - dVar157) - dVar337) - dVar35) + dVar244;
  dVar239 = conc.arr[2] * -86596485.19199125;
  dStack_1620 = auVar61._8_8_;
  dVar323 = conc.arr[1] * -159545083.58041438;
  Jac.arr[0x14c] = Jac.arr[0x14c] + dVar239;
  Jac.arr[0x153] = ((Jac.arr[0x153] + dVar129) - dVar144) - dVar239;
  dVar294 = conc.arr[9] * conc.arr[9] * 721.5278371512255 +
            (0.00243737629223557 -
            ((h_RT[1] + h_RT[0x11]) - (h_RT[9] + h_RT[9])) * 0.0006666666666666666) *
            -159545083.58041438 * conc.arr[0x11] * conc.arr[1];
  dVar126 = conc.arr[3] * conc.arr[9] * 10.970836066652648 +
            (0.006441173322300416 -
            ((h_RT[0xf] + h_RT[2]) - (h_RT[9] + h_RT[3])) * 0.0006666666666666666) *
            -86596485.19199125 * dStack_1620 * conc.arr[2];
  dVar411 = conc.arr[9] * conc.arr[9] * 296026.4442752242 +
            conc.arr[0x11] * conc.arr[1] * -159545083.58041438;
  dVar413 = conc.arr[3] * conc.arr[9] * 1703.2356556327686 +
            dStack_1620 * conc.arr[2] * -86596485.19199125;
  local_14f0._8_8_ =
       (((((((((((((double)local_14f0._8_8_ - dVar381) - dVar339) - dVar352) - dVar359) - dVar367) -
             dVar383) - dVar396) - dVar404) - dVar297) - dVar268) - dVar287) - dVar384) + dVar343 +
       dVar370 + dVar179 + dVar413;
  local_14f0._0_8_ =
       ((((((((((double)local_14f0._0_8_ + dVar381 + dVar352 + dVar359 + dVar367 + dVar404) -
              dVar370) - dVar380) - dVar159) - dVar292) - dVar90) - dVar176) - dVar160) - dVar161) +
       dVar272 + dVar37 + dVar177 + dVar326 + dVar230 + dVar341 + dVar262 + dVar86 + dVar373 +
       dVar411;
  Jac.arr[0x177] = (Jac.arr[0x177] - dVar76) + dVar323;
  Jac.arr[0x1cf] =
       (((((((((dVar406 + dVar156 + dVar284 + dVar88 + dVar353) - dVar361) - dVar158) - dVar175) -
           dVar301) - dVar308) - dVar75) - dVar255) - dVar28) + dVar386 + dVar242 + dVar303 + dVar94
       + dVar364 + dVar374 + dVar320 + dVar246 + dVar77 + dVar294;
  dVar357 = ((((((((((Jac.arr[0x1d0] - dVar156) - dVar284) - dVar88) - dVar267) - dVar340) - dVar353
                ) - dVar314) - dVar72) - dVar89) - dVar217) + dVar252 + dVar361 + dVar309 + dVar126;
  auVar63._8_4_ = SUB84(dVar357,0);
  auVar63._0_8_ = Jac.arr[0x1cf];
  auVar63._12_4_ = (int)((ulong)dVar357 >> 0x20);
  Jac.arr[0x1d0] = (double)auVar63._8_8_;
  dVar351 = conc.arr[9] * conc.arr[0xd] * 26480000.0 +
            conc.arr[10] * conc.arr[0xb] * -0.0002710754168835943;
  dVar283 = conc.arr[9] * conc.arr[0xd] * 0.0 +
            (0.0 - ((h_RT[0xb] + h_RT[10]) - (h_RT[9] + h_RT[0xd])) * 0.0006666666666666666) *
            -0.0002710754168835943 * conc.arr[10] * conc.arr[0xb];
  dVar324 = conc.arr[0xd] * 26480000.0;
  Jac.arr[0xd1] = Jac.arr[0xd1] + dVar324;
  dVar220 = conc.arr[0xb] * -0.0002710754168835943;
  Jac.arr[0xe7] = Jac.arr[0xe7] + dVar220;
  dVar240 = conc.arr[10] * -0.0002710754168835943;
  Jac.arr[0xfb] = Jac.arr[0xfb] - dVar240;
  dVar357 = dVar240 + dVar365 + dVar412 + ((dVar289 +
                                           ((((Jac.arr[0xfd] + dVar212) - dVar266) + dVar128) -
                                           dVar277)) - dVar316) + dVar379;
  auVar64._8_4_ = SUB84(dVar357,0);
  auVar64._0_8_ = dVar240 + Jac.arr[0xfc];
  auVar64._12_4_ = (int)((ulong)dVar357 >> 0x20);
  dVar235 = conc.arr[0xe] * 390998.5057150522;
  Jac.arr[0xd4] = (dVar350 + Jac.arr[0xd4]) - dVar235;
  Jac.arr[0xd3] = ((Jac.arr[0xd3] + dVar337) - dVar324) + dVar235;
  dVar284 = conc.arr[0xd] * -2156.4740241498666;
  Jac.arr[0xe9] = (Jac.arr[0xe9] - dVar220) + dVar284;
  Jac.arr[0xea] = Jac.arr[0xea] - dVar284;
  dVar285 = conc.arr[9] * 26480000.0;
  dVar292 = conc.arr[10] * -2156.4740241498666;
  dVar305 = conc.arr[0xe] * conc.arr[9] * 390998.5057150522 +
            conc.arr[10] * conc.arr[0xd] * -2156.4740241498666;
  dVar29 = conc.arr[0xe] * conc.arr[9] * 1244.9131168262245 +
           (0.003183933182940293 -
           ((h_RT[10] + h_RT[0xd]) - (h_RT[9] + h_RT[0xe])) * 0.0006666666666666666) *
           -2156.4740241498666 * conc.arr[10] * conc.arr[0xd];
  Jac.arr[0x127] = ((Jac.arr[0x127] + dVar394) - dVar285) - dVar292;
  Jac.arr[0x128] = dVar292 + Jac.arr[0x128] + dVar285;
  Jac.arr[300] = ((((Jac.arr[300] - dVar71) - dVar219) - dVar385) - dVar30) - dVar292;
  dVar258 = conc.arr[9] * 390998.5057150522;
  Jac.arr[0x13d] = (((Jac.arr[0x13d] - dVar247) + dVar248) - dVar322) - dVar258;
  Jac.arr[0x13e] = Jac.arr[0x13e] + dVar258;
  Jac.arr[0x141] = Jac.arr[0x141] + dVar371 + dVar295 + dVar91 + dVar227 + dVar258;
  dVar357 = conc.arr[10] * -5603.460820379699;
  Jac.arr[0x17f] = ((Jac.arr[0x17f] + dVar369) - (dVar323 + dVar323)) - dVar357;
  Jac.arr[0x180] = Jac.arr[0x180] + dVar357;
  Jac.arr[0x188] = (((Jac.arr[0x188] - dVar342) - dVar76) - dVar167) - dVar357;
  dVar395 = conc.arr[3] * 1923289.8439964922;
  dVar405 = conc.arr[9] * 61950.158398051455;
  Jac.arr[0x195] = Jac.arr[0x195] - dVar405;
  Jac.arr[0x196] = Jac.arr[0x196] + dVar405;
  Jac.arr[0x19d] = Jac.arr[0x19d] + dVar265 + dVar130 + dVar83 + dVar405;
  Jac.arr[0x19e] = (((Jac.arr[0x19e] - dVar265) - dVar130) - dVar83) - dVar405;
  dVar265 = conc.arr[6] * -132.4388903689313;
  Jac.arr[0xf5] = (((Jac.arr[0xf5] - dVar266) - dVar412) - dVar365) - dVar265;
  Jac.arr[0xf8] = (Jac.arr[0xf8] - dVar316) + dVar265;
  Jac.arr[0xfd] = auVar64._8_8_;
  Jac.arr[0xfd] = Jac.arr[0xfd] + dVar265;
  Jac.arr[0xfc] = dVar240 + Jac.arr[0xfc];
  Jac.arr[0xff] = ((((Jac.arr[0xff] - dVar212) - dVar128) - dVar289) - dVar240) - dVar265;
  dVar212 = conc.arr[3] * 6645614.320408218;
  Jac.arr[0x121] = ((Jac.arr[0x121] - dVar219) - dVar178) - dVar212;
  Jac.arr[0x124] = Jac.arr[0x124] + dVar219 + dVar212;
  Jac.arr[0x129] = dVar285 + Jac.arr[0x129] + dVar264 + dVar397 + dVar253 + dVar212;
  Jac.arr[299] = (((dVar178 +
                   (((((((dVar311 + dVar249 + Jac.arr[299]) - dVar264) - dVar264) + dVar71 + dVar394
                      + dVar219) - dVar397) + dVar385) - dVar253) + dVar30) - dVar285) + dVar292) -
                 dVar212;
  dVar265 = conc.arr[3] * conc.arr[0xd] * 594.5215787626531 +
            (8.946074058750579e-05 -
            ((h_RT[0xb] + h_RT[6]) - (h_RT[0xd] + h_RT[3])) * 0.0006666666666666666) *
            -132.4388903689313 * conc.arr[6] * conc.arr[0xb];
  dVar266 = conc.arr[0xf] * conc.arr[3] * 8226.248452056829 +
            (0.0042771756309819275 -
            ((h_RT[0xe] + h_RT[6]) - (h_RT[0xf] + h_RT[3])) * 0.0006666666666666666) *
            -43.301595906050935 * conc.arr[0xe] * conc.arr[6];
  dVar212 = conc.arr[0xd] * 6645614.320408218;
  dVar394 = conc.arr[0xf] * 1923289.8439964922;
  Jac.arr[0x4d] = dVar74 + dVar389 + (Jac.arr[0x4d] - dVar73) + dVar212;
  Jac.arr[0x4f] = (dVar229 + Jac.arr[0x4f] + dVar218) - dVar212;
  dVar282 = dVar394 + dVar282;
  auVar15._8_4_ = SUB84(dVar282,0);
  auVar15._0_8_ = Jac.arr[0x4f];
  auVar15._12_4_ = (int)((ulong)dVar282 >> 0x20);
  Jac.arr[0x50] = auVar15._8_8_;
  Jac.arr[0x51] = Jac.arr[0x51] - dVar394;
  dVar405 = conc.arr[0xb] * -132.4388903689313;
  dVar253 = conc.arr[0xe] * -43.301595906050935;
  Jac.arr[0x8f] = (Jac.arr[0x8f] - dVar85) + dVar405;
  Jac.arr[0x91] = (Jac.arr[0x91] + dVar127) - dVar405;
  Jac.arr[0x93] = auVar104._8_8_;
  Jac.arr[0x93] = Jac.arr[0x93] - dVar253;
  Jac.arr[0x92] = dVar253 + dVar138;
  dVar264 = conc.arr[6] * -43.301595906050935;
  Jac.arr[0x137] = ((Jac.arr[0x137] - dVar295) - dVar322) - dVar264;
  Jac.arr[0x13a] = dVar134 + dVar264;
  Jac.arr[0x142] =
       ((dVar322 +
        dVar321 + dVar31 + ((dVar355 +
                            (((((dVar247 + Jac.arr[0x142]) - dVar371) + dVar248) - dVar295) - dVar91
                            ) + dVar345) - dVar227)) - dVar258) + dVar264;
  Jac.arr[0x143] = Jac.arr[0x143] - dVar264;
  Jac.arr[0x14d] = (Jac.arr[0x14d] - dVar239) - dVar395;
  Jac.arr[0x150] = (Jac.arr[0x150] - dVar144) + dVar395;
  Jac.arr[0x158] = Jac.arr[0x158] + dVar395;
  Jac.arr[0x159] = (dVar239 + dVar144 + (Jac.arr[0x159] - dVar129)) - dVar395;
  Jac.arr[0x1d9] =
       dVar34 + dVar320 + ((((dVar308 + (dVar70 - dVar252)) - dVar94) + dVar82) - dVar140) + dVar236
       + dVar283 + dVar265;
  dVar264 = conc.arr[3] * conc.arr[0xd] * 6645614.320408218 +
            conc.arr[6] * conc.arr[0xb] * -132.4388903689313;
  dVar248 = conc.arr[0xf] * conc.arr[3] * 1923289.8439964922 +
            conc.arr[0xe] * conc.arr[6] * -43.301595906050935;
  dStack_14a0 = dVar403 + (((dStack_14a0 - dVar326) + dVar317) - dVar348) + dVar262 + dVar362 +
                dVar351 + dVar264;
  dStack_1490 = (((((((dVar268 + (((dVar359 + dStack_1490) - dVar396) - dVar404) + dVar297 + dVar354
                      ) - dVar90) + dVar176) - dVar317) + dVar133 + dStack_2d0) - dVar351) + dVar305
                ) - dVar264;
  dStack_1488 = dVar248 + ((dVar243 +
                           dVar362 + ((dVar177 +
                                      (((dVar287 + ((dVar367 + dStack_1650) - dVar297)) - dVar354) -
                                      dVar176) + dVar37) - dVar133) + dVar33) - dVar305);
  local_1480 = (dVar413 + dVar278 + (local_1480 - dVar160)) - dVar248;
  Jac.arr[0x1db] =
       (((dVar304 + (((Jac.arr[0x1db] - dVar308) + dVar75) - dVar82) + dVar388) - dVar283) + dVar29)
       - dVar265;
  dVar371 = dVar266 + ((dVar36 + dVar327 + ((dVar242 + ((((Jac.arr[0x1dc] - dVar314) + dVar89) -
                                                        dVar260) - dVar75) + dVar303) - dVar388) +
                                 dVar236) - dVar29);
  auVar105._8_4_ = SUB84(dVar371,0);
  auVar105._0_8_ = Jac.arr[0x1db];
  auVar105._12_4_ = (int)((ulong)dVar371 >> 0x20);
  Jac.arr[0x1dc] = auVar105._8_8_;
  Jac.arr[0x1dd] = (dVar126 + dVar279 + (Jac.arr[0x1dd] - dVar255)) - dVar266;
  dVar371 = conc.arr[6] * -5461.432196104055;
  Jac.arr[0x163] = Jac.arr[0x163] - dVar371;
  Jac.arr[0x166] = Jac.arr[0x166] + dVar371;
  Jac.arr[0x170] = dVar162 + dVar319 + (Jac.arr[0x170] - dVar214) + dVar371;
  Jac.arr[0x171] = Jac.arr[0x171] - dVar371;
  dVar214 = conc.arr[3] * 228932.11193603993;
  Jac.arr[0x179] = Jac.arr[0x179] - dVar214;
  dVar371 = conc.arr[0x12] * 61950.158398051455;
  Jac.arr[0xcf] =
       ((((((dVar92 + dVar92 +
            ((dVar232 +
             dVar87 + dVar87 +
             ((dVar139 +
              ((((((dVar35 + (Jac.arr[0xcf] - dVar312) + dVar157 + dVar337 + dVar25 + dVar27) -
                  dVar81) - dVar93) + dVar165) - dVar39) - dVar40)) - dVar401)) - dVar271)) -
           dVar244) - dVar350) - (dVar238 + dVar238)) - dVar324) - dVar235) - dVar371;
  Jac.arr[0xd0] =
       ((((((Jac.arr[0xd0] - dVar157) - dVar25) - dVar165) + dVar39) - dVar87) - dVar92) + dVar324 +
       dVar235 + dVar371;
  Jac.arr[0xd7] = Jac.arr[0xd7] + dVar238 + dVar371;
  Jac.arr[0xd6] = dVar271 + (Jac.arr[0xd6] - dVar337) + dVar401;
  Jac.arr[0xd8] = Jac.arr[0xd8] - dVar371;
  dVar371 = conc.arr[0x11] * -5603.460820379699;
  Jac.arr[0xe5] =
       (((dVar80 + dVar80 +
         dVar375 + dVar375 + ((Jac.arr[0xe5] + dVar313 + dVar26 + dVar132) - dVar32)) - dVar220) -
       dVar284) - dVar371;
  Jac.arr[0xe6] =
       (((dVar32 + (((Jac.arr[0xe6] - dVar313) - dVar26) - dVar132)) - dVar375) - dVar80) + dVar220
       + dVar284 + dVar371;
  Jac.arr[0xed] = Jac.arr[0xed] + dVar371;
  Jac.arr[0xee] = Jac.arr[0xee] - dVar371;
  dVar247 = conc.arr[3] * conc.arr[0x11] * 198.4042264437053 +
            (0.0008666509244414622 -
            ((h_RT[6] + h_RT[0x10]) - (h_RT[0x11] + h_RT[3])) * 0.0006666666666666666) *
            -5461.432196104055 * conc.arr[6] * conc.arr[0x10];
  dVar371 = conc.arr[9] * conc.arr[0x12] * 216.6497304178424 +
            (0.0034971618478485886 -
            ((h_RT[10] + h_RT[0x11]) - (h_RT[0x12] + h_RT[9])) * 0.0006666666666666666) *
            -5603.460820379699 * conc.arr[10] * conc.arr[0x11];
  Jac.arr[0x1d7] =
       ((((((dVar281 + dVar281 +
            ((dVar246 +
             dVar349 + dVar349 +
             ((dVar364 +
              (((((((Jac.arr[0x1d7] - dVar88) + dVar267 + dVar72 + dVar89 + dVar301 + dVar255) -
                  dVar174) - dVar38) + dVar226) - dVar318) - dVar279)) - dVar374)) - dVar77)) -
           dVar126) - dVar36) - (dVar294 + dVar294)) - dVar283) - dVar29) - dVar371;
  Jac.arr[0x1d8] =
       ((((((Jac.arr[0x1d8] - dVar267) - dVar301) - dVar226) + dVar318) - dVar349) - dVar281) +
       dVar283 + dVar29 + dVar371;
  dVar246 = conc.arr[3] * conc.arr[0x11] * 228932.11193603993 +
            conc.arr[6] * conc.arr[0x10] * -5461.432196104055;
  dVar337 = conc.arr[9] * conc.arr[0x12] * 61950.158398051455 +
            conc.arr[10] * conc.arr[0x11] * -5603.460820379699;
  local_14b0 = ((((((dVar276 + dVar276 +
                    ((dVar86 + dVar296 + dVar296 + ((dVar228 + dVar230) - dVar341)) - dVar373)) -
                   dVar413) - dVar243) - (dVar411 + dVar411)) - dVar351) - dVar305) - dVar337;
  dStack_14a8 = ((dStack_14a8 - dVar296) - dVar276) + dVar351 + dVar305 + dVar337;
  local_14e0 = ((((((((((((dVar339 + local_14e0) - dVar343) - dVar354) - dVar370) + dVar380 +
                       dVar213 + dVar290) - dStack_2d0) - dVar262) - dVar403) - dVar413) - dVar243)
                - dVar264) - dVar248) - dVar246;
  local_14c8 = ((((dVar78 - dVar33) - dVar290) - dVar278) - dVar348) + dVar264 + dVar248 + dVar246;
  dStack_1478 = dVar373 + dVar341 + (dStack_1478 - dVar268) + dVar246;
  local_1470 = (dVar337 + dVar411 + dVar41 + (local_1470 - dVar287) + dVar384 + dVar161) - dVar246;
  dStack_1468 = (((dStack_1468 - dVar384) - dVar161) - dVar41) - dVar337;
  dVar246 = conc.arr[0x11] * 228932.11193603993;
  Jac.arr[0x45] =
       ((((((((dVar224 + Jac.arr[0x45] + dVar142) - dVar229) - dVar389) - dVar74) - dVar237) -
         dVar338) - dVar212) - dVar394) - dVar246;
  Jac.arr[0x48] =
       (((((Jac.arr[0x48] - dVar216) + dVar218) - dVar407) - dVar224) - dVar142) + dVar212 + dVar394
       + dVar246;
  Jac.arr[0x52] = Jac.arr[0x52] + dVar246;
  Jac.arr[0x53] = Jac.arr[0x53] - dVar246;
  dVar246 = conc.arr[0x10] * -5461.432196104055;
  Jac.arr[0x88] = Jac.arr[0x88] + dVar84 + dVar85;
  Jac.arr[0x87] = ((dVar274 - dVar405) - dVar253) - dVar246;
  Jac.arr[0x8a] =
       ((((Jac.arr[0x8a] - dVar145) - dVar137) - dVar84) - dVar85) + dVar405 + dVar253 + dVar246;
  Jac.arr[0x89] = Jac.arr[0x89] + dVar273;
  Jac.arr[0x94] = Jac.arr[0x94] + dVar246;
  Jac.arr[0x95] = Jac.arr[0x95] - dVar246;
  Jac.arr[0x17c] = Jac.arr[0x17c] + dVar214;
  Jac.arr[0x186] = Jac.arr[0x186] + dVar214;
  Jac.arr[0x187] =
       ((Jac.arr[0x187] - dVar369) + dVar342 + dVar76 + dVar167 + dVar323 + dVar357) - dVar214;
  Jac.arr[0x1d2] =
       (((((((((((((dVar175 + dVar175 +
                    dVar361 + Jac.arr[0x1d2] + dVar267 + dVar340 + dVar314 + dVar217 + dVar255) -
                  dVar386) - (dVar309 + dVar309)) - dVar225) - dVar242) - dVar303) - dVar174) -
            dVar38) - dVar226) - dVar94) - dVar82) - dVar388) - dVar136) + dVar327 + dVar279 +
       dVar140 + dVar304 + dVar320 + dVar36;
  Jac.arr[0x1d1] =
       ((((((((((((dVar392 + Jac.arr[0x1d1]) - dVar252) - dVar260) - dVar361) + dVar158 + dVar225 +
              dVar318) - dVar304) - dVar320) - dVar34) - dVar126) - dVar36) - dVar265) - dVar266) -
       dVar247;
  Jac.arr[0x1d4] =
       ((((dVar79 - dVar327) - dVar318) - dVar279) - dVar140) + dVar265 + dVar266 + dVar247;
  Jac.arr[0x1de] = dVar77 + dVar374 + (Jac.arr[0x1de] - dVar72) + dVar247;
  Jac.arr[0x1df] =
       (dVar371 + (Jac.arr[0x1df] - dVar89) + dVar217 + dVar28 + dVar136 + dVar294) - dVar247;
  dVar371 = (((Jac.arr[0x1e0] - dVar217) - dVar28) - dVar136) - dVar371;
  auVar65._8_4_ = SUB84(dVar371,0);
  auVar65._0_8_ = Jac.arr[0x1df];
  auVar65._12_4_ = (int)((ulong)dVar371 >> 0x20);
  Jac.arr[0x1e0] = (double)auVar65._8_8_;
  if (iVar183 == 0) {
    c_R[0] = 2.8822959451999997;
    c_R[1] = 1.4999999982659773;
    c_R[2] = 1.507252090419375;
    c_R[3] = 3.398993884662499;
    c_R[4] = 2.9627907471999997;
    c_R[5] = 4.687841430575;
    c_R[6] = 5.2821630604062495;
    c_R[7] = 4.97163097458125;
    c_R[8] = 4.98750050771875;
    c_R[9] = 7.198434206537501;
    c_R[10] = 9.874274296874997;
    c_R[0xb] = 3.2349510160250006;
    c_R[0xc] = 6.023470866475001;
    c_R[0xd] = 5.33591319330625;
    c_R[0xe] = 7.5590570047500005;
    c_R[0xf] = 9.825474777499998;
    c_R[0x10] = 12.2373674399375;
    c_R[0x11] = 14.246951215250002;
    c_R[0x12] = 16.552933378125;
    c_R[0x13] = 3.1861203930625;
    dcRdT[0] = 0.000507239459;
    dcRdT[1] = 1.4767295125000317e-13;
    dcRdT[2] = -1.116620304e-05;
    dcRdT[3] = 0.00033054475434999984;
    dcRdT[4] = 0.0004928155568499999;
    dcRdT[5] = 0.0012567384129500002;
    dcRdT[6] = 0.0009643321552500001;
    dcRdT[7] = 0.0009323347502999997;
    dcRdT[8] = 0.0009823763672500007;
    dcRdT[9] = 0.0016686828392500003;
    dcRdT[10] = 0.0030726129075;
    dcRdT[0xb] = 0.00034398350740000034;
    dcRdT[0xc] = 0.0006661732772499996;
    dcRdT[0xd] = 0.0007601921039999995;
    dcRdT[0xe] = 0.0015323131260000008;
    dcRdT[0xf] = 0.0022796327649999997;
    dcRdT[0x10] = 0.0027535931289999994;
    dcRdT[0x11] = 0.0032581048315000038;
    dcRdT[0x12] = 0.0039887186525;
    dcRdT[0x13] = 0.00037292862650000006;
    dcRdT[0x14] = 0.0;
    c_R[0x14] = 1.5;
    local_d8 = 1.9101473600491665;
    uVar200 = 0x97324360;
    uVar201 = 0x4000a2a8;
    uVar203 = 0x1bfd44f3;
    uVar205 = 0x3ff00ca1;
    uVar202 = 0xae46b97;
    uVar204 = 0x4031ea25;
    uVar206 = 0x6b14455a;
    uVar207 = 0x4006ffa0;
    uVar208 = 0xcd68d3ff;
    uVar209 = 0x401c50aa;
    uVar210 = 0xb9f4c317;
    uVar211 = 0x4026ca5f;
    RVar241 = 6.7442483232375;
    RVar245 = -4.227135418966667;
    RVar259 = -6.748131844745;
    RVar263 = -27.605086887896665;
    RVar286 = 16.114317783399166;
    RVar293 = -0.5650564362916671;
    RVar306 = 34.602608086557915;
    RVar310 = 37.543891960460414;
    RVar325 = -16.524086927680834;
    RVar328 = 4.3818731557687505;
    uVar329 = 0x919c8014;
    uVar330 = 0x40020b57;
    uVar331 = 0xd3fd44c6;
    uVar332 = 0x40146fd4;
    uVar333 = 0x2efd9734;
    uVar334 = 0x40327b81;
    uVar335 = 0xaf13a7dd;
    uVar336 = 0x403501f0;
    pRVar181 = local_d0;
    pRVar184 = local_c0;
    pRVar185 = local_b0;
    pRVar190 = local_a0;
    pRVar191 = local_90;
    pRVar196 = local_80;
    pRVar199 = local_70;
    pRVar197 = local_60;
  }
  else {
    c_R[0] = 3.8822959451999997;
    c_R[1] = 2.4999999982659773;
    c_R[2] = 2.507252090419375;
    c_R[3] = 4.398993884662499;
    c_R[4] = 3.9627907472;
    c_R[5] = 5.687841430575;
    c_R[6] = 6.28216306040625;
    c_R[7] = 5.971630974581251;
    c_R[8] = 5.98750050771875;
    c_R[9] = 8.1984342065375;
    c_R[10] = 10.874274296874997;
    c_R[0xb] = 4.234951016024999;
    c_R[0xc] = 7.023470866475001;
    c_R[0xd] = 6.33591319330625;
    c_R[0xe] = 8.55905700475;
    c_R[0xf] = 10.825474777499998;
    c_R[0x10] = 13.237367439937499;
    c_R[0x11] = 15.24695121525;
    c_R[0x12] = 17.552933378125;
    c_R[0x13] = 4.1861203930625;
    c_R[0x14] = 2.5;
    dcRdT[0] = 0.000507239459;
    uVar200 = 0x412ad30f;
    uVar201 = 0x3f3870b4;
    uVar203 = 0;
    uVar205 = 0;
    uVar202 = 0xb657eadc;
    uVar204 = 0x3f6ab0bd;
    uVar206 = 0x82a59cbf;
    uVar207 = 0x3f705679;
    uVar208 = 0x8585a725;
    uVar209 = 0x3f62acbc;
    uVar210 = 0xdeffcb6;
    uVar211 = 0x3f668eb4;
    RVar241 = 0.0007601921039999995;
    RVar245 = 0.0015323131260000008;
    RVar259 = 0.00034398350740000034;
    RVar263 = 0.0006661732772499996;
    RVar286 = 0.0016686828392500003;
    RVar293 = 0.0030726129075;
    RVar306 = 0.0009323347502999997;
    RVar310 = 0.0009823763672500007;
    RVar325 = 0.0012567384129500002;
    RVar328 = 0.0009643321552500001;
    uVar329 = 0xe8e87ee7;
    uVar330 = 0x3f35a99e;
    uVar331 = 0x598d8058;
    uVar332 = 0x3f402609;
    uVar333 = 0x91b4691f;
    uVar334 = 0x3d44c87a;
    uVar335 = 0x42942cb3;
    uVar336 = 0xbee76acf;
    pRVar188 = h_RT;
    pRVar181 = dcRdT + 1;
    pRVar184 = dcRdT + 3;
    pRVar185 = dcRdT + 5;
    pRVar190 = dcRdT + 7;
    pRVar191 = dcRdT + 9;
    pRVar196 = dcRdT + 0xb;
    pRVar199 = dcRdT + 0xd;
    pRVar197 = dcRdT + 0xf;
    pRVar193 = dcRdT + 0x11;
    pRVar195 = dcRdT + 0x13;
  }
  *(undefined4 *)pRVar181 = uVar333;
  *(undefined4 *)((long)pRVar181 + 4) = uVar334;
  *(undefined4 *)(pRVar181 + 1) = uVar335;
  *(undefined4 *)((long)pRVar181 + 0xc) = uVar336;
  *(undefined4 *)pRVar184 = uVar329;
  *(undefined4 *)((long)pRVar184 + 4) = uVar330;
  *(undefined4 *)(pRVar184 + 1) = uVar331;
  *(undefined4 *)((long)pRVar184 + 0xc) = uVar332;
  *pRVar185 = RVar325;
  pRVar185[1] = RVar328;
  *pRVar190 = RVar306;
  pRVar190[1] = RVar310;
  *pRVar191 = RVar286;
  pRVar191[1] = RVar293;
  *pRVar196 = RVar259;
  pRVar196[1] = RVar263;
  *pRVar199 = RVar241;
  pRVar199[1] = RVar245;
  *(undefined4 *)pRVar197 = uVar208;
  *(undefined4 *)((long)pRVar197 + 4) = uVar209;
  *(undefined4 *)(pRVar197 + 1) = uVar210;
  *(undefined4 *)((long)pRVar197 + 0xc) = uVar211;
  *(undefined4 *)pRVar193 = uVar202;
  *(undefined4 *)((long)pRVar193 + 4) = uVar204;
  *(undefined4 *)(pRVar193 + 1) = uVar206;
  *(undefined4 *)((long)pRVar193 + 0xc) = uVar207;
  *(undefined4 *)pRVar195 = uVar200;
  *(undefined4 *)((long)pRVar195 + 4) = uVar201;
  *(undefined4 *)(pRVar195 + 1) = uVar203;
  *(undefined4 *)((long)pRVar195 + 0xc) = uVar205;
  dVar246 = 0.0;
  dVar213 = 0.0;
  dVar371 = 0.0;
  dVar247 = 0.0;
  for (lVar198 = 0; lVar198 != 0xa8; lVar198 = lVar198 + 8) {
    dVar212 = *(double *)((long)conc.arr + lVar198);
    dVar371 = dVar371 + *(double *)((long)dcRdT + lVar198) * dVar212;
    dVar264 = *(double *)((long)pRVar188 + lVar198);
    dVar246 = dVar246 + dVar212 * *(double *)((long)c_R + lVar198);
    dVar213 = dVar213 + *(double *)(local_14f0 + lVar198 + -8) * dVar264;
    dVar247 = dVar247 + (*(double *)((long)c_R + lVar198) - dVar264) * 0.0006666666666666666 *
                        *(double *)(local_14f0 + lVar198 + -8) +
                        dVar264 * *(double *)((long)Jac.arr + lVar198 + 0xe70);
  }
  dVar213 = dVar213 * (1.0 / dVar246);
  dVar212 = (1.0 / dVar246) * 1500.0;
  dVar246 = dVar213 * dVar212;
  dVar212 = -dVar212;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar264 = 0.0;
    for (lVar186 = 0; lVar186 != 0x15; lVar186 = lVar186 + 1) {
      dVar264 = dVar264 + pRVar188[lVar186] * pdVar192[lVar186];
    }
    Jac.arr[lVar198 * 0x16 + 0x15] = c_R[lVar198] * dVar246 + dVar264 * dVar212;
    pdVar192 = pdVar192 + 0x16;
  }
  Jac.arr[0x1e3] = dVar212 * dVar247 + (dVar246 * dVar371 - dVar213);
  if (base == 1) {
    *rowPtrs = 1;
    uVar182 = 0;
    uVar187 = (ulong)(uint)NCELLS;
    if (NCELLS < 1) {
      uVar187 = uVar182;
    }
    iVar183 = 1;
    iVar189 = 1;
    for (; uVar182 != uVar187; uVar182 = uVar182 + 1) {
      lVar198 = 0;
      pdVar192 = Jac.arr;
      for (; lVar198 != 0x16; lVar198 = lVar198 + 1) {
        iVar194 = iVar183;
        for (lVar186 = 0; lVar186 != 0xf20; lVar186 = lVar186 + 0xb0) {
          if ((*(double *)((long)pdVar192 + lVar186) != 0.0) ||
             (NAN(*(double *)((long)pdVar192 + lVar186)))) {
            colVals[(long)iVar189 + -1] = iVar194;
            iVar189 = iVar189 + 1;
          }
          iVar194 = iVar194 + 1;
        }
        rowPtrs[uVar182 * 0x16 + lVar198 + 1] = iVar189;
        pdVar192 = pdVar192 + 1;
      }
      iVar183 = iVar183 + 0x16;
    }
  }
  else {
    *rowPtrs = 0;
    iVar183 = 0;
    if (NCELLS < 1) {
      NCELLS = 0;
    }
    iVar189 = 0;
    for (uVar187 = 0; uVar187 != (uint)NCELLS; uVar187 = uVar187 + 1) {
      lVar198 = 0;
      pdVar192 = Jac.arr;
      for (; lVar198 != 0x16; lVar198 = lVar198 + 1) {
        iVar194 = iVar183;
        for (lVar186 = 0; lVar186 != 0xf20; lVar186 = lVar186 + 0xb0) {
          if ((*(double *)((long)pdVar192 + lVar186) != 0.0) ||
             (NAN(*(double *)((long)pdVar192 + lVar186)))) {
            colVals[iVar189] = iVar194;
            iVar189 = iVar189 + 1;
          }
          iVar194 = iVar194 + 1;
        }
        rowPtrs[uVar187 * 0x16 + lVar198 + 1] = iVar189;
        pdVar192 = pdVar192 + 1;
      }
      iVar183 = iVar183 + 0x16;
    }
  }
  return;
}

Assistant:

void
SPARSITY_PREPROC_CSR(
  int* colVals, int* rowPtrs, const int* consP, int NCELLS, int base)
{
  amrex::GpuArray<amrex::Real, 484> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 21> conc = {0.0};
  for (int n = 0; n < 21; n++) {
    conc[n] = 1.0 / 21.000000;
  }
  aJacobian(&Jac[0], &conc[0], 1500.0, *consP);

  if (base == 1) {
    rowPtrs[0] = 1;
    int nJdata_tmp = 1;
    for (int nc = 0; nc < NCELLS; nc++) {
      int offset = nc * 22;
      for (int l = 0; l < 22; l++) {
        for (int k = 0; k < 22; k++) {
          if (Jac[22 * k + l] != 0.0) {
            colVals[nJdata_tmp - 1] = k + 1 + offset;
            nJdata_tmp = nJdata_tmp + 1;
          }
        }
        rowPtrs[offset + (l + 1)] = nJdata_tmp;
      }
    }
  } else {
    rowPtrs[0] = 0;
    int nJdata_tmp = 0;
    for (int nc = 0; nc < NCELLS; nc++) {
      int offset = nc * 22;
      for (int l = 0; l < 22; l++) {
        for (int k = 0; k < 22; k++) {
          if (Jac[22 * k + l] != 0.0) {
            colVals[nJdata_tmp] = k + offset;
            nJdata_tmp = nJdata_tmp + 1;
          }
        }
        rowPtrs[offset + (l + 1)] = nJdata_tmp;
      }
    }
  }
}